

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<4,8>::
     intersect_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  Primitive PVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  RTCRayQueryContext *pRVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  bool bVar76;
  undefined1 auVar77 [12];
  bool bVar78;
  bool bVar79;
  bool bVar80;
  bool bVar81;
  bool bVar82;
  bool bVar83;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  uint uVar98;
  ulong uVar99;
  uint uVar100;
  long lVar101;
  long lVar102;
  uint uVar103;
  ulong uVar104;
  ulong uVar105;
  bool bVar106;
  float fVar107;
  float fVar110;
  float fVar140;
  float fVar142;
  vint4 bi_1;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar108;
  float fVar109;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar141;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar149;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar150;
  float fVar188;
  float fVar189;
  vint4 bi;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar151;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar191;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar190;
  float fVar192;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  vint4 bi_2;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar215;
  float fVar231;
  float fVar232;
  vint4 ai_1;
  undefined1 auVar216 [16];
  float fVar233;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar234;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  float fVar235;
  float fVar236;
  float fVar252;
  float fVar254;
  vint4 ai_2;
  undefined1 auVar237 [16];
  float fVar256;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar259;
  float fVar261;
  float fVar263;
  undefined1 auVar248 [28];
  float fVar253;
  float fVar255;
  float fVar257;
  float fVar258;
  float fVar260;
  float fVar262;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar251 [32];
  float fVar264;
  float fVar265;
  float fVar281;
  float fVar283;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar282;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  undefined1 auVar273 [32];
  float fVar290;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar291;
  float fVar292;
  float fVar304;
  float fVar306;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar308;
  undefined1 auVar297 [32];
  float fVar305;
  float fVar307;
  float fVar309;
  float fVar311;
  float fVar313;
  float fVar315;
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  float fVar310;
  float fVar312;
  float fVar314;
  undefined1 auVar303 [64];
  float fVar316;
  float fVar328;
  float fVar329;
  vint4 ai;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [32];
  float fVar331;
  undefined1 auVar323 [32];
  float fVar330;
  float fVar332;
  float fVar334;
  float fVar336;
  float fVar338;
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  float fVar333;
  float fVar335;
  float fVar337;
  undefined1 auVar327 [64];
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar349;
  float fVar352;
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [28];
  float fVar350;
  float fVar351;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  undefined1 auVar348 [32];
  float fVar367;
  float fVar375;
  float fVar376;
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  float fVar378;
  float fVar380;
  float fVar382;
  undefined1 auVar370 [32];
  float fVar377;
  float fVar379;
  float fVar381;
  float fVar383;
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [64];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  float fVar393;
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  float fVar394;
  float fVar398;
  float fVar399;
  undefined1 auVar395 [16];
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar404;
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  float fVar405;
  float fVar412;
  float fVar413;
  undefined1 auVar406 [16];
  float fVar415;
  float fVar416;
  float fVar417;
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  float fVar414;
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  float fVar418;
  float fVar422;
  float fVar423;
  float fVar424;
  float fVar425;
  float fVar426;
  float fVar427;
  undefined1 auVar419 [32];
  float fVar428;
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  float fVar429;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  float fVar438;
  float fVar439;
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_ba0;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined1 local_b10 [8];
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  undefined1 local_af0 [8];
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [32];
  undefined8 *local_a80;
  undefined8 *local_a78;
  undefined1 (*local_a70) [32];
  ulong local_a68;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [8];
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined8 local_950;
  undefined8 uStack_948;
  undefined1 local_940 [16];
  Primitive *local_930;
  ulong local_928;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  ulong local_760;
  undefined1 auStack_758 [24];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_660 [4];
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_640 [4];
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_610 [16];
  RTCHitN local_600 [16];
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 auStack_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 auStack_590 [16];
  undefined1 local_580 [32];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  uint local_520;
  uint uStack_51c;
  uint uStack_518;
  uint uStack_514;
  uint uStack_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  uint local_500;
  uint uStack_4fc;
  uint uStack_4f8;
  uint uStack_4f4;
  uint uStack_4f0;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar392 [64];
  
  PVar11 = prim[1];
  uVar104 = (ulong)(byte)PVar11;
  lVar102 = uVar104 * 0x25;
  fVar150 = *(float *)(prim + lVar102 + 0x12);
  auVar156 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar156 = vinsertps_avx(auVar156,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar19 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar156 = vsubps_avx(auVar156,*(undefined1 (*) [16])(prim + lVar102 + 6));
  auVar152._0_4_ = fVar150 * auVar156._0_4_;
  auVar152._4_4_ = fVar150 * auVar156._4_4_;
  auVar152._8_4_ = fVar150 * auVar156._8_4_;
  auVar152._12_4_ = fVar150 * auVar156._12_4_;
  auVar317._0_4_ = fVar150 * auVar19._0_4_;
  auVar317._4_4_ = fVar150 * auVar19._4_4_;
  auVar317._8_4_ = fVar150 * auVar19._8_4_;
  auVar317._12_4_ = fVar150 * auVar19._12_4_;
  auVar156 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 4 + 6)));
  auVar156 = vcvtdq2ps_avx(auVar156);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 5 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 6 + 6)));
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0xf + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar104 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0x1a + 6)));
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0x1b + 6)));
  auVar220 = vcvtdq2ps_avx(auVar220);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0x1c + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vshufps_avx(auVar317,auVar317,0);
  auVar26 = vshufps_avx(auVar317,auVar317,0x55);
  auVar160 = vshufps_avx(auVar317,auVar317,0xaa);
  fVar150 = auVar160._0_4_;
  fVar290 = auVar160._4_4_;
  fVar109 = auVar160._8_4_;
  fVar110 = auVar160._12_4_;
  fVar235 = auVar26._0_4_;
  fVar252 = auVar26._4_4_;
  fVar254 = auVar26._8_4_;
  fVar256 = auVar26._12_4_;
  fVar215 = auVar25._0_4_;
  fVar231 = auVar25._4_4_;
  fVar232 = auVar25._8_4_;
  fVar233 = auVar25._12_4_;
  auVar395._0_4_ = fVar215 * auVar156._0_4_ + fVar235 * auVar19._0_4_ + fVar150 * auVar161._0_4_;
  auVar395._4_4_ = fVar231 * auVar156._4_4_ + fVar252 * auVar19._4_4_ + fVar290 * auVar161._4_4_;
  auVar395._8_4_ = fVar232 * auVar156._8_4_ + fVar254 * auVar19._8_4_ + fVar109 * auVar161._8_4_;
  auVar395._12_4_ = fVar233 * auVar156._12_4_ + fVar256 * auVar19._12_4_ + fVar110 * auVar161._12_4_
  ;
  auVar406._0_4_ = fVar215 * auVar22._0_4_ + fVar235 * auVar23._0_4_ + auVar117._0_4_ * fVar150;
  auVar406._4_4_ = fVar231 * auVar22._4_4_ + fVar252 * auVar23._4_4_ + auVar117._4_4_ * fVar290;
  auVar406._8_4_ = fVar232 * auVar22._8_4_ + fVar254 * auVar23._8_4_ + auVar117._8_4_ * fVar109;
  auVar406._12_4_ = fVar233 * auVar22._12_4_ + fVar256 * auVar23._12_4_ + auVar117._12_4_ * fVar110;
  auVar318._0_4_ = fVar215 * auVar200._0_4_ + fVar235 * auVar220._0_4_ + auVar24._0_4_ * fVar150;
  auVar318._4_4_ = fVar231 * auVar200._4_4_ + fVar252 * auVar220._4_4_ + auVar24._4_4_ * fVar290;
  auVar318._8_4_ = fVar232 * auVar200._8_4_ + fVar254 * auVar220._8_4_ + auVar24._8_4_ * fVar109;
  auVar318._12_4_ = fVar233 * auVar200._12_4_ + fVar256 * auVar220._12_4_ + auVar24._12_4_ * fVar110
  ;
  auVar25 = vshufps_avx(auVar152,auVar152,0);
  auVar26 = vshufps_avx(auVar152,auVar152,0x55);
  auVar160 = vshufps_avx(auVar152,auVar152,0xaa);
  fVar150 = auVar160._0_4_;
  fVar290 = auVar160._4_4_;
  fVar109 = auVar160._8_4_;
  fVar110 = auVar160._12_4_;
  fVar235 = auVar26._0_4_;
  fVar252 = auVar26._4_4_;
  fVar254 = auVar26._8_4_;
  fVar256 = auVar26._12_4_;
  fVar215 = auVar25._0_4_;
  fVar231 = auVar25._4_4_;
  fVar232 = auVar25._8_4_;
  fVar233 = auVar25._12_4_;
  auVar153._0_4_ = fVar215 * auVar156._0_4_ + fVar235 * auVar19._0_4_ + fVar150 * auVar161._0_4_;
  auVar153._4_4_ = fVar231 * auVar156._4_4_ + fVar252 * auVar19._4_4_ + fVar290 * auVar161._4_4_;
  auVar153._8_4_ = fVar232 * auVar156._8_4_ + fVar254 * auVar19._8_4_ + fVar109 * auVar161._8_4_;
  auVar153._12_4_ = fVar233 * auVar156._12_4_ + fVar256 * auVar19._12_4_ + fVar110 * auVar161._12_4_
  ;
  auVar111._0_4_ = fVar215 * auVar22._0_4_ + auVar117._0_4_ * fVar150 + fVar235 * auVar23._0_4_;
  auVar111._4_4_ = fVar231 * auVar22._4_4_ + auVar117._4_4_ * fVar290 + fVar252 * auVar23._4_4_;
  auVar111._8_4_ = fVar232 * auVar22._8_4_ + auVar117._8_4_ * fVar109 + fVar254 * auVar23._8_4_;
  auVar111._12_4_ = fVar233 * auVar22._12_4_ + auVar117._12_4_ * fVar110 + fVar256 * auVar23._12_4_;
  auVar342._8_4_ = 0x7fffffff;
  auVar342._0_8_ = 0x7fffffff7fffffff;
  auVar342._12_4_ = 0x7fffffff;
  auVar156 = vandps_avx(auVar395,auVar342);
  auVar237._8_4_ = 0x219392ef;
  auVar237._0_8_ = 0x219392ef219392ef;
  auVar237._12_4_ = 0x219392ef;
  auVar156 = vcmpps_avx(auVar156,auVar237,1);
  auVar19 = vblendvps_avx(auVar395,auVar237,auVar156);
  auVar156 = vandps_avx(auVar406,auVar342);
  auVar156 = vcmpps_avx(auVar156,auVar237,1);
  auVar161 = vblendvps_avx(auVar406,auVar237,auVar156);
  auVar156 = vandps_avx(auVar342,auVar318);
  auVar156 = vcmpps_avx(auVar156,auVar237,1);
  auVar156 = vblendvps_avx(auVar318,auVar237,auVar156);
  auVar196._0_4_ = fVar215 * auVar200._0_4_ + fVar235 * auVar220._0_4_ + auVar24._0_4_ * fVar150;
  auVar196._4_4_ = fVar231 * auVar200._4_4_ + fVar252 * auVar220._4_4_ + auVar24._4_4_ * fVar290;
  auVar196._8_4_ = fVar232 * auVar200._8_4_ + fVar254 * auVar220._8_4_ + auVar24._8_4_ * fVar109;
  auVar196._12_4_ = fVar233 * auVar200._12_4_ + fVar256 * auVar220._12_4_ + auVar24._12_4_ * fVar110
  ;
  auVar22 = vrcpps_avx(auVar19);
  fVar215 = auVar22._0_4_;
  auVar216._0_4_ = fVar215 * auVar19._0_4_;
  fVar231 = auVar22._4_4_;
  auVar216._4_4_ = fVar231 * auVar19._4_4_;
  fVar232 = auVar22._8_4_;
  auVar216._8_4_ = fVar232 * auVar19._8_4_;
  fVar233 = auVar22._12_4_;
  auVar216._12_4_ = fVar233 * auVar19._12_4_;
  auVar293._8_4_ = 0x3f800000;
  auVar293._0_8_ = &DAT_3f8000003f800000;
  auVar293._12_4_ = 0x3f800000;
  auVar19 = vsubps_avx(auVar293,auVar216);
  fVar215 = fVar215 + fVar215 * auVar19._0_4_;
  fVar231 = fVar231 + fVar231 * auVar19._4_4_;
  fVar232 = fVar232 + fVar232 * auVar19._8_4_;
  fVar233 = fVar233 + fVar233 * auVar19._12_4_;
  auVar19 = vrcpps_avx(auVar161);
  fVar235 = auVar19._0_4_;
  auVar266._0_4_ = fVar235 * auVar161._0_4_;
  fVar252 = auVar19._4_4_;
  auVar266._4_4_ = fVar252 * auVar161._4_4_;
  fVar254 = auVar19._8_4_;
  auVar266._8_4_ = fVar254 * auVar161._8_4_;
  fVar256 = auVar19._12_4_;
  auVar266._12_4_ = fVar256 * auVar161._12_4_;
  auVar19 = vsubps_avx(auVar293,auVar266);
  fVar235 = fVar235 + fVar235 * auVar19._0_4_;
  fVar252 = fVar252 + fVar252 * auVar19._4_4_;
  fVar254 = fVar254 + fVar254 * auVar19._8_4_;
  fVar256 = fVar256 + fVar256 * auVar19._12_4_;
  auVar19 = vrcpps_avx(auVar156);
  fVar264 = auVar19._0_4_;
  auVar319._0_4_ = fVar264 * auVar156._0_4_;
  fVar281 = auVar19._4_4_;
  auVar319._4_4_ = fVar281 * auVar156._4_4_;
  fVar283 = auVar19._8_4_;
  auVar319._8_4_ = fVar283 * auVar156._8_4_;
  fVar285 = auVar19._12_4_;
  auVar319._12_4_ = fVar285 * auVar156._12_4_;
  auVar156 = vsubps_avx(auVar293,auVar319);
  fVar264 = fVar264 + fVar264 * auVar156._0_4_;
  fVar281 = fVar281 + fVar281 * auVar156._4_4_;
  fVar283 = fVar283 + fVar283 * auVar156._8_4_;
  fVar285 = fVar285 + fVar285 * auVar156._12_4_;
  auVar156 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar102 + 0x16)) *
                           *(float *)(prim + lVar102 + 0x1a)));
  auVar161 = vshufps_avx(auVar156,auVar156,0);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *(ulong *)(prim + uVar104 * 7 + 6);
  auVar156 = vpmovsxwd_avx(auVar156);
  auVar156 = vcvtdq2ps_avx(auVar156);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar104 * 0xb + 6);
  auVar19 = vpmovsxwd_avx(auVar19);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar22 = vsubps_avx(auVar19,auVar156);
  fVar150 = auVar161._0_4_;
  fVar290 = auVar161._4_4_;
  fVar109 = auVar161._8_4_;
  fVar110 = auVar161._12_4_;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + uVar104 * 9 + 6);
  auVar19 = vpmovsxwd_avx(auVar161);
  auVar320._0_4_ = auVar22._0_4_ * fVar150 + auVar156._0_4_;
  auVar320._4_4_ = auVar22._4_4_ * fVar290 + auVar156._4_4_;
  auVar320._8_4_ = auVar22._8_4_ * fVar109 + auVar156._8_4_;
  auVar320._12_4_ = auVar22._12_4_ * fVar110 + auVar156._12_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar104 * 0xd + 6);
  auVar161 = vpmovsxwd_avx(auVar22);
  auVar156 = vcvtdq2ps_avx(auVar19);
  auVar19 = vcvtdq2ps_avx(auVar161);
  auVar19 = vsubps_avx(auVar19,auVar156);
  auVar343._0_4_ = auVar19._0_4_ * fVar150 + auVar156._0_4_;
  auVar343._4_4_ = auVar19._4_4_ * fVar290 + auVar156._4_4_;
  auVar343._8_4_ = auVar19._8_4_ * fVar109 + auVar156._8_4_;
  auVar343._12_4_ = auVar19._12_4_ * fVar110 + auVar156._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar104 * 0x12 + 6);
  auVar156 = vpmovsxwd_avx(auVar23);
  uVar99 = (ulong)(uint)((int)(uVar104 * 5) << 2);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar104 * 2 + uVar99 + 6);
  auVar19 = vpmovsxwd_avx(auVar117);
  auVar156 = vcvtdq2ps_avx(auVar156);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar156);
  auVar368._0_4_ = auVar19._0_4_ * fVar150 + auVar156._0_4_;
  auVar368._4_4_ = auVar19._4_4_ * fVar290 + auVar156._4_4_;
  auVar368._8_4_ = auVar19._8_4_ * fVar109 + auVar156._8_4_;
  auVar368._12_4_ = auVar19._12_4_ * fVar110 + auVar156._12_4_;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *(ulong *)(prim + uVar99 + 6);
  auVar156 = vpmovsxwd_avx(auVar200);
  auVar156 = vcvtdq2ps_avx(auVar156);
  auVar220._8_8_ = 0;
  auVar220._0_8_ = *(ulong *)(prim + uVar104 * 0x18 + 6);
  auVar19 = vpmovsxwd_avx(auVar220);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar161 = vsubps_avx(auVar19,auVar156);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar104 * 0x1d + 6);
  auVar19 = vpmovsxwd_avx(auVar24);
  auVar384._0_4_ = auVar161._0_4_ * fVar150 + auVar156._0_4_;
  auVar384._4_4_ = auVar161._4_4_ * fVar290 + auVar156._4_4_;
  auVar384._8_4_ = auVar161._8_4_ * fVar109 + auVar156._8_4_;
  auVar384._12_4_ = auVar161._12_4_ * fVar110 + auVar156._12_4_;
  auVar156 = vcvtdq2ps_avx(auVar19);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar104 + (ulong)(byte)PVar11 * 0x20 + 6);
  auVar19 = vpmovsxwd_avx(auVar25);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar156);
  auVar388._0_4_ = auVar19._0_4_ * fVar150 + auVar156._0_4_;
  auVar388._4_4_ = auVar19._4_4_ * fVar290 + auVar156._4_4_;
  auVar388._8_4_ = auVar19._8_4_ * fVar109 + auVar156._8_4_;
  auVar388._12_4_ = auVar19._12_4_ * fVar110 + auVar156._12_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar11 * 0x20 - uVar104) + 6);
  auVar156 = vpmovsxwd_avx(auVar26);
  auVar156 = vcvtdq2ps_avx(auVar156);
  auVar160._8_8_ = 0;
  auVar160._0_8_ = *(ulong *)(prim + uVar104 * 0x23 + 6);
  auVar19 = vpmovsxwd_avx(auVar160);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar156);
  auVar294._0_4_ = auVar156._0_4_ + auVar19._0_4_ * fVar150;
  auVar294._4_4_ = auVar156._4_4_ + auVar19._4_4_ * fVar290;
  auVar294._8_4_ = auVar156._8_4_ + auVar19._8_4_ * fVar109;
  auVar294._12_4_ = auVar156._12_4_ + auVar19._12_4_ * fVar110;
  auVar156 = vsubps_avx(auVar320,auVar153);
  auVar321._0_4_ = fVar215 * auVar156._0_4_;
  auVar321._4_4_ = fVar231 * auVar156._4_4_;
  auVar321._8_4_ = fVar232 * auVar156._8_4_;
  auVar321._12_4_ = fVar233 * auVar156._12_4_;
  auVar156 = vsubps_avx(auVar343,auVar153);
  auVar154._0_4_ = fVar215 * auVar156._0_4_;
  auVar154._4_4_ = fVar231 * auVar156._4_4_;
  auVar154._8_4_ = fVar232 * auVar156._8_4_;
  auVar154._12_4_ = fVar233 * auVar156._12_4_;
  auVar156 = vsubps_avx(auVar368,auVar111);
  auVar217._0_4_ = fVar235 * auVar156._0_4_;
  auVar217._4_4_ = fVar252 * auVar156._4_4_;
  auVar217._8_4_ = fVar254 * auVar156._8_4_;
  auVar217._12_4_ = fVar256 * auVar156._12_4_;
  auVar156 = vsubps_avx(auVar384,auVar111);
  auVar112._0_4_ = fVar235 * auVar156._0_4_;
  auVar112._4_4_ = fVar252 * auVar156._4_4_;
  auVar112._8_4_ = fVar254 * auVar156._8_4_;
  auVar112._12_4_ = fVar256 * auVar156._12_4_;
  auVar156 = vsubps_avx(auVar388,auVar196);
  auVar238._0_4_ = fVar264 * auVar156._0_4_;
  auVar238._4_4_ = fVar281 * auVar156._4_4_;
  auVar238._8_4_ = fVar283 * auVar156._8_4_;
  auVar238._12_4_ = fVar285 * auVar156._12_4_;
  auVar156 = vsubps_avx(auVar294,auVar196);
  auVar197._0_4_ = fVar264 * auVar156._0_4_;
  auVar197._4_4_ = fVar281 * auVar156._4_4_;
  auVar197._8_4_ = fVar283 * auVar156._8_4_;
  auVar197._12_4_ = fVar285 * auVar156._12_4_;
  auVar156 = vpminsd_avx(auVar321,auVar154);
  auVar19 = vpminsd_avx(auVar217,auVar112);
  auVar156 = vmaxps_avx(auVar156,auVar19);
  auVar19 = vpminsd_avx(auVar238,auVar197);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar344._4_4_ = uVar9;
  auVar344._0_4_ = uVar9;
  auVar344._8_4_ = uVar9;
  auVar344._12_4_ = uVar9;
  auVar19 = vmaxps_avx(auVar19,auVar344);
  auVar156 = vmaxps_avx(auVar156,auVar19);
  local_610._0_4_ = auVar156._0_4_ * 0.99999964;
  local_610._4_4_ = auVar156._4_4_ * 0.99999964;
  local_610._8_4_ = auVar156._8_4_ * 0.99999964;
  local_610._12_4_ = auVar156._12_4_ * 0.99999964;
  auVar156 = vpmaxsd_avx(auVar321,auVar154);
  auVar19 = vpmaxsd_avx(auVar217,auVar112);
  auVar156 = vminps_avx(auVar156,auVar19);
  auVar19 = vpmaxsd_avx(auVar238,auVar197);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar198._4_4_ = uVar9;
  auVar198._0_4_ = uVar9;
  auVar198._8_4_ = uVar9;
  auVar198._12_4_ = uVar9;
  auVar19 = vminps_avx(auVar19,auVar198);
  auVar156 = vminps_avx(auVar156,auVar19);
  auVar113._0_4_ = auVar156._0_4_ * 1.0000004;
  auVar113._4_4_ = auVar156._4_4_ * 1.0000004;
  auVar113._8_4_ = auVar156._8_4_ * 1.0000004;
  auVar113._12_4_ = auVar156._12_4_ * 1.0000004;
  auVar156 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar19 = vpcmpgtd_avx(auVar156,_DAT_01ff0cf0);
  auVar156 = vcmpps_avx(local_610,auVar113,2);
  auVar156 = vandps_avx(auVar156,auVar19);
  uVar98 = vmovmskps_avx(auVar156);
  if (uVar98 == 0) {
    return;
  }
  uVar98 = uVar98 & 0xff;
  auVar126._16_16_ = mm_lookupmask_ps._240_16_;
  auVar126._0_16_ = mm_lookupmask_ps._240_16_;
  local_3c0 = vblendps_avx(auVar126,ZEXT832(0) << 0x20,0x80);
  local_a70 = (undefined1 (*) [32])&local_520;
  uVar100 = 1 << ((byte)k & 0x1f);
  local_a78 = (undefined8 *)(mm_lookupmask_ps + ((uVar100 & 0xf) << 4));
  local_a80 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar100 >> 4) * 0x10);
  auVar327 = ZEXT464(0) << 0x20;
  local_930 = prim;
LAB_01042814:
  local_928 = (ulong)uVar98;
  lVar102 = 0;
  if (local_928 != 0) {
    for (; (uVar98 >> lVar102 & 1) == 0; lVar102 = lVar102 + 1) {
    }
  }
  uVar98 = *(uint *)(local_930 + 2);
  local_a68 = (ulong)*(uint *)(local_930 + lVar102 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[uVar98].ptr;
  uVar104 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                            local_a68 *
                            pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar150 = (pGVar12->time_range).lower;
  fVar150 = pGVar12->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar150) / ((pGVar12->time_range).upper - fVar150));
  auVar156 = vroundss_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150),9);
  auVar156 = vminss_avx(auVar156,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar156 = vmaxss_avx(auVar327._0_16_,auVar156);
  fVar150 = fVar150 - auVar156._0_4_;
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar101 = (long)(int)auVar156._0_4_ * 0x38;
  lVar14 = *(long *)(_Var13 + 0x10 + lVar101);
  lVar15 = *(long *)(_Var13 + 0x38 + lVar101);
  lVar16 = *(long *)(_Var13 + 0x48 + lVar101);
  auVar156 = vshufps_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150),0);
  pfVar2 = (float *)(lVar15 + lVar16 * uVar104);
  fVar233 = auVar156._0_4_;
  fVar235 = auVar156._4_4_;
  fVar252 = auVar156._8_4_;
  fVar254 = auVar156._12_4_;
  lVar1 = uVar104 + 1;
  pfVar3 = (float *)(lVar15 + lVar16 * lVar1);
  p_Var17 = pGVar12[4].occlusionFilterN;
  auVar156 = vshufps_avx(ZEXT416((uint)(1.0 - fVar150)),ZEXT416((uint)(1.0 - fVar150)),0);
  pfVar4 = (float *)(*(long *)(_Var13 + lVar101) + lVar14 * uVar104);
  fVar110 = auVar156._0_4_;
  fVar215 = auVar156._4_4_;
  fVar231 = auVar156._8_4_;
  fVar232 = auVar156._12_4_;
  pfVar5 = (float *)(*(long *)(_Var13 + lVar101) + lVar14 * lVar1);
  pfVar6 = (float *)(*(long *)(p_Var17 + lVar101 + 0x38) +
                    uVar104 * *(long *)(p_Var17 + lVar101 + 0x48));
  pfVar7 = (float *)(*(long *)(p_Var17 + lVar101 + 0x38) +
                    *(long *)(p_Var17 + lVar101 + 0x48) * lVar1);
  pfVar8 = (float *)(*(long *)(p_Var17 + lVar101) + *(long *)(p_Var17 + lVar101 + 0x10) * uVar104);
  auVar155._0_4_ = fVar110 * *pfVar4 + fVar233 * *pfVar2;
  auVar155._4_4_ = fVar215 * pfVar4[1] + fVar235 * pfVar2[1];
  auVar155._8_4_ = fVar231 * pfVar4[2] + fVar252 * pfVar2[2];
  auVar155._12_4_ = fVar232 * pfVar4[3] + fVar254 * pfVar2[3];
  pfVar2 = (float *)(*(long *)(p_Var17 + lVar101) + *(long *)(p_Var17 + lVar101 + 0x10) * lVar1);
  auVar199._0_4_ = fVar110 * *pfVar5 + fVar233 * *pfVar3;
  auVar199._4_4_ = fVar215 * pfVar5[1] + fVar235 * pfVar3[1];
  auVar199._8_4_ = fVar231 * pfVar5[2] + fVar252 * pfVar3[2];
  auVar199._12_4_ = fVar232 * pfVar5[3] + fVar254 * pfVar3[3];
  auVar156 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar19 = vinsertps_avx(auVar156,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar150 = *(float *)(ray + k * 4 + 0x80);
  auVar369._4_4_ = fVar150;
  auVar369._0_4_ = fVar150;
  auVar369._8_4_ = fVar150;
  auVar369._12_4_ = fVar150;
  fStack_850 = fVar150;
  _local_860 = auVar369;
  fStack_84c = fVar150;
  fStack_848 = fVar150;
  fStack_844 = fVar150;
  fVar290 = *(float *)(ray + k * 4 + 0xa0);
  auVar385._4_4_ = fVar290;
  auVar385._0_4_ = fVar290;
  auVar385._8_4_ = fVar290;
  auVar385._12_4_ = fVar290;
  fStack_870 = fVar290;
  _local_880 = auVar385;
  fStack_86c = fVar290;
  fStack_868 = fVar290;
  fStack_864 = fVar290;
  auVar156 = vunpcklps_avx(auVar369,auVar385);
  fVar109 = *(float *)(ray + k * 4 + 0xc0);
  auVar389._4_4_ = fVar109;
  auVar389._0_4_ = fVar109;
  auVar389._8_4_ = fVar109;
  auVar389._12_4_ = fVar109;
  fStack_8b0 = fVar109;
  _local_8c0 = auVar389;
  fStack_8ac = fVar109;
  fStack_8a8 = fVar109;
  fStack_8a4 = fVar109;
  auVar392 = ZEXT3264(_local_8c0);
  _local_9f0 = vinsertps_avx(auVar156,auVar389,0x28);
  auVar239._0_4_ = auVar155._0_4_ + (fVar110 * *pfVar8 + fVar233 * *pfVar6) * 0.33333334;
  auVar239._4_4_ = auVar155._4_4_ + (fVar215 * pfVar8[1] + fVar235 * pfVar6[1]) * 0.33333334;
  auVar239._8_4_ = auVar155._8_4_ + (fVar231 * pfVar8[2] + fVar252 * pfVar6[2]) * 0.33333334;
  auVar239._12_4_ = auVar155._12_4_ + (fVar232 * pfVar8[3] + fVar254 * pfVar6[3]) * 0.33333334;
  auVar114._0_4_ = (fVar110 * *pfVar2 + fVar233 * *pfVar7) * 0.33333334;
  auVar114._4_4_ = (fVar215 * pfVar2[1] + fVar235 * pfVar7[1]) * 0.33333334;
  auVar114._8_4_ = (fVar231 * pfVar2[2] + fVar252 * pfVar7[2]) * 0.33333334;
  auVar114._12_4_ = (fVar232 * pfVar2[3] + fVar254 * pfVar7[3]) * 0.33333334;
  auVar22 = vsubps_avx(auVar199,auVar114);
  auVar115._0_4_ = (auVar199._0_4_ + auVar155._0_4_ + auVar239._0_4_ + auVar22._0_4_) * 0.25;
  auVar115._4_4_ = (auVar199._4_4_ + auVar155._4_4_ + auVar239._4_4_ + auVar22._4_4_) * 0.25;
  auVar115._8_4_ = (auVar199._8_4_ + auVar155._8_4_ + auVar239._8_4_ + auVar22._8_4_) * 0.25;
  auVar115._12_4_ = (auVar199._12_4_ + auVar155._12_4_ + auVar239._12_4_ + auVar22._12_4_) * 0.25;
  auVar156 = vsubps_avx(auVar115,auVar19);
  auVar156 = vdpps_avx(auVar156,_local_9f0,0x7f);
  local_a00 = vdpps_avx(_local_9f0,_local_9f0,0x7f);
  auVar161 = vrcpss_avx(local_a00,local_a00);
  fVar110 = auVar156._0_4_ * auVar161._0_4_ * (2.0 - local_a00._0_4_ * auVar161._0_4_);
  auVar327 = ZEXT464((uint)fVar110);
  auVar161 = vshufps_avx(ZEXT416((uint)fVar110),ZEXT416((uint)fVar110),0);
  auVar218._0_4_ = auVar19._0_4_ + local_9f0._0_4_ * auVar161._0_4_;
  auVar218._4_4_ = auVar19._4_4_ + local_9f0._4_4_ * auVar161._4_4_;
  auVar218._8_4_ = auVar19._8_4_ + local_9f0._8_4_ * auVar161._8_4_;
  auVar218._12_4_ = auVar19._12_4_ + local_9f0._12_4_ * auVar161._12_4_;
  auVar156 = vblendps_avx(auVar218,_DAT_01feba10,8);
  _local_ae0 = vsubps_avx(auVar155,auVar156);
  auVar303 = ZEXT1664(_local_ae0);
  _local_af0 = vsubps_avx(auVar22,auVar156);
  _local_b00 = vsubps_avx(auVar239,auVar156);
  _local_b10 = vsubps_avx(auVar199,auVar156);
  auVar230 = ZEXT1664(_local_b10);
  auVar156 = vshufps_avx(_local_ae0,_local_ae0,0);
  register0x00001250 = auVar156;
  _local_1a0 = auVar156;
  auVar156 = vshufps_avx(_local_ae0,_local_ae0,0x55);
  register0x00001250 = auVar156;
  _local_1c0 = auVar156;
  auVar156 = vshufps_avx(_local_ae0,_local_ae0,0xaa);
  register0x00001250 = auVar156;
  _local_1e0 = auVar156;
  auVar156 = vshufps_avx(_local_ae0,_local_ae0,0xff);
  register0x00001290 = auVar156;
  _local_200 = auVar156;
  auVar156 = vshufps_avx(_local_b00,_local_b00,0);
  register0x00001290 = auVar156;
  _local_220 = auVar156;
  auVar156 = vshufps_avx(_local_b00,_local_b00,0x55);
  register0x00001290 = auVar156;
  _local_240 = auVar156;
  auVar156 = vshufps_avx(_local_b00,_local_b00,0xaa);
  register0x00001290 = auVar156;
  _local_260 = auVar156;
  auVar156 = vshufps_avx(_local_b00,_local_b00,0xff);
  register0x00001290 = auVar156;
  _local_280 = auVar156;
  auVar156 = vshufps_avx(_local_af0,_local_af0,0);
  register0x00001290 = auVar156;
  _local_2a0 = auVar156;
  auVar156 = vshufps_avx(_local_af0,_local_af0,0x55);
  register0x00001290 = auVar156;
  _local_2c0 = auVar156;
  auVar156 = vshufps_avx(_local_af0,_local_af0,0xaa);
  register0x00001290 = auVar156;
  _local_2e0 = auVar156;
  auVar156 = vshufps_avx(_local_af0,_local_af0,0xff);
  register0x00001290 = auVar156;
  _local_300 = auVar156;
  auVar156 = vshufps_avx(_local_b10,_local_b10,0);
  register0x00001290 = auVar156;
  _local_320 = auVar156;
  auVar156 = vshufps_avx(_local_b10,_local_b10,0x55);
  register0x00001290 = auVar156;
  _local_340 = auVar156;
  auVar156 = vshufps_avx(_local_b10,_local_b10,0xaa);
  register0x00001290 = auVar156;
  _local_360 = auVar156;
  auVar156 = vshufps_avx(_local_b10,_local_b10,0xff);
  register0x00001290 = auVar156;
  _local_380 = auVar156;
  auVar156 = ZEXT416((uint)(fVar150 * fVar150 + fVar290 * fVar290 + fVar109 * fVar109));
  auVar156 = vshufps_avx(auVar156,auVar156,0);
  local_3a0._16_16_ = auVar156;
  local_3a0._0_16_ = auVar156;
  fVar150 = *(float *)(ray + k * 4 + 0x60);
  local_940 = ZEXT416((uint)fVar110);
  auVar156 = vshufps_avx(ZEXT416((uint)(fVar150 - fVar110)),ZEXT416((uint)(fVar150 - fVar110)),0);
  local_3e0._16_16_ = auVar156;
  local_3e0._0_16_ = auVar156;
  auVar156 = vpshufd_avx(ZEXT416(uVar98),0);
  local_4c0._16_16_ = auVar156;
  local_4c0._0_16_ = auVar156;
  auVar156 = vpshufd_avx(ZEXT416(*(uint *)(local_930 + lVar102 * 4 + 6)),0);
  local_4e0._16_16_ = auVar156;
  local_4e0._0_16_ = auVar156;
  register0x00001350 = auVar161;
  _local_9c0 = auVar161;
  uVar99 = 0;
  uVar104 = 1;
  auVar127._8_4_ = 0x7fffffff;
  auVar127._0_8_ = 0x7fffffff7fffffff;
  auVar127._12_4_ = 0x7fffffff;
  auVar127._16_4_ = 0x7fffffff;
  auVar127._20_4_ = 0x7fffffff;
  auVar127._24_4_ = 0x7fffffff;
  auVar127._28_4_ = 0x7fffffff;
  local_4a0 = vandps_avx(local_3a0,auVar127);
  auVar156 = vsqrtss_avx(local_a00,local_a00);
  auVar19 = vsqrtss_avx(local_a00,local_a00);
  local_950 = 0x3f80000000000000;
  uStack_948 = 0;
  do {
    auVar94._8_8_ = uStack_948;
    auVar94._0_8_ = local_950;
    auVar161 = vmovshdup_avx(auVar94);
    fVar290 = auVar161._0_4_ - (float)local_950;
    auVar161 = vshufps_avx(auVar94,auVar94,0);
    local_a60._16_16_ = auVar161;
    local_a60._0_16_ = auVar161;
    auVar22 = vshufps_avx(ZEXT416((uint)fVar290),ZEXT416((uint)fVar290),0);
    local_7e0._16_16_ = auVar22;
    local_7e0._0_16_ = auVar22;
    fVar151 = auVar22._0_4_;
    fVar188 = auVar22._4_4_;
    fVar189 = auVar22._8_4_;
    fVar191 = auVar22._12_4_;
    fVar107 = auVar161._0_4_;
    auVar169._0_4_ = fVar107 + fVar151 * 0.0;
    fVar140 = auVar161._4_4_;
    auVar169._4_4_ = fVar140 + fVar188 * 0.14285715;
    fVar142 = auVar161._8_4_;
    auVar169._8_4_ = fVar142 + fVar189 * 0.2857143;
    fVar144 = auVar161._12_4_;
    auVar169._12_4_ = fVar144 + fVar191 * 0.42857146;
    auVar169._16_4_ = fVar107 + fVar151 * 0.5714286;
    auVar169._20_4_ = fVar140 + fVar188 * 0.71428573;
    auVar169._24_4_ = fVar142 + fVar189 * 0.8571429;
    auVar169._28_4_ = fVar144 + fVar191;
    auVar207._8_4_ = 0x3f800000;
    auVar207._0_8_ = &DAT_3f8000003f800000;
    auVar207._12_4_ = 0x3f800000;
    auVar207._16_4_ = 0x3f800000;
    auVar207._20_4_ = 0x3f800000;
    auVar207._24_4_ = 0x3f800000;
    auVar207._28_4_ = 0x3f800000;
    auVar126 = vsubps_avx(auVar207,auVar169);
    fVar109 = auVar126._0_4_;
    fVar110 = auVar126._4_4_;
    fVar215 = auVar126._8_4_;
    fVar231 = auVar126._12_4_;
    fVar232 = auVar126._16_4_;
    fVar233 = auVar126._20_4_;
    fVar235 = auVar126._24_4_;
    fVar234 = auVar230._28_4_;
    fVar291 = (float)local_2a0._0_4_ * auVar169._0_4_ + (float)local_220._0_4_ * fVar109;
    fVar304 = (float)local_2a0._4_4_ * auVar169._4_4_ + (float)local_220._4_4_ * fVar110;
    fVar306 = fStack_298 * auVar169._8_4_ + fStack_218 * fVar215;
    fVar308 = fStack_294 * auVar169._12_4_ + fStack_214 * fVar231;
    fVar310 = fStack_290 * auVar169._16_4_ + fStack_210 * fVar232;
    fVar312 = fStack_28c * auVar169._20_4_ + fStack_20c * fVar233;
    fVar314 = fStack_288 * auVar169._24_4_ + fStack_208 * fVar235;
    fVar252 = (float)local_2c0._0_4_ * auVar169._0_4_ + (float)local_240._0_4_ * fVar109;
    fVar254 = (float)local_2c0._4_4_ * auVar169._4_4_ + (float)local_240._4_4_ * fVar110;
    fVar256 = fStack_2b8 * auVar169._8_4_ + fStack_238 * fVar215;
    fVar264 = fStack_2b4 * auVar169._12_4_ + fStack_234 * fVar231;
    fVar281 = fStack_2b0 * auVar169._16_4_ + fStack_230 * fVar232;
    fVar283 = fStack_2ac * auVar169._20_4_ + fStack_22c * fVar233;
    fVar285 = fStack_2a8 * auVar169._24_4_ + fStack_228 * fVar235;
    fVar236 = (float)local_2e0._0_4_ * auVar169._0_4_ + (float)local_260._0_4_ * fVar109;
    fVar253 = (float)local_2e0._4_4_ * auVar169._4_4_ + (float)local_260._4_4_ * fVar110;
    fVar255 = fStack_2d8 * auVar169._8_4_ + fStack_258 * fVar215;
    fVar257 = fStack_2d4 * auVar169._12_4_ + fStack_254 * fVar231;
    fVar258 = fStack_2d0 * auVar169._16_4_ + fStack_250 * fVar232;
    fVar260 = fStack_2cc * auVar169._20_4_ + fStack_24c * fVar233;
    fVar262 = fStack_2c8 * auVar169._24_4_ + fStack_248 * fVar235;
    fVar265 = (float)local_300._0_4_ * auVar169._0_4_ + (float)local_280._0_4_ * fVar109;
    fVar282 = (float)local_300._4_4_ * auVar169._4_4_ + (float)local_280._4_4_ * fVar110;
    fVar284 = fStack_2f8 * auVar169._8_4_ + fStack_278 * fVar215;
    fVar286 = fStack_2f4 * auVar169._12_4_ + fStack_274 * fVar231;
    fVar287 = fStack_2f0 * auVar169._16_4_ + fStack_270 * fVar232;
    fVar288 = fStack_2ec * auVar169._20_4_ + fStack_26c * fVar233;
    fVar289 = fStack_2e8 * auVar169._24_4_ + fStack_268 * fVar235;
    fVar393 = auVar392._28_4_;
    fVar404 = fStack_204 + fVar393;
    auVar370._0_4_ =
         ((float)local_220._0_4_ * auVar169._0_4_ + fVar109 * (float)local_1a0._0_4_) * fVar109 +
         auVar169._0_4_ * fVar291;
    auVar370._4_4_ =
         ((float)local_220._4_4_ * auVar169._4_4_ + fVar110 * (float)local_1a0._4_4_) * fVar110 +
         auVar169._4_4_ * fVar304;
    auVar370._8_4_ =
         (fStack_218 * auVar169._8_4_ + fVar215 * fStack_198) * fVar215 + auVar169._8_4_ * fVar306;
    auVar370._12_4_ =
         (fStack_214 * auVar169._12_4_ + fVar231 * fStack_194) * fVar231 + auVar169._12_4_ * fVar308
    ;
    auVar370._16_4_ =
         (fStack_210 * auVar169._16_4_ + fVar232 * fStack_190) * fVar232 + auVar169._16_4_ * fVar310
    ;
    auVar370._20_4_ =
         (fStack_20c * auVar169._20_4_ + fVar233 * fStack_18c) * fVar233 + auVar169._20_4_ * fVar312
    ;
    auVar370._24_4_ =
         (fStack_208 * auVar169._24_4_ + fVar235 * fStack_188) * fVar235 + auVar169._24_4_ * fVar314
    ;
    auVar370._28_4_ = fStack_2e4 + fVar393;
    auVar386._0_4_ =
         fVar109 * ((float)local_240._0_4_ * auVar169._0_4_ + fVar109 * (float)local_1c0._0_4_) +
         auVar169._0_4_ * fVar252;
    auVar386._4_4_ =
         fVar110 * ((float)local_240._4_4_ * auVar169._4_4_ + fVar110 * (float)local_1c0._4_4_) +
         auVar169._4_4_ * fVar254;
    auVar386._8_4_ =
         fVar215 * (fStack_238 * auVar169._8_4_ + fVar215 * fStack_1b8) + auVar169._8_4_ * fVar256;
    auVar386._12_4_ =
         fVar231 * (fStack_234 * auVar169._12_4_ + fVar231 * fStack_1b4) + auVar169._12_4_ * fVar264
    ;
    auVar386._16_4_ =
         fVar232 * (fStack_230 * auVar169._16_4_ + fVar232 * fStack_1b0) + auVar169._16_4_ * fVar281
    ;
    auVar386._20_4_ =
         fVar233 * (fStack_22c * auVar169._20_4_ + fVar233 * fStack_1ac) + auVar169._20_4_ * fVar283
    ;
    auVar386._24_4_ =
         fVar235 * (fStack_228 * auVar169._24_4_ + fVar235 * fStack_1a8) + auVar169._24_4_ * fVar285
    ;
    auVar386._28_4_ = fVar234 + auVar327._28_4_ + fVar393;
    auVar390._0_4_ =
         fVar109 * ((float)local_260._0_4_ * auVar169._0_4_ + fVar109 * (float)local_1e0._0_4_) +
         auVar169._0_4_ * fVar236;
    auVar390._4_4_ =
         fVar110 * ((float)local_260._4_4_ * auVar169._4_4_ + fVar110 * (float)local_1e0._4_4_) +
         auVar169._4_4_ * fVar253;
    auVar390._8_4_ =
         fVar215 * (fStack_258 * auVar169._8_4_ + fVar215 * fStack_1d8) + auVar169._8_4_ * fVar255;
    auVar390._12_4_ =
         fVar231 * (fStack_254 * auVar169._12_4_ + fVar231 * fStack_1d4) + auVar169._12_4_ * fVar257
    ;
    auVar390._16_4_ =
         fVar232 * (fStack_250 * auVar169._16_4_ + fVar232 * fStack_1d0) + auVar169._16_4_ * fVar258
    ;
    auVar390._20_4_ =
         fVar233 * (fStack_24c * auVar169._20_4_ + fVar233 * fStack_1cc) + auVar169._20_4_ * fVar260
    ;
    auVar390._24_4_ =
         fVar235 * (fStack_248 * auVar169._24_4_ + fVar235 * fStack_1c8) + auVar169._24_4_ * fVar262
    ;
    auVar390._28_4_ = fStack_2c4 + fVar393;
    auVar322._0_4_ =
         auVar169._0_4_ * fVar265 +
         fVar109 * ((float)local_280._0_4_ * auVar169._0_4_ + fVar109 * (float)local_200._0_4_);
    auVar322._4_4_ =
         auVar169._4_4_ * fVar282 +
         fVar110 * ((float)local_280._4_4_ * auVar169._4_4_ + fVar110 * (float)local_200._4_4_);
    auVar322._8_4_ =
         auVar169._8_4_ * fVar284 + fVar215 * (fStack_278 * auVar169._8_4_ + fVar215 * fStack_1f8);
    auVar322._12_4_ =
         auVar169._12_4_ * fVar286 + fVar231 * (fStack_274 * auVar169._12_4_ + fVar231 * fStack_1f4)
    ;
    auVar322._16_4_ =
         auVar169._16_4_ * fVar287 + fVar232 * (fStack_270 * auVar169._16_4_ + fVar232 * fStack_1f0)
    ;
    auVar322._20_4_ =
         auVar169._20_4_ * fVar288 + fVar233 * (fStack_26c * auVar169._20_4_ + fVar233 * fStack_1ec)
    ;
    auVar322._24_4_ =
         auVar169._24_4_ * fVar289 + fVar235 * (fStack_268 * auVar169._24_4_ + fVar235 * fStack_1e8)
    ;
    auVar322._28_4_ = fStack_2c4 + fStack_2a4;
    auVar419._0_4_ =
         (auVar169._0_4_ * (float)local_320._0_4_ + (float)local_2a0._0_4_ * fVar109) *
         auVar169._0_4_ + fVar109 * fVar291;
    auVar419._4_4_ =
         (auVar169._4_4_ * (float)local_320._4_4_ + (float)local_2a0._4_4_ * fVar110) *
         auVar169._4_4_ + fVar110 * fVar304;
    auVar419._8_4_ =
         (auVar169._8_4_ * fStack_318 + fStack_298 * fVar215) * auVar169._8_4_ + fVar215 * fVar306;
    auVar419._12_4_ =
         (auVar169._12_4_ * fStack_314 + fStack_294 * fVar231) * auVar169._12_4_ + fVar231 * fVar308
    ;
    auVar419._16_4_ =
         (auVar169._16_4_ * fStack_310 + fStack_290 * fVar232) * auVar169._16_4_ + fVar232 * fVar310
    ;
    auVar419._20_4_ =
         (auVar169._20_4_ * fStack_30c + fStack_28c * fVar233) * auVar169._20_4_ + fVar233 * fVar312
    ;
    auVar419._24_4_ =
         (auVar169._24_4_ * fStack_308 + fStack_288 * fVar235) * auVar169._24_4_ + fVar235 * fVar314
    ;
    auVar419._28_4_ = fStack_2c4 + fVar234 + auVar303._28_4_;
    auVar226._0_4_ =
         (auVar169._0_4_ * (float)local_340._0_4_ + (float)local_2c0._0_4_ * fVar109) *
         auVar169._0_4_ + fVar109 * fVar252;
    auVar226._4_4_ =
         (auVar169._4_4_ * (float)local_340._4_4_ + (float)local_2c0._4_4_ * fVar110) *
         auVar169._4_4_ + fVar110 * fVar254;
    auVar226._8_4_ =
         (auVar169._8_4_ * fStack_338 + fStack_2b8 * fVar215) * auVar169._8_4_ + fVar215 * fVar256;
    auVar226._12_4_ =
         (auVar169._12_4_ * fStack_334 + fStack_2b4 * fVar231) * auVar169._12_4_ + fVar231 * fVar264
    ;
    auVar226._16_4_ =
         (auVar169._16_4_ * fStack_330 + fStack_2b0 * fVar232) * auVar169._16_4_ + fVar232 * fVar281
    ;
    auVar226._20_4_ =
         (auVar169._20_4_ * fStack_32c + fStack_2ac * fVar233) * auVar169._20_4_ + fVar233 * fVar283
    ;
    auVar226._24_4_ =
         (auVar169._24_4_ * fStack_328 + fStack_2a8 * fVar235) * auVar169._24_4_ + fVar235 * fVar285
    ;
    auVar226._28_4_ = fStack_2c4 + fVar234 + 1.0;
    auVar249._0_4_ =
         auVar169._0_4_ *
         (auVar169._0_4_ * (float)local_360._0_4_ + (float)local_2e0._0_4_ * fVar109) +
         fVar109 * fVar236;
    auVar249._4_4_ =
         auVar169._4_4_ *
         (auVar169._4_4_ * (float)local_360._4_4_ + (float)local_2e0._4_4_ * fVar110) +
         fVar110 * fVar253;
    auVar249._8_4_ =
         auVar169._8_4_ * (auVar169._8_4_ * fStack_358 + fStack_2d8 * fVar215) + fVar215 * fVar255;
    auVar249._12_4_ =
         auVar169._12_4_ * (auVar169._12_4_ * fStack_354 + fStack_2d4 * fVar231) + fVar231 * fVar257
    ;
    auVar249._16_4_ =
         auVar169._16_4_ * (auVar169._16_4_ * fStack_350 + fStack_2d0 * fVar232) + fVar232 * fVar258
    ;
    auVar249._20_4_ =
         auVar169._20_4_ * (auVar169._20_4_ * fStack_34c + fStack_2cc * fVar233) + fVar233 * fVar260
    ;
    auVar249._24_4_ =
         auVar169._24_4_ * (auVar169._24_4_ * fStack_348 + fStack_2c8 * fVar235) + fVar235 * fVar262
    ;
    auVar249._28_4_ = fVar404 + fStack_9a4 + 1.0;
    auVar273._0_4_ =
         (auVar169._0_4_ * (float)local_380._0_4_ + (float)local_300._0_4_ * fVar109) *
         auVar169._0_4_ + fVar109 * fVar265;
    auVar273._4_4_ =
         (auVar169._4_4_ * (float)local_380._4_4_ + (float)local_300._4_4_ * fVar110) *
         auVar169._4_4_ + fVar110 * fVar282;
    auVar273._8_4_ =
         (auVar169._8_4_ * fStack_378 + fStack_2f8 * fVar215) * auVar169._8_4_ + fVar215 * fVar284;
    auVar273._12_4_ =
         (auVar169._12_4_ * fStack_374 + fStack_2f4 * fVar231) * auVar169._12_4_ + fVar231 * fVar286
    ;
    auVar273._16_4_ =
         (auVar169._16_4_ * fStack_370 + fStack_2f0 * fVar232) * auVar169._16_4_ + fVar232 * fVar287
    ;
    auVar273._20_4_ =
         (auVar169._20_4_ * fStack_36c + fStack_2ec * fVar233) * auVar169._20_4_ + fVar233 * fVar288
    ;
    auVar273._24_4_ =
         (auVar169._24_4_ * fStack_368 + fStack_2e8 * fVar235) * auVar169._24_4_ + fVar235 * fVar289
    ;
    auVar273._28_4_ = fVar393 + fStack_224 + fVar393 + fStack_9a4;
    fVar108 = auVar370._0_4_ * fVar109 + auVar419._0_4_ * auVar169._0_4_;
    fVar141 = auVar370._4_4_ * fVar110 + auVar419._4_4_ * auVar169._4_4_;
    fVar143 = auVar370._8_4_ * fVar215 + auVar419._8_4_ * auVar169._8_4_;
    fVar145 = auVar370._12_4_ * fVar231 + auVar419._12_4_ * auVar169._12_4_;
    fVar146 = auVar370._16_4_ * fVar232 + auVar419._16_4_ * auVar169._16_4_;
    fVar147 = auVar370._20_4_ * fVar233 + auVar419._20_4_ * auVar169._20_4_;
    fVar148 = auVar370._24_4_ * fVar235 + auVar419._24_4_ * auVar169._24_4_;
    fVar149 = fVar393 + fStack_224 + fStack_2c4;
    auVar407._0_4_ = auVar386._0_4_ * fVar109 + auVar169._0_4_ * auVar226._0_4_;
    auVar407._4_4_ = auVar386._4_4_ * fVar110 + auVar169._4_4_ * auVar226._4_4_;
    auVar407._8_4_ = auVar386._8_4_ * fVar215 + auVar169._8_4_ * auVar226._8_4_;
    auVar407._12_4_ = auVar386._12_4_ * fVar231 + auVar169._12_4_ * auVar226._12_4_;
    auVar407._16_4_ = auVar386._16_4_ * fVar232 + auVar169._16_4_ * auVar226._16_4_;
    auVar407._20_4_ = auVar386._20_4_ * fVar233 + auVar169._20_4_ * auVar226._20_4_;
    auVar407._24_4_ = auVar386._24_4_ * fVar235 + auVar169._24_4_ * auVar226._24_4_;
    auVar407._28_4_ = fStack_2c4 + fVar404;
    auVar430._0_4_ = auVar390._0_4_ * fVar109 + auVar169._0_4_ * auVar249._0_4_;
    auVar430._4_4_ = auVar390._4_4_ * fVar110 + auVar169._4_4_ * auVar249._4_4_;
    auVar430._8_4_ = auVar390._8_4_ * fVar215 + auVar169._8_4_ * auVar249._8_4_;
    auVar430._12_4_ = auVar390._12_4_ * fVar231 + auVar169._12_4_ * auVar249._12_4_;
    auVar430._16_4_ = auVar390._16_4_ * fVar232 + auVar169._16_4_ * auVar249._16_4_;
    auVar430._20_4_ = auVar390._20_4_ * fVar233 + auVar169._20_4_ * auVar249._20_4_;
    auVar430._24_4_ = auVar390._24_4_ * fVar235 + auVar169._24_4_ * auVar249._24_4_;
    auVar430._28_4_ = fVar404 + fStack_2c4;
    local_800._0_4_ = fVar109 * auVar322._0_4_ + auVar169._0_4_ * auVar273._0_4_;
    local_800._4_4_ = fVar110 * auVar322._4_4_ + auVar169._4_4_ * auVar273._4_4_;
    local_800._8_4_ = fVar215 * auVar322._8_4_ + auVar169._8_4_ * auVar273._8_4_;
    local_800._12_4_ = fVar231 * auVar322._12_4_ + auVar169._12_4_ * auVar273._12_4_;
    local_800._16_4_ = fVar232 * auVar322._16_4_ + auVar169._16_4_ * auVar273._16_4_;
    local_800._20_4_ = fVar233 * auVar322._20_4_ + auVar169._20_4_ * auVar273._20_4_;
    local_800._24_4_ = fVar235 * auVar322._24_4_ + auVar169._24_4_ * auVar273._24_4_;
    local_800._28_4_ = auVar126._28_4_ + auVar169._28_4_;
    auVar207 = vsubps_avx(auVar419,auVar370);
    auVar126 = vsubps_avx(auVar226,auVar386);
    auVar127 = vsubps_avx(auVar249,auVar390);
    auVar28 = vsubps_avx(auVar273,auVar322);
    auVar161 = vshufps_avx(ZEXT416((uint)(fVar290 * 0.04761905)),
                           ZEXT416((uint)(fVar290 * 0.04761905)),0);
    fVar253 = auVar161._0_4_;
    fVar316 = fVar253 * auVar207._0_4_ * 3.0;
    fVar255 = auVar161._4_4_;
    fVar328 = fVar255 * auVar207._4_4_ * 3.0;
    auVar33._4_4_ = fVar328;
    auVar33._0_4_ = fVar316;
    fVar265 = auVar161._8_4_;
    fVar329 = fVar265 * auVar207._8_4_ * 3.0;
    auVar33._8_4_ = fVar329;
    fVar281 = auVar161._12_4_;
    fVar331 = fVar281 * auVar207._12_4_ * 3.0;
    auVar33._12_4_ = fVar331;
    fVar333 = fVar253 * auVar207._16_4_ * 3.0;
    auVar33._16_4_ = fVar333;
    fVar335 = fVar255 * auVar207._20_4_ * 3.0;
    auVar33._20_4_ = fVar335;
    fVar337 = fVar265 * auVar207._24_4_ * 3.0;
    auVar33._24_4_ = fVar337;
    auVar33._28_4_ = auVar322._28_4_;
    fVar339 = fVar253 * auVar126._0_4_ * 3.0;
    fVar349 = fVar255 * auVar126._4_4_ * 3.0;
    local_9a0._4_4_ = fVar349;
    local_9a0._0_4_ = fVar339;
    fVar352 = fVar265 * auVar126._8_4_ * 3.0;
    local_9a0._8_4_ = fVar352;
    fVar355 = fVar281 * auVar126._12_4_ * 3.0;
    local_9a0._12_4_ = fVar355;
    fVar358 = fVar253 * auVar126._16_4_ * 3.0;
    local_9a0._16_4_ = fVar358;
    fVar361 = fVar255 * auVar126._20_4_ * 3.0;
    local_9a0._20_4_ = fVar361;
    fVar364 = fVar265 * auVar126._24_4_ * 3.0;
    local_9a0._24_4_ = fVar364;
    local_9a0._28_4_ = fStack_2c4;
    fVar394 = fVar253 * auVar127._0_4_ * 3.0;
    fVar398 = fVar255 * auVar127._4_4_ * 3.0;
    auVar35._4_4_ = fVar398;
    auVar35._0_4_ = fVar394;
    fVar399 = fVar265 * auVar127._8_4_ * 3.0;
    auVar35._8_4_ = fVar399;
    fVar400 = fVar281 * auVar127._12_4_ * 3.0;
    auVar35._12_4_ = fVar400;
    fVar401 = fVar253 * auVar127._16_4_ * 3.0;
    auVar35._16_4_ = fVar401;
    fVar402 = fVar255 * auVar127._20_4_ * 3.0;
    auVar35._20_4_ = fVar402;
    fVar403 = fVar265 * auVar127._24_4_ * 3.0;
    auVar35._24_4_ = fVar403;
    auVar35._28_4_ = fVar404;
    fVar232 = fVar253 * auVar28._0_4_ * 3.0;
    fVar233 = fVar255 * auVar28._4_4_ * 3.0;
    auVar29._4_4_ = fVar233;
    auVar29._0_4_ = fVar232;
    fVar264 = fVar265 * auVar28._8_4_ * 3.0;
    auVar29._8_4_ = fVar264;
    fVar281 = fVar281 * auVar28._12_4_ * 3.0;
    auVar29._12_4_ = fVar281;
    fVar253 = fVar253 * auVar28._16_4_ * 3.0;
    auVar29._16_4_ = fVar253;
    fVar255 = fVar255 * auVar28._20_4_ * 3.0;
    auVar29._20_4_ = fVar255;
    fVar265 = fVar265 * auVar28._24_4_ * 3.0;
    auVar29._24_4_ = fVar265;
    auVar29._28_4_ = auVar207._28_4_;
    auVar126 = vperm2f128_avx(auVar407,auVar407,1);
    auVar126 = vshufps_avx(auVar126,auVar407,0x30);
    local_aa0 = vshufps_avx(auVar407,auVar126,0x29);
    auVar126 = vperm2f128_avx(auVar430,auVar430,1);
    auVar126 = vshufps_avx(auVar126,auVar430,0x30);
    auVar169 = vshufps_avx(auVar430,auVar126,0x29);
    auVar127 = vsubps_avx(local_800,auVar29);
    auVar126 = vperm2f128_avx(auVar127,auVar127,1);
    auVar126 = vshufps_avx(auVar126,auVar127,0x30);
    local_820 = vshufps_avx(auVar127,auVar126,0x29);
    auVar28 = vsubps_avx(local_aa0,auVar407);
    auVar29 = vsubps_avx(auVar169,auVar430);
    fVar109 = auVar28._0_4_;
    fVar235 = auVar28._4_4_;
    auVar27._4_4_ = fVar398 * fVar235;
    auVar27._0_4_ = fVar394 * fVar109;
    fVar283 = auVar28._8_4_;
    auVar27._8_4_ = fVar399 * fVar283;
    fVar257 = auVar28._12_4_;
    auVar27._12_4_ = fVar400 * fVar257;
    fVar284 = auVar28._16_4_;
    auVar27._16_4_ = fVar401 * fVar284;
    fVar304 = auVar28._20_4_;
    auVar27._20_4_ = fVar402 * fVar304;
    fVar393 = auVar28._24_4_;
    auVar27._24_4_ = fVar403 * fVar393;
    auVar27._28_4_ = auVar127._28_4_;
    fVar110 = auVar29._0_4_;
    fVar252 = auVar29._4_4_;
    auVar28._4_4_ = fVar349 * fVar252;
    auVar28._0_4_ = fVar339 * fVar110;
    fVar285 = auVar29._8_4_;
    auVar28._8_4_ = fVar352 * fVar285;
    fVar258 = auVar29._12_4_;
    auVar28._12_4_ = fVar355 * fVar258;
    fVar286 = auVar29._16_4_;
    auVar28._16_4_ = fVar358 * fVar286;
    fVar306 = auVar29._20_4_;
    auVar28._20_4_ = fVar361 * fVar306;
    fVar20 = auVar29._24_4_;
    auVar28._24_4_ = fVar364 * fVar20;
    auVar28._28_4_ = auVar126._28_4_;
    auVar433 = vsubps_avx(auVar28,auVar27);
    auVar84._4_4_ = fVar141;
    auVar84._0_4_ = fVar108;
    auVar84._8_4_ = fVar143;
    auVar84._12_4_ = fVar145;
    auVar84._16_4_ = fVar146;
    auVar84._20_4_ = fVar147;
    auVar84._24_4_ = fVar148;
    auVar84._28_4_ = fVar149;
    auVar126 = vperm2f128_avx(auVar84,auVar84,1);
    auVar126 = vshufps_avx(auVar126,auVar84,0x30);
    auVar27 = vshufps_avx(auVar84,auVar126,0x29);
    auVar127 = vsubps_avx(auVar27,auVar84);
    auVar30._4_4_ = fVar252 * fVar328;
    auVar30._0_4_ = fVar110 * fVar316;
    auVar30._8_4_ = fVar285 * fVar329;
    auVar30._12_4_ = fVar258 * fVar331;
    auVar30._16_4_ = fVar286 * fVar333;
    auVar30._20_4_ = fVar306 * fVar335;
    auVar30._24_4_ = fVar20 * fVar337;
    auVar30._28_4_ = auVar27._28_4_;
    fVar215 = auVar127._0_4_;
    fVar254 = auVar127._4_4_;
    auVar31._4_4_ = fVar398 * fVar254;
    auVar31._0_4_ = fVar394 * fVar215;
    fVar234 = auVar127._8_4_;
    auVar31._8_4_ = fVar399 * fVar234;
    fVar260 = auVar127._12_4_;
    auVar31._12_4_ = fVar400 * fVar260;
    fVar287 = auVar127._16_4_;
    auVar31._16_4_ = fVar401 * fVar287;
    fVar308 = auVar127._20_4_;
    auVar31._20_4_ = fVar402 * fVar308;
    fVar21 = auVar127._24_4_;
    auVar31._24_4_ = fVar403 * fVar21;
    auVar31._28_4_ = fVar149;
    auVar30 = vsubps_avx(auVar31,auVar30);
    auVar32._4_4_ = fVar349 * fVar254;
    auVar32._0_4_ = fVar339 * fVar215;
    auVar32._8_4_ = fVar352 * fVar234;
    auVar32._12_4_ = fVar355 * fVar260;
    auVar32._16_4_ = fVar358 * fVar287;
    auVar32._20_4_ = fVar361 * fVar308;
    auVar32._24_4_ = fVar364 * fVar21;
    auVar32._28_4_ = fVar149;
    auVar432._4_4_ = fVar328 * fVar235;
    auVar432._0_4_ = fVar316 * fVar109;
    auVar432._8_4_ = fVar329 * fVar283;
    auVar432._12_4_ = fVar331 * fVar257;
    auVar432._16_4_ = fVar333 * fVar284;
    auVar432._20_4_ = fVar335 * fVar304;
    auVar432._24_4_ = fVar337 * fVar393;
    auVar432._28_4_ = auVar386._28_4_;
    auVar31 = vsubps_avx(auVar432,auVar32);
    fVar290 = auVar31._28_4_;
    fVar282 = auVar30._28_4_ + fVar290;
    auVar227._0_4_ = fVar215 * fVar215 + fVar109 * fVar109 + fVar110 * fVar110;
    auVar227._4_4_ = fVar254 * fVar254 + fVar235 * fVar235 + fVar252 * fVar252;
    auVar227._8_4_ = fVar234 * fVar234 + fVar283 * fVar283 + fVar285 * fVar285;
    auVar227._12_4_ = fVar260 * fVar260 + fVar257 * fVar257 + fVar258 * fVar258;
    auVar227._16_4_ = fVar287 * fVar287 + fVar284 * fVar284 + fVar286 * fVar286;
    auVar227._20_4_ = fVar308 * fVar308 + fVar304 * fVar304 + fVar306 * fVar306;
    auVar227._24_4_ = fVar21 * fVar21 + fVar393 * fVar393 + fVar20 * fVar20;
    auVar227._28_4_ = fVar290 + fVar290 + fVar282;
    auVar126 = vrcpps_avx(auVar227);
    fVar289 = auVar126._0_4_;
    fVar291 = auVar126._4_4_;
    auVar34._4_4_ = fVar291 * auVar227._4_4_;
    auVar34._0_4_ = fVar289 * auVar227._0_4_;
    fVar312 = auVar126._8_4_;
    auVar34._8_4_ = fVar312 * auVar227._8_4_;
    fVar314 = auVar126._12_4_;
    auVar34._12_4_ = fVar314 * auVar227._12_4_;
    fVar259 = auVar126._16_4_;
    auVar34._16_4_ = fVar259 * auVar227._16_4_;
    fVar261 = auVar126._20_4_;
    auVar34._20_4_ = fVar261 * auVar227._20_4_;
    fVar263 = auVar126._24_4_;
    auVar34._24_4_ = fVar263 * auVar227._24_4_;
    auVar34._28_4_ = auVar386._28_4_;
    auVar408._8_4_ = 0x3f800000;
    auVar408._0_8_ = &DAT_3f8000003f800000;
    auVar408._12_4_ = 0x3f800000;
    auVar408._16_4_ = 0x3f800000;
    auVar408._20_4_ = 0x3f800000;
    auVar408._24_4_ = 0x3f800000;
    auVar408._28_4_ = 0x3f800000;
    auVar32 = vsubps_avx(auVar408,auVar34);
    fVar289 = auVar32._0_4_ * fVar289 + fVar289;
    fVar291 = auVar32._4_4_ * fVar291 + fVar291;
    fVar312 = auVar32._8_4_ * fVar312 + fVar312;
    fVar314 = auVar32._12_4_ * fVar314 + fVar314;
    fVar259 = auVar32._16_4_ * fVar259 + fVar259;
    fVar261 = auVar32._20_4_ * fVar261 + fVar261;
    fVar263 = auVar32._24_4_ * fVar263 + fVar263;
    auVar28 = vperm2f128_avx(local_9a0,local_9a0,1);
    auVar28 = vshufps_avx(auVar28,local_9a0,0x30);
    auVar28 = vshufps_avx(local_9a0,auVar28,0x29);
    auVar29 = vperm2f128_avx(auVar35,auVar35,1);
    auVar29 = vshufps_avx(auVar29,auVar35,0x30);
    local_a40 = vshufps_avx(auVar35,auVar29,0x29);
    fVar405 = local_a40._0_4_;
    fVar412 = local_a40._4_4_;
    auVar36._4_4_ = fVar412 * fVar235;
    auVar36._0_4_ = fVar405 * fVar109;
    fVar413 = local_a40._8_4_;
    auVar36._8_4_ = fVar413 * fVar283;
    fVar414 = local_a40._12_4_;
    auVar36._12_4_ = fVar414 * fVar257;
    fVar415 = local_a40._16_4_;
    auVar36._16_4_ = fVar415 * fVar284;
    fVar416 = local_a40._20_4_;
    auVar36._20_4_ = fVar416 * fVar304;
    fVar417 = local_a40._24_4_;
    auVar36._24_4_ = fVar417 * fVar393;
    auVar36._28_4_ = auVar29._28_4_;
    fVar340 = auVar28._0_4_;
    fVar350 = auVar28._4_4_;
    auVar37._4_4_ = fVar350 * fVar252;
    auVar37._0_4_ = fVar340 * fVar110;
    fVar353 = auVar28._8_4_;
    auVar37._8_4_ = fVar353 * fVar285;
    fVar356 = auVar28._12_4_;
    auVar37._12_4_ = fVar356 * fVar258;
    fVar359 = auVar28._16_4_;
    auVar37._16_4_ = fVar359 * fVar286;
    fVar362 = auVar28._20_4_;
    auVar37._20_4_ = fVar362 * fVar306;
    fVar365 = auVar28._24_4_;
    auVar37._24_4_ = fVar365 * fVar20;
    auVar37._28_4_ = fVar404;
    auVar29 = vsubps_avx(auVar37,auVar36);
    auVar28 = vperm2f128_avx(auVar33,auVar33,1);
    auVar28 = vshufps_avx(auVar28,auVar33,0x30);
    local_a20 = vshufps_avx(auVar33,auVar28,0x29);
    fVar231 = local_a20._0_4_;
    fVar256 = local_a20._4_4_;
    auVar38._4_4_ = fVar252 * fVar256;
    auVar38._0_4_ = fVar110 * fVar231;
    fVar236 = local_a20._8_4_;
    auVar38._8_4_ = fVar285 * fVar236;
    fVar262 = local_a20._12_4_;
    auVar38._12_4_ = fVar258 * fVar262;
    fVar288 = local_a20._16_4_;
    auVar38._16_4_ = fVar286 * fVar288;
    fVar310 = local_a20._20_4_;
    auVar38._20_4_ = fVar306 * fVar310;
    fVar404 = local_a20._24_4_;
    auVar38._24_4_ = fVar20 * fVar404;
    auVar38._28_4_ = auVar28._28_4_;
    auVar39._4_4_ = fVar412 * fVar254;
    auVar39._0_4_ = fVar405 * fVar215;
    auVar39._8_4_ = fVar413 * fVar234;
    auVar39._12_4_ = fVar414 * fVar260;
    auVar39._16_4_ = fVar415 * fVar287;
    auVar39._20_4_ = fVar416 * fVar308;
    uVar100 = local_a40._28_4_;
    auVar39._24_4_ = fVar417 * fVar21;
    auVar39._28_4_ = uVar100;
    auVar33 = vsubps_avx(auVar39,auVar38);
    auVar40._4_4_ = fVar350 * fVar254;
    auVar40._0_4_ = fVar340 * fVar215;
    auVar40._8_4_ = fVar353 * fVar234;
    auVar40._12_4_ = fVar356 * fVar260;
    auVar40._16_4_ = fVar359 * fVar287;
    auVar40._20_4_ = fVar362 * fVar308;
    auVar40._24_4_ = fVar365 * fVar21;
    auVar40._28_4_ = uVar100;
    auVar41._4_4_ = fVar256 * fVar235;
    auVar41._0_4_ = fVar231 * fVar109;
    auVar41._8_4_ = fVar236 * fVar283;
    auVar41._12_4_ = fVar262 * fVar257;
    auVar41._16_4_ = fVar288 * fVar284;
    auVar41._20_4_ = fVar310 * fVar304;
    auVar41._24_4_ = fVar404 * fVar393;
    auVar41._28_4_ = auVar419._28_4_;
    auVar28 = vsubps_avx(auVar41,auVar40);
    fVar290 = auVar28._28_4_;
    auVar42._4_4_ =
         (auVar433._4_4_ * auVar433._4_4_ +
         auVar30._4_4_ * auVar30._4_4_ + auVar31._4_4_ * auVar31._4_4_) * fVar291;
    auVar42._0_4_ =
         (auVar433._0_4_ * auVar433._0_4_ +
         auVar30._0_4_ * auVar30._0_4_ + auVar31._0_4_ * auVar31._0_4_) * fVar289;
    auVar42._8_4_ =
         (auVar433._8_4_ * auVar433._8_4_ +
         auVar30._8_4_ * auVar30._8_4_ + auVar31._8_4_ * auVar31._8_4_) * fVar312;
    auVar42._12_4_ =
         (auVar433._12_4_ * auVar433._12_4_ +
         auVar30._12_4_ * auVar30._12_4_ + auVar31._12_4_ * auVar31._12_4_) * fVar314;
    auVar42._16_4_ =
         (auVar433._16_4_ * auVar433._16_4_ +
         auVar30._16_4_ * auVar30._16_4_ + auVar31._16_4_ * auVar31._16_4_) * fVar259;
    auVar42._20_4_ =
         (auVar433._20_4_ * auVar433._20_4_ +
         auVar30._20_4_ * auVar30._20_4_ + auVar31._20_4_ * auVar31._20_4_) * fVar261;
    auVar42._24_4_ =
         (auVar433._24_4_ * auVar433._24_4_ +
         auVar30._24_4_ * auVar30._24_4_ + auVar31._24_4_ * auVar31._24_4_) * fVar263;
    auVar42._28_4_ = auVar433._28_4_ + fVar282;
    auVar433._4_4_ =
         (auVar29._4_4_ * auVar29._4_4_ +
         auVar33._4_4_ * auVar33._4_4_ + auVar28._4_4_ * auVar28._4_4_) * fVar291;
    auVar433._0_4_ =
         (auVar29._0_4_ * auVar29._0_4_ +
         auVar33._0_4_ * auVar33._0_4_ + auVar28._0_4_ * auVar28._0_4_) * fVar289;
    auVar433._8_4_ =
         (auVar29._8_4_ * auVar29._8_4_ +
         auVar33._8_4_ * auVar33._8_4_ + auVar28._8_4_ * auVar28._8_4_) * fVar312;
    auVar433._12_4_ =
         (auVar29._12_4_ * auVar29._12_4_ +
         auVar33._12_4_ * auVar33._12_4_ + auVar28._12_4_ * auVar28._12_4_) * fVar314;
    auVar433._16_4_ =
         (auVar29._16_4_ * auVar29._16_4_ +
         auVar33._16_4_ * auVar33._16_4_ + auVar28._16_4_ * auVar28._16_4_) * fVar259;
    auVar433._20_4_ =
         (auVar29._20_4_ * auVar29._20_4_ +
         auVar33._20_4_ * auVar33._20_4_ + auVar28._20_4_ * auVar28._20_4_) * fVar261;
    auVar433._24_4_ =
         (auVar29._24_4_ * auVar29._24_4_ +
         auVar33._24_4_ * auVar33._24_4_ + auVar28._24_4_ * auVar28._24_4_) * fVar263;
    auVar433._28_4_ = auVar32._28_4_ + auVar126._28_4_;
    auVar126 = vmaxps_avx(auVar42,auVar433);
    auVar28 = vperm2f128_avx(local_800,local_800,1);
    auVar28 = vshufps_avx(auVar28,local_800,0x30);
    local_840 = vshufps_avx(local_800,auVar28,0x29);
    auVar170._0_4_ = (float)local_800._0_4_ + fVar232;
    auVar170._4_4_ = local_800._4_4_ + fVar233;
    auVar170._8_4_ = local_800._8_4_ + fVar264;
    auVar170._12_4_ = local_800._12_4_ + fVar281;
    auVar170._16_4_ = local_800._16_4_ + fVar253;
    auVar170._20_4_ = local_800._20_4_ + fVar255;
    auVar170._24_4_ = local_800._24_4_ + fVar265;
    auVar170._28_4_ = local_800._28_4_ + auVar207._28_4_;
    auVar28 = vmaxps_avx(local_800,auVar170);
    auVar29 = vmaxps_avx(local_820,local_840);
    auVar28 = vmaxps_avx(auVar28,auVar29);
    auVar29 = vrsqrtps_avx(auVar227);
    fVar232 = auVar29._0_4_;
    fVar233 = auVar29._4_4_;
    fVar264 = auVar29._8_4_;
    fVar281 = auVar29._12_4_;
    fVar253 = auVar29._16_4_;
    fVar255 = auVar29._20_4_;
    fVar265 = auVar29._24_4_;
    fVar341 = fVar232 * 1.5 + fVar232 * fVar232 * fVar232 * auVar227._0_4_ * -0.5;
    fVar351 = fVar233 * 1.5 + fVar233 * fVar233 * fVar233 * auVar227._4_4_ * -0.5;
    fVar354 = fVar264 * 1.5 + fVar264 * fVar264 * fVar264 * auVar227._8_4_ * -0.5;
    fVar357 = fVar281 * 1.5 + fVar281 * fVar281 * fVar281 * auVar227._12_4_ * -0.5;
    fVar360 = fVar253 * 1.5 + fVar253 * fVar253 * fVar253 * auVar227._16_4_ * -0.5;
    fVar363 = fVar255 * 1.5 + fVar255 * fVar255 * fVar255 * auVar227._20_4_ * -0.5;
    fVar366 = fVar265 * 1.5 + fVar265 * fVar265 * fVar265 * auVar227._24_4_ * -0.5;
    auVar207 = vsubps_avx(ZEXT432(0) << 0x20,auVar407);
    auVar29 = vsubps_avx(ZEXT432(0) << 0x20,auVar430);
    fVar429 = auVar29._0_4_;
    fVar434 = auVar29._4_4_;
    fVar435 = auVar29._8_4_;
    fVar436 = auVar29._12_4_;
    fVar437 = auVar29._16_4_;
    fVar438 = auVar29._20_4_;
    fVar439 = auVar29._24_4_;
    fVar232 = auVar207._0_4_;
    fVar264 = auVar207._4_4_;
    fVar253 = auVar207._8_4_;
    fVar265 = auVar207._12_4_;
    fVar289 = auVar207._16_4_;
    fVar312 = auVar207._20_4_;
    fVar259 = auVar207._24_4_;
    auVar85._4_4_ = fVar141;
    auVar85._0_4_ = fVar108;
    auVar85._8_4_ = fVar143;
    auVar85._12_4_ = fVar145;
    auVar85._16_4_ = fVar146;
    auVar85._20_4_ = fVar147;
    auVar85._24_4_ = fVar148;
    auVar85._28_4_ = fVar149;
    auVar433 = vsubps_avx(ZEXT832(0) << 0x20,auVar85);
    fVar233 = auVar433._0_4_;
    fVar281 = auVar433._4_4_;
    fVar255 = auVar433._8_4_;
    fVar282 = auVar433._12_4_;
    fVar291 = auVar433._16_4_;
    fVar314 = auVar433._20_4_;
    fVar261 = auVar433._24_4_;
    auVar396._0_4_ =
         (float)local_860._0_4_ * fVar233 +
         (float)local_880._0_4_ * fVar232 + fVar429 * (float)local_8c0._0_4_;
    auVar396._4_4_ =
         (float)local_860._4_4_ * fVar281 +
         (float)local_880._4_4_ * fVar264 + fVar434 * (float)local_8c0._4_4_;
    auVar396._8_4_ = fStack_858 * fVar255 + fStack_878 * fVar253 + fVar435 * fStack_8b8;
    auVar396._12_4_ = fStack_854 * fVar282 + fStack_874 * fVar265 + fVar436 * fStack_8b4;
    auVar396._16_4_ = fStack_850 * fVar291 + fStack_870 * fVar289 + fVar437 * fStack_8b0;
    auVar396._20_4_ = fStack_84c * fVar314 + fStack_86c * fVar312 + fVar438 * fStack_8ac;
    auVar396._24_4_ = fStack_848 * fVar261 + fStack_868 * fVar259 + fVar439 * fStack_8a8;
    auVar396._28_4_ = fVar290 + auVar33._28_4_ + fVar290 + 0.0;
    auVar409._0_4_ = fVar233 * fVar233 + fVar232 * fVar232 + fVar429 * fVar429;
    auVar409._4_4_ = fVar281 * fVar281 + fVar264 * fVar264 + fVar434 * fVar434;
    auVar409._8_4_ = fVar255 * fVar255 + fVar253 * fVar253 + fVar435 * fVar435;
    auVar409._12_4_ = fVar282 * fVar282 + fVar265 * fVar265 + fVar436 * fVar436;
    auVar409._16_4_ = fVar291 * fVar291 + fVar289 * fVar289 + fVar437 * fVar437;
    auVar409._20_4_ = fVar314 * fVar314 + fVar312 * fVar312 + fVar438 * fVar438;
    auVar409._24_4_ = fVar261 * fVar261 + fVar259 * fVar259 + fVar439 * fVar439;
    auVar409._28_4_ = auVar419._28_4_ + auVar419._28_4_ + fVar290;
    fVar367 = (float)local_860._0_4_ * fVar215 * fVar341 +
              fVar341 * fVar109 * (float)local_880._0_4_ +
              fVar110 * fVar341 * (float)local_8c0._0_4_;
    fVar375 = (float)local_860._4_4_ * fVar254 * fVar351 +
              fVar351 * fVar235 * (float)local_880._4_4_ +
              fVar252 * fVar351 * (float)local_8c0._4_4_;
    fVar376 = fStack_858 * fVar234 * fVar354 +
              fVar354 * fVar283 * fStack_878 + fVar285 * fVar354 * fStack_8b8;
    fVar377 = fStack_854 * fVar260 * fVar357 +
              fVar357 * fVar257 * fStack_874 + fVar258 * fVar357 * fStack_8b4;
    fVar378 = fStack_850 * fVar287 * fVar360 +
              fVar360 * fVar284 * fStack_870 + fVar286 * fVar360 * fStack_8b0;
    fVar380 = fStack_84c * fVar308 * fVar363 +
              fVar363 * fVar304 * fStack_86c + fVar306 * fVar363 * fStack_8ac;
    fVar382 = fStack_848 * fVar21 * fVar366 +
              fVar366 * fVar393 * fStack_868 + fVar20 * fVar366 * fStack_8a8;
    fVar290 = fStack_844 + fStack_864 + fStack_8a4;
    fVar418 = fVar233 * fVar215 * fVar341 +
              fVar341 * fVar109 * fVar232 + fVar429 * fVar110 * fVar341;
    fVar422 = fVar281 * fVar254 * fVar351 +
              fVar351 * fVar235 * fVar264 + fVar434 * fVar252 * fVar351;
    fVar423 = fVar255 * fVar234 * fVar354 +
              fVar354 * fVar283 * fVar253 + fVar435 * fVar285 * fVar354;
    fVar424 = fVar282 * fVar260 * fVar357 +
              fVar357 * fVar257 * fVar265 + fVar436 * fVar258 * fVar357;
    fVar425 = fVar291 * fVar287 * fVar360 +
              fVar360 * fVar284 * fVar289 + fVar437 * fVar286 * fVar360;
    fVar426 = fVar314 * fVar308 * fVar363 +
              fVar363 * fVar304 * fVar312 + fVar438 * fVar306 * fVar363;
    fVar427 = fVar261 * fVar21 * fVar366 + fVar366 * fVar393 * fVar259 + fVar439 * fVar20 * fVar366;
    fVar428 = fStack_864 + fVar290;
    auVar43._4_4_ = fVar375 * fVar422;
    auVar43._0_4_ = fVar367 * fVar418;
    auVar43._8_4_ = fVar376 * fVar423;
    auVar43._12_4_ = fVar377 * fVar424;
    auVar43._16_4_ = fVar378 * fVar425;
    auVar43._20_4_ = fVar380 * fVar426;
    auVar43._24_4_ = fVar382 * fVar427;
    auVar43._28_4_ = fVar290;
    auVar30 = vsubps_avx(auVar396,auVar43);
    auVar44._4_4_ = fVar422 * fVar422;
    auVar44._0_4_ = fVar418 * fVar418;
    auVar44._8_4_ = fVar423 * fVar423;
    auVar44._12_4_ = fVar424 * fVar424;
    auVar44._16_4_ = fVar425 * fVar425;
    auVar44._20_4_ = fVar426 * fVar426;
    auVar44._24_4_ = fVar427 * fVar427;
    auVar44._28_4_ = fStack_864;
    auVar31 = vsubps_avx(auVar409,auVar44);
    auVar303 = ZEXT3264(auVar31);
    auVar29 = vsqrtps_avx(auVar126);
    fVar290 = (auVar29._0_4_ + auVar28._0_4_) * 1.0000002;
    fVar263 = (auVar29._4_4_ + auVar28._4_4_) * 1.0000002;
    fVar190 = (auVar29._8_4_ + auVar28._8_4_) * 1.0000002;
    fVar192 = (auVar29._12_4_ + auVar28._12_4_) * 1.0000002;
    fVar193 = (auVar29._16_4_ + auVar28._16_4_) * 1.0000002;
    fVar194 = (auVar29._20_4_ + auVar28._20_4_) * 1.0000002;
    fVar195 = (auVar29._24_4_ + auVar28._24_4_) * 1.0000002;
    auVar45._4_4_ = fVar263 * fVar263;
    auVar45._0_4_ = fVar290 * fVar290;
    auVar45._8_4_ = fVar190 * fVar190;
    auVar45._12_4_ = fVar192 * fVar192;
    auVar45._16_4_ = fVar193 * fVar193;
    auVar45._20_4_ = fVar194 * fVar194;
    auVar45._24_4_ = fVar195 * fVar195;
    auVar45._28_4_ = auVar29._28_4_ + auVar28._28_4_;
    fVar263 = auVar30._0_4_ + auVar30._0_4_;
    fVar190 = auVar30._4_4_ + auVar30._4_4_;
    local_400._0_8_ = CONCAT44(fVar190,fVar263);
    local_400._8_4_ = auVar30._8_4_ + auVar30._8_4_;
    local_400._12_4_ = auVar30._12_4_ + auVar30._12_4_;
    local_400._16_4_ = auVar30._16_4_ + auVar30._16_4_;
    local_400._20_4_ = auVar30._20_4_ + auVar30._20_4_;
    local_400._24_4_ = auVar30._24_4_ + auVar30._24_4_;
    fVar290 = auVar30._28_4_;
    local_400._28_4_ = fVar290 + fVar290;
    auVar28 = vsubps_avx(auVar31,auVar45);
    auVar46._4_4_ = fVar375 * fVar375;
    auVar46._0_4_ = fVar367 * fVar367;
    auVar46._8_4_ = fVar376 * fVar376;
    auVar46._12_4_ = fVar377 * fVar377;
    auVar46._16_4_ = fVar378 * fVar378;
    auVar46._20_4_ = fVar380 * fVar380;
    auVar46._24_4_ = fVar382 * fVar382;
    auVar46._28_4_ = auVar127._28_4_;
    auVar392 = ZEXT3264(auVar46);
    auVar30 = vsubps_avx(local_3a0,auVar46);
    auVar47._4_4_ = fVar190 * fVar190;
    auVar47._0_4_ = fVar263 * fVar263;
    auVar47._8_4_ = local_400._8_4_ * local_400._8_4_;
    auVar47._12_4_ = local_400._12_4_ * local_400._12_4_;
    auVar47._16_4_ = local_400._16_4_ * local_400._16_4_;
    auVar47._20_4_ = local_400._20_4_ * local_400._20_4_;
    auVar47._24_4_ = local_400._24_4_ * local_400._24_4_;
    auVar47._28_4_ = fVar290;
    fVar192 = auVar30._0_4_;
    fVar193 = auVar30._4_4_;
    fVar194 = auVar30._8_4_;
    fVar195 = auVar30._12_4_;
    fVar379 = auVar30._16_4_;
    fVar381 = auVar30._20_4_;
    fVar383 = auVar30._24_4_;
    auVar48._4_4_ = fVar193 * 4.0 * auVar28._4_4_;
    auVar48._0_4_ = fVar192 * 4.0 * auVar28._0_4_;
    auVar48._8_4_ = fVar194 * 4.0 * auVar28._8_4_;
    auVar48._12_4_ = fVar195 * 4.0 * auVar28._12_4_;
    auVar48._16_4_ = fVar379 * 4.0 * auVar28._16_4_;
    auVar48._20_4_ = fVar381 * 4.0 * auVar28._20_4_;
    auVar48._24_4_ = fVar383 * 4.0 * auVar28._24_4_;
    auVar48._28_4_ = 0x40800000;
    auVar32 = vsubps_avx(auVar47,auVar48);
    auVar126 = vcmpps_avx(auVar32,ZEXT832(0) << 0x20,5);
    fVar290 = auVar30._28_4_;
    if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar126 >> 0x7f,0) == '\0') &&
          (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar126 >> 0xbf,0) == '\0') &&
        (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar126[0x1f])
    {
      auVar128._8_4_ = 0x7f800000;
      auVar128._0_8_ = 0x7f8000007f800000;
      auVar128._12_4_ = 0x7f800000;
      auVar128._16_4_ = 0x7f800000;
      auVar128._20_4_ = 0x7f800000;
      auVar128._24_4_ = 0x7f800000;
      auVar128._28_4_ = 0x7f800000;
      auVar420._8_4_ = 0xff800000;
      auVar420._0_8_ = 0xff800000ff800000;
      auVar420._12_4_ = 0xff800000;
      auVar420._16_4_ = 0xff800000;
      auVar420._20_4_ = 0xff800000;
      auVar420._24_4_ = 0xff800000;
      auVar420._28_4_ = 0xff800000;
    }
    else {
      auVar432 = vsqrtps_avx(auVar32);
      auVar297._0_4_ = fVar192 + fVar192;
      auVar297._4_4_ = fVar193 + fVar193;
      auVar297._8_4_ = fVar194 + fVar194;
      auVar297._12_4_ = fVar195 + fVar195;
      auVar297._16_4_ = fVar379 + fVar379;
      auVar297._20_4_ = fVar381 + fVar381;
      auVar297._24_4_ = fVar383 + fVar383;
      auVar297._28_4_ = fVar290 + fVar290;
      auVar35 = vrcpps_avx(auVar297);
      auVar33 = vcmpps_avx(auVar32,ZEXT832(0) << 0x20,5);
      fVar292 = auVar35._0_4_;
      fVar305 = auVar35._4_4_;
      auVar49._4_4_ = auVar297._4_4_ * fVar305;
      auVar49._0_4_ = auVar297._0_4_ * fVar292;
      fVar307 = auVar35._8_4_;
      auVar49._8_4_ = auVar297._8_4_ * fVar307;
      fVar309 = auVar35._12_4_;
      auVar49._12_4_ = auVar297._12_4_ * fVar309;
      fVar311 = auVar35._16_4_;
      auVar49._16_4_ = auVar297._16_4_ * fVar311;
      fVar313 = auVar35._20_4_;
      auVar49._20_4_ = auVar297._20_4_ * fVar313;
      fVar315 = auVar35._24_4_;
      auVar49._24_4_ = auVar297._24_4_ * fVar315;
      auVar49._28_4_ = auVar297._28_4_;
      auVar129._8_4_ = 0x3f800000;
      auVar129._0_8_ = &DAT_3f8000003f800000;
      auVar129._12_4_ = 0x3f800000;
      auVar129._16_4_ = 0x3f800000;
      auVar129._20_4_ = 0x3f800000;
      auVar129._24_4_ = 0x3f800000;
      auVar129._28_4_ = 0x3f800000;
      auVar32 = vsubps_avx(auVar129,auVar49);
      fVar292 = fVar292 + fVar292 * auVar32._0_4_;
      fVar305 = fVar305 + fVar305 * auVar32._4_4_;
      fVar307 = fVar307 + fVar307 * auVar32._8_4_;
      fVar309 = fVar309 + fVar309 * auVar32._12_4_;
      fVar311 = fVar311 + fVar311 * auVar32._16_4_;
      fVar313 = fVar313 + fVar313 * auVar32._20_4_;
      fVar315 = fVar315 + fVar315 * auVar32._24_4_;
      auVar323._0_8_ = CONCAT44(fVar190,fVar263) ^ 0x8000000080000000;
      auVar323._8_4_ = -local_400._8_4_;
      auVar323._12_4_ = -local_400._12_4_;
      auVar323._16_4_ = -local_400._16_4_;
      auVar323._20_4_ = -local_400._20_4_;
      auVar323._24_4_ = -local_400._24_4_;
      auVar323._28_4_ = -local_400._28_4_;
      auVar34 = vsubps_avx(auVar323,auVar432);
      fVar263 = auVar34._0_4_ * fVar292;
      fVar190 = auVar34._4_4_ * fVar305;
      auVar50._4_4_ = fVar190;
      auVar50._0_4_ = fVar263;
      fVar330 = auVar34._8_4_ * fVar307;
      auVar50._8_4_ = fVar330;
      fVar332 = auVar34._12_4_ * fVar309;
      auVar50._12_4_ = fVar332;
      fVar334 = auVar34._16_4_ * fVar311;
      auVar50._16_4_ = fVar334;
      fVar336 = auVar34._20_4_ * fVar313;
      auVar50._20_4_ = fVar336;
      fVar338 = auVar34._24_4_ * fVar315;
      auVar50._24_4_ = fVar338;
      auVar50._28_4_ = auVar34._28_4_;
      auVar432 = vsubps_avx(auVar432,local_400);
      fVar292 = auVar432._0_4_ * fVar292;
      fVar305 = auVar432._4_4_ * fVar305;
      auVar51._4_4_ = fVar305;
      auVar51._0_4_ = fVar292;
      fVar307 = auVar432._8_4_ * fVar307;
      auVar51._8_4_ = fVar307;
      fVar309 = auVar432._12_4_ * fVar309;
      auVar51._12_4_ = fVar309;
      fVar311 = auVar432._16_4_ * fVar311;
      auVar51._16_4_ = fVar311;
      fVar313 = auVar432._20_4_ * fVar313;
      auVar51._20_4_ = fVar313;
      fVar315 = auVar432._24_4_ * fVar315;
      auVar51._24_4_ = fVar315;
      auVar51._28_4_ = auVar432._28_4_;
      fStack_624 = fVar428 + auVar35._28_4_ + auVar32._28_4_;
      local_640[0] = fVar341 * (fVar418 + fVar367 * fVar263);
      local_640[1] = fVar351 * (fVar422 + fVar375 * fVar190);
      local_640[2] = fVar354 * (fVar423 + fVar376 * fVar330);
      local_640[3] = fVar357 * (fVar424 + fVar377 * fVar332);
      fStack_630 = fVar360 * (fVar425 + fVar378 * fVar334);
      fStack_62c = fVar363 * (fVar426 + fVar380 * fVar336);
      fStack_628 = fVar366 * (fVar427 + fVar382 * fVar338);
      local_660[0] = fVar341 * (fVar418 + fVar367 * fVar292);
      local_660[1] = fVar351 * (fVar422 + fVar375 * fVar305);
      local_660[2] = fVar354 * (fVar423 + fVar376 * fVar307);
      local_660[3] = fVar357 * (fVar424 + fVar377 * fVar309);
      fStack_650 = fVar360 * (fVar425 + fVar378 * fVar311);
      fStack_64c = fVar363 * (fVar426 + fVar380 * fVar313);
      fStack_648 = fVar366 * (fVar427 + fVar382 * fVar315);
      fStack_644 = fVar428 + fStack_624;
      auVar298._8_4_ = 0x7f800000;
      auVar298._0_8_ = 0x7f8000007f800000;
      auVar298._12_4_ = 0x7f800000;
      auVar298._16_4_ = 0x7f800000;
      auVar298._20_4_ = 0x7f800000;
      auVar298._24_4_ = 0x7f800000;
      auVar298._28_4_ = 0x7f800000;
      auVar128 = vblendvps_avx(auVar298,auVar50,auVar33);
      auVar324._8_4_ = 0x7fffffff;
      auVar324._0_8_ = 0x7fffffff7fffffff;
      auVar324._12_4_ = 0x7fffffff;
      auVar324._16_4_ = 0x7fffffff;
      auVar324._20_4_ = 0x7fffffff;
      auVar324._24_4_ = 0x7fffffff;
      auVar324._28_4_ = 0x7fffffff;
      auVar32 = vandps_avx(auVar46,auVar324);
      auVar32 = vmaxps_avx(local_4a0,auVar32);
      auVar52._4_4_ = auVar32._4_4_ * 1.9073486e-06;
      auVar52._0_4_ = auVar32._0_4_ * 1.9073486e-06;
      auVar52._8_4_ = auVar32._8_4_ * 1.9073486e-06;
      auVar52._12_4_ = auVar32._12_4_ * 1.9073486e-06;
      auVar52._16_4_ = auVar32._16_4_ * 1.9073486e-06;
      auVar52._20_4_ = auVar32._20_4_ * 1.9073486e-06;
      auVar52._24_4_ = auVar32._24_4_ * 1.9073486e-06;
      auVar52._28_4_ = auVar32._28_4_;
      auVar32 = vandps_avx(auVar30,auVar324);
      auVar32 = vcmpps_avx(auVar32,auVar52,1);
      auVar299._8_4_ = 0xff800000;
      auVar299._0_8_ = 0xff800000ff800000;
      auVar299._12_4_ = 0xff800000;
      auVar299._16_4_ = 0xff800000;
      auVar299._20_4_ = 0xff800000;
      auVar299._24_4_ = 0xff800000;
      auVar299._28_4_ = 0xff800000;
      auVar303 = ZEXT3264(auVar299);
      auVar420 = vblendvps_avx(auVar299,auVar51,auVar33);
      auVar35 = auVar33 & auVar32;
      if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar35 >> 0x7f,0) != '\0') ||
            (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar35 >> 0xbf,0) != '\0') ||
          (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar35[0x1f] < '\0') {
        auVar126 = vandps_avx(auVar32,auVar33);
        auVar161 = vpackssdw_avx(auVar126._0_16_,auVar126._16_16_);
        auVar32 = vcmpps_avx(auVar28,ZEXT832(0) << 0x20,2);
        auVar411._8_4_ = 0xff800000;
        auVar411._0_8_ = 0xff800000ff800000;
        auVar411._12_4_ = 0xff800000;
        auVar411._16_4_ = 0xff800000;
        auVar411._20_4_ = 0xff800000;
        auVar411._24_4_ = 0xff800000;
        auVar411._28_4_ = 0xff800000;
        auVar387._8_4_ = 0x7f800000;
        auVar387._0_8_ = 0x7f8000007f800000;
        auVar387._12_4_ = 0x7f800000;
        auVar387._16_4_ = 0x7f800000;
        auVar387._20_4_ = 0x7f800000;
        auVar387._24_4_ = 0x7f800000;
        auVar387._28_4_ = 0x7f800000;
        auVar28 = vblendvps_avx(auVar387,auVar411,auVar32);
        auVar22 = vpmovsxwd_avx(auVar161);
        auVar161 = vpunpckhwd_avx(auVar161,auVar161);
        auVar280._16_16_ = auVar161;
        auVar280._0_16_ = auVar22;
        auVar128 = vblendvps_avx(auVar128,auVar28,auVar280);
        auVar28 = vblendvps_avx(auVar411,auVar387,auVar32);
        auVar303 = ZEXT3264(auVar28);
        auVar420 = vblendvps_avx(auVar420,auVar28,auVar280);
        auVar28 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar213._0_4_ = auVar126._0_4_ ^ auVar28._0_4_;
        auVar213._4_4_ = auVar126._4_4_ ^ auVar28._4_4_;
        auVar213._8_4_ = auVar126._8_4_ ^ auVar28._8_4_;
        auVar213._12_4_ = auVar126._12_4_ ^ auVar28._12_4_;
        auVar213._16_4_ = auVar126._16_4_ ^ auVar28._16_4_;
        auVar213._20_4_ = auVar126._20_4_ ^ auVar28._20_4_;
        auVar213._24_4_ = auVar126._24_4_ ^ auVar28._24_4_;
        auVar213._28_4_ = auVar126._28_4_ ^ auVar28._28_4_;
        auVar126 = vorps_avx(auVar32,auVar213);
        auVar126 = vandps_avx(auVar33,auVar126);
      }
    }
    auVar28 = local_3c0 & auVar126;
    if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar28 >> 0x7f,0) == '\0') &&
          (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar28 >> 0xbf,0) == '\0') &&
        (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar28[0x1f]) {
      auVar327 = ZEXT864(0) << 0x20;
    }
    else {
      auVar161 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_940._0_4_
                                           )),
                             ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_940._0_4_
                                           )),0);
      auVar171._16_16_ = auVar161;
      auVar171._0_16_ = auVar161;
      auVar33 = vminps_avx(auVar171,auVar420);
      auVar130._0_4_ =
           (float)local_860._0_4_ * fVar316 +
           (float)local_880._0_4_ * fVar339 + fVar394 * (float)local_8c0._0_4_;
      auVar130._4_4_ =
           (float)local_860._4_4_ * fVar328 +
           (float)local_880._4_4_ * fVar349 + fVar398 * (float)local_8c0._4_4_;
      auVar130._8_4_ = fStack_858 * fVar329 + fStack_878 * fVar352 + fVar399 * fStack_8b8;
      auVar130._12_4_ = fStack_854 * fVar331 + fStack_874 * fVar355 + fVar400 * fStack_8b4;
      auVar130._16_4_ = fStack_850 * fVar333 + fStack_870 * fVar358 + fVar401 * fStack_8b0;
      auVar130._20_4_ = fStack_84c * fVar335 + fStack_86c * fVar361 + fVar402 * fStack_8ac;
      auVar130._24_4_ = fStack_848 * fVar337 + fStack_868 * fVar364 + fVar403 * fStack_8a8;
      auVar130._28_4_ = auVar322._28_4_ + fStack_9a4 + auVar433._28_4_;
      auVar28 = vrcpps_avx(auVar130);
      fVar263 = auVar28._0_4_;
      fVar190 = auVar28._4_4_;
      auVar53._4_4_ = auVar130._4_4_ * fVar190;
      auVar53._0_4_ = auVar130._0_4_ * fVar263;
      fVar292 = auVar28._8_4_;
      auVar53._8_4_ = auVar130._8_4_ * fVar292;
      fVar305 = auVar28._12_4_;
      auVar53._12_4_ = auVar130._12_4_ * fVar305;
      fVar307 = auVar28._16_4_;
      auVar53._16_4_ = auVar130._16_4_ * fVar307;
      fVar309 = auVar28._20_4_;
      auVar53._20_4_ = auVar130._20_4_ * fVar309;
      fVar311 = auVar28._24_4_;
      auVar53._24_4_ = auVar130._24_4_ * fVar311;
      auVar53._28_4_ = fStack_9a4;
      auVar410._8_4_ = 0x3f800000;
      auVar410._0_8_ = &DAT_3f8000003f800000;
      auVar410._12_4_ = 0x3f800000;
      auVar410._16_4_ = 0x3f800000;
      auVar410._20_4_ = 0x3f800000;
      auVar410._24_4_ = 0x3f800000;
      auVar410._28_4_ = 0x3f800000;
      auVar35 = vsubps_avx(auVar410,auVar53);
      auVar371._8_4_ = 0x7fffffff;
      auVar371._0_8_ = 0x7fffffff7fffffff;
      auVar371._12_4_ = 0x7fffffff;
      auVar371._16_4_ = 0x7fffffff;
      auVar371._20_4_ = 0x7fffffff;
      auVar371._24_4_ = 0x7fffffff;
      auVar371._28_4_ = 0x7fffffff;
      auVar28 = vandps_avx(auVar371,auVar130);
      auVar431._8_4_ = 0x219392ef;
      auVar431._0_8_ = 0x219392ef219392ef;
      auVar431._12_4_ = 0x219392ef;
      auVar431._16_4_ = 0x219392ef;
      auVar431._20_4_ = 0x219392ef;
      auVar431._24_4_ = 0x219392ef;
      auVar431._28_4_ = 0x219392ef;
      auVar32 = vcmpps_avx(auVar28,auVar431,1);
      auVar54._4_4_ =
           (fVar190 + fVar190 * auVar35._4_4_) *
           -(fVar281 * fVar328 + fVar264 * fVar349 + fVar434 * fVar398);
      auVar54._0_4_ =
           (fVar263 + fVar263 * auVar35._0_4_) *
           -(fVar233 * fVar316 + fVar232 * fVar339 + fVar429 * fVar394);
      auVar54._8_4_ =
           (fVar292 + fVar292 * auVar35._8_4_) *
           -(fVar255 * fVar329 + fVar253 * fVar352 + fVar435 * fVar399);
      auVar54._12_4_ =
           (fVar305 + fVar305 * auVar35._12_4_) *
           -(fVar282 * fVar331 + fVar265 * fVar355 + fVar436 * fVar400);
      auVar54._16_4_ =
           (fVar307 + fVar307 * auVar35._16_4_) *
           -(fVar291 * fVar333 + fVar289 * fVar358 + fVar437 * fVar401);
      auVar54._20_4_ =
           (fVar309 + fVar309 * auVar35._20_4_) *
           -(fVar314 * fVar335 + fVar312 * fVar361 + fVar438 * fVar402);
      auVar54._24_4_ =
           (fVar311 + fVar311 * auVar35._24_4_) *
           -(fVar261 * fVar337 + fVar259 * fVar364 + fVar439 * fVar403);
      auVar54._28_4_ = -(auVar433._28_4_ + auVar207._28_4_ + fStack_9a4);
      auVar77 = ZEXT812(0);
      auVar28 = vcmpps_avx(auVar130,ZEXT1232(auVar77) << 0x20,1);
      auVar28 = vorps_avx(auVar32,auVar28);
      auVar391._8_4_ = 0xff800000;
      auVar391._0_8_ = 0xff800000ff800000;
      auVar391._12_4_ = 0xff800000;
      auVar391._16_4_ = 0xff800000;
      auVar391._20_4_ = 0xff800000;
      auVar391._24_4_ = 0xff800000;
      auVar391._28_4_ = 0xff800000;
      auVar392 = ZEXT3264(auVar391);
      auVar28 = vblendvps_avx(auVar54,auVar391,auVar28);
      auVar207 = vcmpps_avx(auVar130,ZEXT1232(auVar77) << 0x20,6);
      auVar207 = vorps_avx(auVar32,auVar207);
      auVar397._8_4_ = 0x7f800000;
      auVar397._0_8_ = 0x7f8000007f800000;
      auVar397._12_4_ = 0x7f800000;
      auVar397._16_4_ = 0x7f800000;
      auVar397._20_4_ = 0x7f800000;
      auVar397._24_4_ = 0x7f800000;
      auVar397._28_4_ = 0x7f800000;
      auVar207 = vblendvps_avx(auVar54,auVar397,auVar207);
      auVar433 = vmaxps_avx(local_3e0,auVar128);
      auVar433 = vmaxps_avx(auVar433,auVar28);
      auVar207 = vminps_avx(auVar33,auVar207);
      auVar432 = ZEXT1232(auVar77) << 0x20;
      auVar28 = vsubps_avx(auVar432,local_aa0);
      auVar169 = vsubps_avx(auVar432,auVar169);
      auVar55._4_4_ = auVar169._4_4_ * -fVar412;
      auVar55._0_4_ = auVar169._0_4_ * -fVar405;
      auVar55._8_4_ = auVar169._8_4_ * -fVar413;
      auVar55._12_4_ = auVar169._12_4_ * -fVar414;
      auVar55._16_4_ = auVar169._16_4_ * -fVar415;
      auVar55._20_4_ = auVar169._20_4_ * -fVar416;
      auVar55._24_4_ = auVar169._24_4_ * -fVar417;
      auVar55._28_4_ = auVar169._28_4_;
      auVar56._4_4_ = fVar350 * auVar28._4_4_;
      auVar56._0_4_ = fVar340 * auVar28._0_4_;
      auVar56._8_4_ = fVar353 * auVar28._8_4_;
      auVar56._12_4_ = fVar356 * auVar28._12_4_;
      auVar56._16_4_ = fVar359 * auVar28._16_4_;
      auVar56._20_4_ = fVar362 * auVar28._20_4_;
      auVar56._24_4_ = fVar365 * auVar28._24_4_;
      auVar56._28_4_ = auVar28._28_4_;
      auVar28 = vsubps_avx(auVar55,auVar56);
      auVar169 = vsubps_avx(auVar432,auVar27);
      auVar57._4_4_ = fVar256 * auVar169._4_4_;
      auVar57._0_4_ = fVar231 * auVar169._0_4_;
      auVar57._8_4_ = fVar236 * auVar169._8_4_;
      auVar57._12_4_ = fVar262 * auVar169._12_4_;
      auVar57._16_4_ = fVar288 * auVar169._16_4_;
      auVar57._20_4_ = fVar310 * auVar169._20_4_;
      uVar9 = auVar169._28_4_;
      auVar57._24_4_ = fVar404 * auVar169._24_4_;
      auVar57._28_4_ = uVar9;
      auVar32 = vsubps_avx(auVar28,auVar57);
      auVar58._4_4_ = -fVar412 * (float)local_8c0._4_4_;
      auVar58._0_4_ = -fVar405 * (float)local_8c0._0_4_;
      auVar58._8_4_ = -fVar413 * fStack_8b8;
      auVar58._12_4_ = -fVar414 * fStack_8b4;
      auVar58._16_4_ = -fVar415 * fStack_8b0;
      auVar58._20_4_ = -fVar416 * fStack_8ac;
      auVar58._24_4_ = -fVar417 * fStack_8a8;
      auVar58._28_4_ = uVar100 ^ 0x80000000;
      auVar59._4_4_ = (float)local_880._4_4_ * fVar350;
      auVar59._0_4_ = (float)local_880._0_4_ * fVar340;
      auVar59._8_4_ = fStack_878 * fVar353;
      auVar59._12_4_ = fStack_874 * fVar356;
      auVar59._16_4_ = fStack_870 * fVar359;
      auVar59._20_4_ = fStack_86c * fVar362;
      auVar59._24_4_ = fStack_868 * fVar365;
      auVar59._28_4_ = uVar9;
      auVar348._8_4_ = 0x3f800000;
      auVar348._0_8_ = &DAT_3f8000003f800000;
      auVar348._12_4_ = 0x3f800000;
      auVar348._16_4_ = 0x3f800000;
      auVar348._20_4_ = 0x3f800000;
      auVar348._24_4_ = 0x3f800000;
      auVar348._28_4_ = 0x3f800000;
      auVar28 = vsubps_avx(auVar58,auVar59);
      auVar60._4_4_ = fVar256 * (float)local_860._4_4_;
      auVar60._0_4_ = fVar231 * (float)local_860._0_4_;
      auVar60._8_4_ = fVar236 * fStack_858;
      auVar60._12_4_ = fVar262 * fStack_854;
      auVar60._16_4_ = fVar288 * fStack_850;
      auVar60._20_4_ = fVar310 * fStack_84c;
      auVar60._24_4_ = fVar404 * fStack_848;
      auVar60._28_4_ = uVar9;
      auVar33 = vsubps_avx(auVar28,auVar60);
      auVar28 = vrcpps_avx(auVar33);
      fVar231 = auVar28._0_4_;
      fVar232 = auVar28._4_4_;
      auVar61._4_4_ = auVar33._4_4_ * fVar232;
      auVar61._0_4_ = auVar33._0_4_ * fVar231;
      fVar233 = auVar28._8_4_;
      auVar61._8_4_ = auVar33._8_4_ * fVar233;
      fVar256 = auVar28._12_4_;
      auVar61._12_4_ = auVar33._12_4_ * fVar256;
      fVar264 = auVar28._16_4_;
      auVar61._16_4_ = auVar33._16_4_ * fVar264;
      fVar281 = auVar28._20_4_;
      auVar61._20_4_ = auVar33._20_4_ * fVar281;
      fVar236 = auVar28._24_4_;
      auVar61._24_4_ = auVar33._24_4_ * fVar236;
      auVar61._28_4_ = fStack_844;
      auVar35 = vsubps_avx(auVar348,auVar61);
      auVar300._8_4_ = 0x7fffffff;
      auVar300._0_8_ = 0x7fffffff7fffffff;
      auVar300._12_4_ = 0x7fffffff;
      auVar300._16_4_ = 0x7fffffff;
      auVar300._20_4_ = 0x7fffffff;
      auVar300._24_4_ = 0x7fffffff;
      auVar300._28_4_ = 0x7fffffff;
      auVar28 = vandps_avx(auVar33,auVar300);
      auVar372._8_4_ = 0x219392ef;
      auVar372._0_8_ = 0x219392ef219392ef;
      auVar372._12_4_ = 0x219392ef;
      auVar372._16_4_ = 0x219392ef;
      auVar372._20_4_ = 0x219392ef;
      auVar372._24_4_ = 0x219392ef;
      auVar372._28_4_ = 0x219392ef;
      auVar169 = vcmpps_avx(auVar28,auVar372,1);
      auVar62._4_4_ = (fVar232 + fVar232 * auVar35._4_4_) * -auVar32._4_4_;
      auVar62._0_4_ = (fVar231 + fVar231 * auVar35._0_4_) * -auVar32._0_4_;
      auVar62._8_4_ = (fVar233 + fVar233 * auVar35._8_4_) * -auVar32._8_4_;
      auVar62._12_4_ = (fVar256 + fVar256 * auVar35._12_4_) * -auVar32._12_4_;
      auVar62._16_4_ = (fVar264 + fVar264 * auVar35._16_4_) * -auVar32._16_4_;
      auVar62._20_4_ = (fVar281 + fVar281 * auVar35._20_4_) * -auVar32._20_4_;
      auVar62._24_4_ = (fVar236 + fVar236 * auVar35._24_4_) * -auVar32._24_4_;
      auVar62._28_4_ = auVar32._28_4_ ^ 0x80000000;
      auVar28 = vcmpps_avx(auVar33,auVar432,1);
      auVar28 = vorps_avx(auVar169,auVar28);
      auVar28 = vblendvps_avx(auVar62,auVar391,auVar28);
      _local_700 = vmaxps_avx(auVar433,auVar28);
      auVar433 = ZEXT1232(auVar77) << 0x20;
      auVar28 = vcmpps_avx(auVar33,auVar433,6);
      auVar28 = vorps_avx(auVar169,auVar28);
      auVar28 = vblendvps_avx(auVar62,auVar397,auVar28);
      auVar126 = vandps_avx(auVar126,local_3c0);
      local_420 = vminps_avx(auVar207,auVar28);
      auVar28 = vcmpps_avx(_local_700,local_420,2);
      auVar207 = auVar126 & auVar28;
      if ((((((((auVar207 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar207 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar207 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar207 >> 0x7f,0) != '\0') ||
            (auVar207 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar207 >> 0xbf,0) != '\0') ||
          (auVar207 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar207[0x1f] < '\0') {
        auVar169 = vminps_avx(local_800,auVar170);
        auVar207 = vminps_avx(local_820,local_840);
        auVar169 = vminps_avx(auVar169,auVar207);
        auVar29 = vsubps_avx(auVar169,auVar29);
        auVar126 = vandps_avx(auVar28,auVar126);
        auVar97._4_4_ = local_640[1];
        auVar97._0_4_ = local_640[0];
        auVar97._8_4_ = local_640[2];
        auVar97._12_4_ = local_640[3];
        auVar97._16_4_ = fStack_630;
        auVar97._20_4_ = fStack_62c;
        auVar97._24_4_ = fStack_628;
        auVar97._28_4_ = fStack_624;
        auVar28 = vminps_avx(auVar97,auVar348);
        auVar28 = vmaxps_avx(auVar28,ZEXT832(0) << 0x20);
        local_640[0] = fVar107 + fVar151 * (auVar28._0_4_ + 0.0) * 0.125;
        local_640[1] = fVar140 + fVar188 * (auVar28._4_4_ + 1.0) * 0.125;
        local_640[2] = fVar142 + fVar189 * (auVar28._8_4_ + 2.0) * 0.125;
        local_640[3] = fVar144 + fVar191 * (auVar28._12_4_ + 3.0) * 0.125;
        fStack_630 = fVar107 + fVar151 * (auVar28._16_4_ + 4.0) * 0.125;
        fStack_62c = fVar140 + fVar188 * (auVar28._20_4_ + 5.0) * 0.125;
        fStack_628 = fVar142 + fVar189 * (auVar28._24_4_ + 6.0) * 0.125;
        fStack_624 = fVar144 + auVar28._28_4_ + 7.0;
        auVar96._4_4_ = local_660[1];
        auVar96._0_4_ = local_660[0];
        auVar96._8_4_ = local_660[2];
        auVar96._12_4_ = local_660[3];
        auVar96._16_4_ = fStack_650;
        auVar96._20_4_ = fStack_64c;
        auVar96._24_4_ = fStack_648;
        auVar96._28_4_ = fStack_644;
        auVar28 = vminps_avx(auVar96,auVar348);
        auVar28 = vmaxps_avx(auVar28,ZEXT832(0) << 0x20);
        local_660[0] = fVar107 + fVar151 * (auVar28._0_4_ + 0.0) * 0.125;
        local_660[1] = fVar140 + fVar188 * (auVar28._4_4_ + 1.0) * 0.125;
        local_660[2] = fVar142 + fVar189 * (auVar28._8_4_ + 2.0) * 0.125;
        local_660[3] = fVar144 + fVar191 * (auVar28._12_4_ + 3.0) * 0.125;
        fStack_650 = fVar107 + fVar151 * (auVar28._16_4_ + 4.0) * 0.125;
        fStack_64c = fVar140 + fVar188 * (auVar28._20_4_ + 5.0) * 0.125;
        fStack_648 = fVar142 + fVar189 * (auVar28._24_4_ + 6.0) * 0.125;
        fStack_644 = fVar144 + auVar28._28_4_ + 7.0;
        auVar63._4_4_ = auVar29._4_4_ * 0.99999976;
        auVar63._0_4_ = auVar29._0_4_ * 0.99999976;
        auVar63._8_4_ = auVar29._8_4_ * 0.99999976;
        auVar63._12_4_ = auVar29._12_4_ * 0.99999976;
        auVar63._16_4_ = auVar29._16_4_ * 0.99999976;
        auVar63._20_4_ = auVar29._20_4_ * 0.99999976;
        auVar63._24_4_ = auVar29._24_4_ * 0.99999976;
        auVar63._28_4_ = 0x3f7ffffc;
        auVar28 = vmaxps_avx(auVar433,auVar63);
        auVar64._4_4_ = auVar28._4_4_ * auVar28._4_4_;
        auVar64._0_4_ = auVar28._0_4_ * auVar28._0_4_;
        auVar64._8_4_ = auVar28._8_4_ * auVar28._8_4_;
        auVar64._12_4_ = auVar28._12_4_ * auVar28._12_4_;
        auVar64._16_4_ = auVar28._16_4_ * auVar28._16_4_;
        auVar64._20_4_ = auVar28._20_4_ * auVar28._20_4_;
        auVar64._24_4_ = auVar28._24_4_ * auVar28._24_4_;
        auVar64._28_4_ = auVar28._28_4_;
        local_980 = vsubps_avx(auVar31,auVar64);
        auVar65._4_4_ = local_980._4_4_ * fVar193 * 4.0;
        auVar65._0_4_ = local_980._0_4_ * fVar192 * 4.0;
        auVar65._8_4_ = local_980._8_4_ * fVar194 * 4.0;
        auVar65._12_4_ = local_980._12_4_ * fVar195 * 4.0;
        auVar65._16_4_ = local_980._16_4_ * fVar379 * 4.0;
        auVar65._20_4_ = local_980._20_4_ * fVar381 * 4.0;
        auVar65._24_4_ = local_980._24_4_ * fVar383 * 4.0;
        auVar65._28_4_ = auVar28._28_4_;
        auVar29 = vsubps_avx(auVar47,auVar65);
        auVar28 = vcmpps_avx(auVar29,ZEXT832(0) << 0x20,5);
        if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar28 >> 0x7f,0) == '\0') &&
              (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar28 >> 0xbf,0) == '\0') &&
            (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar28[0x1f]) {
          _local_900 = ZEXT1232(ZEXT412(0)) << 0x20;
          _local_920 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar207 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar248 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar347 = ZEXT828(0) << 0x20;
          auVar172._8_4_ = 0x7f800000;
          auVar172._0_8_ = 0x7f8000007f800000;
          auVar172._12_4_ = 0x7f800000;
          auVar172._16_4_ = 0x7f800000;
          auVar172._20_4_ = 0x7f800000;
          auVar172._24_4_ = 0x7f800000;
          auVar172._28_4_ = 0x7f800000;
          auVar274._8_4_ = 0xff800000;
          auVar274._0_8_ = 0xff800000ff800000;
          auVar274._12_4_ = 0xff800000;
          auVar274._16_4_ = 0xff800000;
          auVar274._20_4_ = 0xff800000;
          auVar274._24_4_ = 0xff800000;
          auVar274._28_4_ = 0xff800000;
          local_980 = auVar27;
          _local_8e0 = _local_900;
        }
        else {
          auVar27 = vsqrtps_avx(auVar29);
          auVar173._0_4_ = fVar192 + fVar192;
          auVar173._4_4_ = fVar193 + fVar193;
          auVar173._8_4_ = fVar194 + fVar194;
          auVar173._12_4_ = fVar195 + fVar195;
          auVar173._16_4_ = fVar379 + fVar379;
          auVar173._20_4_ = fVar381 + fVar381;
          auVar173._24_4_ = fVar383 + fVar383;
          auVar173._28_4_ = fVar290 + fVar290;
          auVar169 = vrcpps_avx(auVar173);
          fVar290 = auVar169._0_4_;
          fVar231 = auVar169._4_4_;
          auVar66._4_4_ = auVar173._4_4_ * fVar231;
          auVar66._0_4_ = auVar173._0_4_ * fVar290;
          fVar232 = auVar169._8_4_;
          auVar66._8_4_ = auVar173._8_4_ * fVar232;
          fVar233 = auVar169._12_4_;
          auVar66._12_4_ = auVar173._12_4_ * fVar233;
          fVar256 = auVar169._16_4_;
          auVar66._16_4_ = auVar173._16_4_ * fVar256;
          fVar264 = auVar169._20_4_;
          auVar66._20_4_ = auVar173._20_4_ * fVar264;
          fVar281 = auVar169._24_4_;
          auVar66._24_4_ = auVar173._24_4_ * fVar281;
          auVar66._28_4_ = auVar173._28_4_;
          auVar207 = vsubps_avx(auVar348,auVar66);
          fVar290 = fVar290 + fVar290 * auVar207._0_4_;
          fVar231 = fVar231 + fVar231 * auVar207._4_4_;
          fVar232 = fVar232 + fVar232 * auVar207._8_4_;
          fVar233 = fVar233 + fVar233 * auVar207._12_4_;
          fVar256 = fVar256 + fVar256 * auVar207._16_4_;
          fVar264 = fVar264 + fVar264 * auVar207._20_4_;
          fVar281 = fVar281 + fVar281 * auVar207._24_4_;
          fVar289 = auVar169._28_4_ + auVar207._28_4_;
          auVar174._0_8_ = local_400._0_8_ ^ 0x8000000080000000;
          auVar174._8_4_ = -local_400._8_4_;
          auVar174._12_4_ = -local_400._12_4_;
          auVar174._16_4_ = -local_400._16_4_;
          auVar174._20_4_ = -local_400._20_4_;
          auVar174._24_4_ = -local_400._24_4_;
          auVar174._28_4_ = -local_400._28_4_;
          auVar169 = vsubps_avx(auVar174,auVar27);
          fVar236 = auVar169._0_4_ * fVar290;
          fVar253 = auVar169._4_4_ * fVar231;
          auVar67._4_4_ = fVar253;
          auVar67._0_4_ = fVar236;
          fVar255 = auVar169._8_4_ * fVar232;
          auVar67._8_4_ = fVar255;
          fVar262 = auVar169._12_4_ * fVar233;
          auVar67._12_4_ = fVar262;
          fVar265 = auVar169._16_4_ * fVar256;
          auVar67._16_4_ = fVar265;
          fVar282 = auVar169._20_4_ * fVar264;
          auVar67._20_4_ = fVar282;
          fVar288 = auVar169._24_4_ * fVar281;
          auVar67._24_4_ = fVar288;
          auVar67._28_4_ = auVar169._28_4_;
          auVar169 = vsubps_avx(auVar27,local_400);
          fVar290 = auVar169._0_4_ * fVar290;
          fVar231 = auVar169._4_4_ * fVar231;
          auVar68._4_4_ = fVar231;
          auVar68._0_4_ = fVar290;
          fVar232 = auVar169._8_4_ * fVar232;
          auVar68._8_4_ = fVar232;
          fVar233 = auVar169._12_4_ * fVar233;
          auVar68._12_4_ = fVar233;
          fVar256 = auVar169._16_4_ * fVar256;
          auVar68._16_4_ = fVar256;
          fVar264 = auVar169._20_4_ * fVar264;
          auVar68._20_4_ = fVar264;
          fVar281 = auVar169._24_4_ * fVar281;
          auVar68._24_4_ = fVar281;
          auVar68._28_4_ = local_400._28_4_;
          fVar291 = (fVar236 * fVar367 + fVar418) * fVar341;
          fVar310 = (fVar253 * fVar375 + fVar422) * fVar351;
          fVar312 = (fVar255 * fVar376 + fVar423) * fVar354;
          fVar314 = (fVar262 * fVar377 + fVar424) * fVar357;
          fVar404 = (fVar265 * fVar378 + fVar425) * fVar360;
          fVar259 = (fVar282 * fVar380 + fVar426) * fVar363;
          fVar261 = (fVar288 * fVar382 + fVar427) * fVar366;
          auVar228._0_4_ = fVar108 + fVar215 * fVar291;
          auVar228._4_4_ = fVar141 + fVar254 * fVar310;
          auVar228._8_4_ = fVar143 + fVar234 * fVar312;
          auVar228._12_4_ = fVar145 + fVar260 * fVar314;
          auVar228._16_4_ = fVar146 + fVar287 * fVar404;
          auVar228._20_4_ = fVar147 + fVar308 * fVar259;
          auVar228._24_4_ = fVar148 + fVar21 * fVar261;
          auVar228._28_4_ = fVar149 + auVar169._28_4_ + fVar428;
          auVar69._4_4_ = (float)local_860._4_4_ * fVar253;
          auVar69._0_4_ = (float)local_860._0_4_ * fVar236;
          auVar69._8_4_ = fStack_858 * fVar255;
          auVar69._12_4_ = fStack_854 * fVar262;
          auVar69._16_4_ = fStack_850 * fVar265;
          auVar69._20_4_ = fStack_84c * fVar282;
          auVar69._24_4_ = fStack_848 * fVar288;
          auVar69._28_4_ = fVar289;
          auVar207 = vsubps_avx(auVar69,auVar228);
          auVar250._0_4_ = auVar407._0_4_ + fVar109 * fVar291;
          auVar250._4_4_ = auVar407._4_4_ + fVar235 * fVar310;
          auVar250._8_4_ = auVar407._8_4_ + fVar283 * fVar312;
          auVar250._12_4_ = auVar407._12_4_ + fVar257 * fVar314;
          auVar250._16_4_ = auVar407._16_4_ + fVar284 * fVar404;
          auVar250._20_4_ = auVar407._20_4_ + fVar304 * fVar259;
          auVar250._24_4_ = auVar407._24_4_ + fVar393 * fVar261;
          auVar250._28_4_ = auVar407._28_4_ + fVar289;
          auVar70._4_4_ = (float)local_880._4_4_ * fVar253;
          auVar70._0_4_ = (float)local_880._0_4_ * fVar236;
          auVar70._8_4_ = fStack_878 * fVar255;
          auVar70._12_4_ = fStack_874 * fVar262;
          auVar70._16_4_ = fStack_870 * fVar265;
          auVar70._20_4_ = fStack_86c * fVar282;
          auVar70._24_4_ = fStack_868 * fVar288;
          auVar70._28_4_ = fVar144;
          auVar27 = vsubps_avx(auVar70,auVar250);
          auVar275._0_4_ = auVar430._0_4_ + fVar110 * fVar291;
          auVar275._4_4_ = auVar430._4_4_ + fVar252 * fVar310;
          auVar275._8_4_ = auVar430._8_4_ + fVar285 * fVar312;
          auVar275._12_4_ = auVar430._12_4_ + fVar258 * fVar314;
          auVar275._16_4_ = auVar430._16_4_ + fVar286 * fVar404;
          auVar275._20_4_ = auVar430._20_4_ + fVar306 * fVar259;
          auVar275._24_4_ = auVar430._24_4_ + fVar20 * fVar261;
          auVar275._28_4_ = auVar430._28_4_ + 0.0;
          auVar71._4_4_ = (float)local_8c0._4_4_ * fVar253;
          auVar71._0_4_ = (float)local_8c0._0_4_ * fVar236;
          auVar71._8_4_ = fStack_8b8 * fVar255;
          auVar71._12_4_ = fStack_8b4 * fVar262;
          auVar71._16_4_ = fStack_8b0 * fVar265;
          auVar71._20_4_ = fStack_8ac * fVar282;
          auVar71._24_4_ = fStack_8a8 * fVar288;
          auVar71._28_4_ = fVar144;
          local_9a0 = vsubps_avx(auVar71,auVar275);
          fVar341 = (fVar290 * fVar367 + fVar418) * fVar341;
          fVar351 = (fVar231 * fVar375 + fVar422) * fVar351;
          fVar354 = (fVar232 * fVar376 + fVar423) * fVar354;
          fVar357 = (fVar233 * fVar377 + fVar424) * fVar357;
          fVar360 = (fVar256 * fVar378 + fVar425) * fVar360;
          fVar363 = (fVar264 * fVar380 + fVar426) * fVar363;
          fVar366 = (fVar281 * fVar382 + fVar427) * fVar366;
          auVar301._0_4_ = fVar108 + fVar215 * fVar341;
          auVar301._4_4_ = fVar141 + fVar254 * fVar351;
          auVar301._8_4_ = fVar143 + fVar234 * fVar354;
          auVar301._12_4_ = fVar145 + fVar260 * fVar357;
          auVar301._16_4_ = fVar146 + fVar287 * fVar360;
          auVar301._20_4_ = fVar147 + fVar308 * fVar363;
          auVar301._24_4_ = fVar148 + fVar21 * fVar366;
          auVar301._28_4_ = fVar149 + fVar144;
          auVar72._4_4_ = (float)local_860._4_4_ * fVar231;
          auVar72._0_4_ = (float)local_860._0_4_ * fVar290;
          auVar72._8_4_ = fStack_858 * fVar232;
          auVar72._12_4_ = fStack_854 * fVar233;
          auVar72._16_4_ = fStack_850 * fVar256;
          auVar72._20_4_ = fStack_84c * fVar264;
          auVar72._24_4_ = fStack_848 * fVar281;
          auVar72._28_4_ = fStack_844;
          _local_8e0 = vsubps_avx(auVar72,auVar301);
          auVar302._0_4_ = auVar407._0_4_ + fVar109 * fVar341;
          auVar302._4_4_ = auVar407._4_4_ + fVar235 * fVar351;
          auVar302._8_4_ = auVar407._8_4_ + fVar283 * fVar354;
          auVar302._12_4_ = auVar407._12_4_ + fVar257 * fVar357;
          auVar302._16_4_ = auVar407._16_4_ + fVar284 * fVar360;
          auVar302._20_4_ = auVar407._20_4_ + fVar304 * fVar363;
          auVar302._24_4_ = auVar407._24_4_ + fVar393 * fVar366;
          auVar302._28_4_ = auVar407._28_4_ + local_8e0._28_4_;
          auVar73._4_4_ = (float)local_880._4_4_ * fVar231;
          auVar73._0_4_ = (float)local_880._0_4_ * fVar290;
          auVar73._8_4_ = fStack_878 * fVar232;
          auVar73._12_4_ = fStack_874 * fVar233;
          auVar73._16_4_ = fStack_870 * fVar256;
          auVar73._20_4_ = fStack_86c * fVar264;
          auVar73._24_4_ = fStack_868 * fVar281;
          auVar73._28_4_ = fStack_844;
          _local_900 = vsubps_avx(auVar73,auVar302);
          auVar276._0_4_ = auVar430._0_4_ + fVar110 * fVar341;
          auVar276._4_4_ = auVar430._4_4_ + fVar252 * fVar351;
          auVar276._8_4_ = auVar430._8_4_ + fVar285 * fVar354;
          auVar276._12_4_ = auVar430._12_4_ + fVar258 * fVar357;
          auVar276._16_4_ = auVar430._16_4_ + fVar286 * fVar360;
          auVar276._20_4_ = auVar430._20_4_ + fVar306 * fVar363;
          auVar276._24_4_ = auVar430._24_4_ + fVar20 * fVar366;
          auVar276._28_4_ = auVar430._28_4_ + local_9a0._28_4_ + fVar428;
          auVar74._4_4_ = (float)local_8c0._4_4_ * fVar231;
          auVar74._0_4_ = (float)local_8c0._0_4_ * fVar290;
          auVar74._8_4_ = fStack_8b8 * fVar232;
          auVar74._12_4_ = fStack_8b4 * fVar233;
          auVar74._16_4_ = fStack_8b0 * fVar256;
          auVar74._20_4_ = fStack_8ac * fVar264;
          auVar74._24_4_ = fStack_8a8 * fVar281;
          auVar74._28_4_ = local_900._28_4_;
          _local_920 = vsubps_avx(auVar74,auVar276);
          auVar169 = vcmpps_avx(auVar29,auVar433,5);
          auVar277._8_4_ = 0x7f800000;
          auVar277._0_8_ = 0x7f8000007f800000;
          auVar277._12_4_ = 0x7f800000;
          auVar277._16_4_ = 0x7f800000;
          auVar277._20_4_ = 0x7f800000;
          auVar277._24_4_ = 0x7f800000;
          auVar277._28_4_ = 0x7f800000;
          auVar172 = vblendvps_avx(auVar277,auVar67,auVar169);
          auVar325._8_4_ = 0x7fffffff;
          auVar325._0_8_ = 0x7fffffff7fffffff;
          auVar325._12_4_ = 0x7fffffff;
          auVar325._16_4_ = 0x7fffffff;
          auVar325._20_4_ = 0x7fffffff;
          auVar325._24_4_ = 0x7fffffff;
          auVar325._28_4_ = 0x7fffffff;
          auVar29 = vandps_avx(auVar325,auVar46);
          auVar29 = vmaxps_avx(local_4a0,auVar29);
          auVar75._4_4_ = auVar29._4_4_ * 1.9073486e-06;
          auVar75._0_4_ = auVar29._0_4_ * 1.9073486e-06;
          auVar75._8_4_ = auVar29._8_4_ * 1.9073486e-06;
          auVar75._12_4_ = auVar29._12_4_ * 1.9073486e-06;
          auVar75._16_4_ = auVar29._16_4_ * 1.9073486e-06;
          auVar75._20_4_ = auVar29._20_4_ * 1.9073486e-06;
          auVar75._24_4_ = auVar29._24_4_ * 1.9073486e-06;
          auVar75._28_4_ = auVar29._28_4_;
          auVar29 = vandps_avx(auVar325,auVar30);
          auVar29 = vcmpps_avx(auVar29,auVar75,1);
          auVar278._8_4_ = 0xff800000;
          auVar278._0_8_ = 0xff800000ff800000;
          auVar278._12_4_ = 0xff800000;
          auVar278._16_4_ = 0xff800000;
          auVar278._20_4_ = 0xff800000;
          auVar278._24_4_ = 0xff800000;
          auVar278._28_4_ = 0xff800000;
          auVar274 = vblendvps_avx(auVar278,auVar68,auVar169);
          auVar433 = auVar169 & auVar29;
          if ((((((((auVar433 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar433 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar433 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar433 >> 0x7f,0) != '\0') ||
                (auVar433 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar433 >> 0xbf,0) != '\0') ||
              (auVar433 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar433[0x1f] < '\0') {
            auVar28 = vandps_avx(auVar29,auVar169);
            auVar161 = vpackssdw_avx(auVar28._0_16_,auVar28._16_16_);
            auVar29 = vcmpps_avx(local_980,ZEXT832(0) << 0x20,2);
            auVar421._8_4_ = 0xff800000;
            auVar421._0_8_ = 0xff800000ff800000;
            auVar421._12_4_ = 0xff800000;
            auVar421._16_4_ = 0xff800000;
            auVar421._20_4_ = 0xff800000;
            auVar421._24_4_ = 0xff800000;
            auVar421._28_4_ = 0xff800000;
            auVar373._8_4_ = 0x7f800000;
            auVar373._0_8_ = 0x7f8000007f800000;
            auVar373._12_4_ = 0x7f800000;
            auVar373._16_4_ = 0x7f800000;
            auVar373._20_4_ = 0x7f800000;
            auVar373._24_4_ = 0x7f800000;
            auVar373._28_4_ = 0x7f800000;
            auVar127 = vblendvps_avx(auVar373,auVar421,auVar29);
            auVar22 = vpmovsxwd_avx(auVar161);
            auVar161 = vpunpckhwd_avx(auVar161,auVar161);
            auVar326._16_16_ = auVar161;
            auVar326._0_16_ = auVar22;
            auVar172 = vblendvps_avx(auVar172,auVar127,auVar326);
            auVar127 = vblendvps_avx(auVar421,auVar373,auVar29);
            auVar274 = vblendvps_avx(auVar274,auVar127,auVar326);
            auVar433 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar214._0_4_ = auVar28._0_4_ ^ auVar433._0_4_;
            auVar214._4_4_ = auVar28._4_4_ ^ auVar433._4_4_;
            auVar214._8_4_ = auVar28._8_4_ ^ auVar433._8_4_;
            auVar214._12_4_ = auVar28._12_4_ ^ auVar433._12_4_;
            auVar214._16_4_ = auVar28._16_4_ ^ auVar433._16_4_;
            auVar214._20_4_ = auVar28._20_4_ ^ auVar433._20_4_;
            auVar214._24_4_ = auVar28._24_4_ ^ auVar433._24_4_;
            auVar214._28_4_ = auVar28._28_4_ ^ auVar433._28_4_;
            auVar28 = vorps_avx(auVar29,auVar214);
            auVar28 = vandps_avx(auVar169,auVar28);
          }
          auVar392 = ZEXT3264(auVar127);
          auVar248 = auVar27._0_28_;
          auVar347 = local_9a0._0_28_;
          local_aa0 = auVar126;
        }
        _local_480 = _local_700;
        local_460 = vminps_avx(local_420,auVar172);
        _local_680 = vmaxps_avx(_local_700,auVar274);
        _local_440 = _local_680;
        auVar127 = vcmpps_avx(_local_700,local_460,2);
        local_780 = vandps_avx(auVar126,auVar127);
        auVar127 = vcmpps_avx(_local_680,local_420,2);
        local_740 = vandps_avx(auVar126,auVar127);
        auVar126 = vorps_avx(local_740,local_780);
        auVar169 = _local_700;
        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar126 >> 0x7f,0) != '\0') ||
              (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar126 >> 0xbf,0) != '\0') ||
            (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar126[0x1f] < '\0') {
          local_9e0 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_6e0._0_4_ = auVar28._0_4_ ^ local_9e0._0_4_;
          local_6e0._4_4_ = auVar28._4_4_ ^ local_9e0._4_4_;
          local_6e0._8_4_ = auVar28._8_4_ ^ local_9e0._8_4_;
          local_6e0._12_4_ = auVar28._12_4_ ^ local_9e0._12_4_;
          local_6e0._16_4_ = auVar28._16_4_ ^ local_9e0._16_4_;
          local_6e0._20_4_ = auVar28._20_4_ ^ local_9e0._20_4_;
          local_6e0._24_4_ = auVar28._24_4_ ^ local_9e0._24_4_;
          local_6e0._28_4_ = auVar28._28_4_ ^ (uint)local_9e0._28_4_;
          auVar303 = ZEXT3264(local_6e0);
          auVar132._0_4_ =
               auVar207._0_4_ * (float)local_860._0_4_ +
               auVar248._0_4_ * (float)local_880._0_4_ + auVar347._0_4_ * (float)local_8c0._0_4_;
          auVar132._4_4_ =
               auVar207._4_4_ * (float)local_860._4_4_ +
               auVar248._4_4_ * (float)local_880._4_4_ + auVar347._4_4_ * (float)local_8c0._4_4_;
          auVar132._8_4_ =
               auVar207._8_4_ * fStack_858 +
               auVar248._8_4_ * fStack_878 + auVar347._8_4_ * fStack_8b8;
          auVar132._12_4_ =
               auVar207._12_4_ * fStack_854 +
               auVar248._12_4_ * fStack_874 + auVar347._12_4_ * fStack_8b4;
          auVar132._16_4_ =
               auVar207._16_4_ * fStack_850 +
               auVar248._16_4_ * fStack_870 + auVar347._16_4_ * fStack_8b0;
          auVar132._20_4_ =
               auVar207._20_4_ * fStack_84c +
               auVar248._20_4_ * fStack_86c + auVar347._20_4_ * fStack_8ac;
          auVar132._24_4_ =
               auVar207._24_4_ * fStack_848 +
               auVar248._24_4_ * fStack_868 + auVar347._24_4_ * fStack_8a8;
          auVar132._28_4_ = local_9e0._28_4_ + local_740._28_4_ + auVar207._28_4_;
          auVar175._8_4_ = 0x7fffffff;
          auVar175._0_8_ = 0x7fffffff7fffffff;
          auVar175._12_4_ = 0x7fffffff;
          auVar175._16_4_ = 0x7fffffff;
          auVar175._20_4_ = 0x7fffffff;
          auVar175._24_4_ = 0x7fffffff;
          auVar175._28_4_ = 0x7fffffff;
          auVar126 = vandps_avx(auVar132,auVar175);
          auVar176._8_4_ = 0x3e99999a;
          auVar176._0_8_ = 0x3e99999a3e99999a;
          auVar176._12_4_ = 0x3e99999a;
          auVar176._16_4_ = 0x3e99999a;
          auVar176._20_4_ = 0x3e99999a;
          auVar176._24_4_ = 0x3e99999a;
          auVar176._28_4_ = 0x3e99999a;
          auVar126 = vcmpps_avx(auVar126,auVar176,1);
          auVar126 = vorps_avx(auVar126,local_6e0);
          auVar177._8_4_ = 3;
          auVar177._0_8_ = 0x300000003;
          auVar177._12_4_ = 3;
          auVar177._16_4_ = 3;
          auVar177._20_4_ = 3;
          auVar177._24_4_ = 3;
          auVar177._28_4_ = 3;
          auVar209._8_4_ = 2;
          auVar209._0_8_ = 0x200000002;
          auVar209._12_4_ = 2;
          auVar209._16_4_ = 2;
          auVar209._20_4_ = 2;
          auVar209._24_4_ = 2;
          auVar209._28_4_ = 2;
          auVar126 = vblendvps_avx(auVar209,auVar177,auVar126);
          local_6c0 = ZEXT432((uint)uVar104);
          local_7c0 = vpshufd_avx(ZEXT416((uint)uVar104),0);
          auVar161 = vpcmpgtd_avx(auVar126._16_16_,local_7c0);
          auStack_7b0 = auVar30._16_16_;
          auVar22 = vpcmpgtd_avx(auVar126._0_16_,local_7c0);
          auVar178._16_16_ = auVar161;
          auVar178._0_16_ = auVar22;
          local_7a0 = vblendps_avx(ZEXT1632(auVar22),auVar178,0xf0);
          auVar126 = vandnps_avx(local_7a0,local_780);
          auVar127 = local_780 & ~local_7a0;
          auVar230 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auVar327 = ZEXT864(0) << 0x20;
          auStack_758 = auVar170._8_24_;
          local_760 = uVar104;
          local_720 = auVar126;
          local_6a0 = local_740;
          if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar127 >> 0x7f,0) != '\0') ||
                (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar127 >> 0xbf,0) != '\0') ||
              (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar127[0x1f] < '\0') {
            local_8a0._4_4_ = (float)local_9c0._4_4_ + (float)local_700._4_4_;
            local_8a0._0_4_ = (float)local_9c0._0_4_ + (float)local_700._0_4_;
            fStack_898 = fStack_9b8 + fStack_6f8;
            fStack_894 = fStack_9b4 + fStack_6f4;
            fStack_890 = fStack_9b0 + fStack_6f0;
            fStack_88c = fStack_9ac + fStack_6ec;
            fStack_888 = fStack_9a8 + fStack_6e8;
            fStack_884 = fStack_9a4 + fStack_6e4;
            do {
              auVar240 = auVar230._0_16_;
              auVar179._8_4_ = 0x7f800000;
              auVar179._0_8_ = 0x7f8000007f800000;
              auVar179._12_4_ = 0x7f800000;
              auVar179._16_4_ = 0x7f800000;
              auVar179._20_4_ = 0x7f800000;
              auVar179._24_4_ = 0x7f800000;
              auVar179._28_4_ = 0x7f800000;
              auVar127 = vblendvps_avx(auVar179,_local_700,auVar126);
              auVar28 = vshufps_avx(auVar127,auVar127,0xb1);
              auVar28 = vminps_avx(auVar127,auVar28);
              auVar29 = vshufpd_avx(auVar28,auVar28,5);
              auVar28 = vminps_avx(auVar28,auVar29);
              auVar29 = vperm2f128_avx(auVar28,auVar28,1);
              auVar28 = vminps_avx(auVar28,auVar29);
              auVar28 = vcmpps_avx(auVar127,auVar28,0);
              auVar29 = auVar126 & auVar28;
              auVar127 = auVar126;
              if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar29 >> 0x7f,0) != '\0') ||
                    (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar29 >> 0xbf,0) != '\0') ||
                  (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar29[0x1f] < '\0') {
                auVar127 = vandps_avx(auVar28,auVar126);
              }
              uVar103 = vmovmskps_avx(auVar127);
              uVar100 = 0;
              if (uVar103 != 0) {
                for (; (uVar103 >> uVar100 & 1) == 0; uVar100 = uVar100 + 1) {
                }
              }
              uVar104 = (ulong)uVar100;
              local_720 = auVar126;
              *(undefined4 *)(local_720 + uVar104 * 4) = 0;
              fVar290 = local_640[uVar104];
              uVar100 = *(uint *)(local_480 + uVar104 * 4);
              fVar109 = auVar156._0_4_;
              if ((float)local_a00._0_4_ < 0.0) {
                fVar109 = sqrtf((float)local_a00._0_4_);
                auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar240._8_4_ = 0x7fffffff;
                auVar240._0_8_ = 0x7fffffff7fffffff;
                auVar240._12_4_ = 0x7fffffff;
              }
              auVar374 = ZEXT464(uVar100);
              auVar22 = vminps_avx(_local_ae0,_local_b00);
              auVar161 = vmaxps_avx(_local_ae0,_local_b00);
              auVar23 = vminps_avx(_local_af0,_local_b10);
              auVar117 = vminps_avx(auVar22,auVar23);
              auVar22 = vmaxps_avx(_local_af0,_local_b10);
              auVar23 = vmaxps_avx(auVar161,auVar22);
              auVar161 = vandps_avx(auVar117,auVar240);
              auVar22 = vandps_avx(auVar23,auVar240);
              auVar161 = vmaxps_avx(auVar161,auVar22);
              auVar22 = vmovshdup_avx(auVar161);
              auVar22 = vmaxss_avx(auVar22,auVar161);
              auVar161 = vshufpd_avx(auVar161,auVar161,1);
              auVar161 = vmaxss_avx(auVar161,auVar22);
              local_aa0._0_4_ = auVar161._0_4_ * 1.9073486e-06;
              local_980._0_4_ = fVar109 * 1.9073486e-06;
              local_840._0_16_ = vshufps_avx(auVar23,auVar23,0xff);
              lVar102 = 4;
              do {
                fVar232 = 1.0 - fVar290;
                auVar161 = vshufps_avx(ZEXT416((uint)fVar290),ZEXT416((uint)fVar290),0);
                fVar109 = auVar161._0_4_;
                fVar110 = auVar161._4_4_;
                fVar215 = auVar161._8_4_;
                fVar231 = auVar161._12_4_;
                auVar161 = vshufps_avx(ZEXT416((uint)fVar232),ZEXT416((uint)fVar232),0);
                fVar233 = auVar161._0_4_;
                fVar235 = auVar161._4_4_;
                fVar252 = auVar161._8_4_;
                fVar254 = auVar161._12_4_;
                fVar256 = (float)local_af0._0_4_ * fVar109 + (float)local_b00._0_4_ * fVar233;
                fVar264 = (float)local_af0._4_4_ * fVar110 + (float)local_b00._4_4_ * fVar235;
                fVar281 = fStack_ae8 * fVar215 + fStack_af8 * fVar252;
                fVar283 = fStack_ae4 * fVar231 + fStack_af4 * fVar254;
                auVar267._0_4_ =
                     fVar233 * ((float)local_b00._0_4_ * fVar109 + fVar233 * (float)local_ae0._0_4_)
                     + fVar109 * fVar256;
                auVar267._4_4_ =
                     fVar235 * ((float)local_b00._4_4_ * fVar110 + fVar235 * (float)local_ae0._4_4_)
                     + fVar110 * fVar264;
                auVar267._8_4_ =
                     fVar252 * (fStack_af8 * fVar215 + fVar252 * fStack_ad8) + fVar215 * fVar281;
                auVar267._12_4_ =
                     fVar254 * (fStack_af4 * fVar231 + fVar254 * fStack_ad4) + fVar231 * fVar283;
                auVar219._0_4_ =
                     fVar233 * fVar256 +
                     fVar109 * (fVar109 * (float)local_b10._0_4_ + (float)local_af0._0_4_ * fVar233)
                ;
                auVar219._4_4_ =
                     fVar235 * fVar264 +
                     fVar110 * (fVar110 * (float)local_b10._4_4_ + (float)local_af0._4_4_ * fVar235)
                ;
                auVar219._8_4_ =
                     fVar252 * fVar281 + fVar215 * (fVar215 * fStack_b08 + fStack_ae8 * fVar252);
                auVar219._12_4_ =
                     fVar254 * fVar283 + fVar231 * (fVar231 * fStack_b04 + fStack_ae4 * fVar254);
                auVar161 = vshufps_avx(auVar374._0_16_,auVar374._0_16_,0);
                auVar157._0_4_ = auVar161._0_4_ * (float)local_9f0._0_4_ + 0.0;
                auVar157._4_4_ = auVar161._4_4_ * (float)local_9f0._4_4_ + 0.0;
                auVar157._8_4_ = auVar161._8_4_ * fStack_9e8 + 0.0;
                auVar157._12_4_ = auVar161._12_4_ * fStack_9e4 + 0.0;
                auVar116._0_4_ = fVar233 * auVar267._0_4_ + fVar109 * auVar219._0_4_;
                auVar116._4_4_ = fVar235 * auVar267._4_4_ + fVar110 * auVar219._4_4_;
                auVar116._8_4_ = fVar252 * auVar267._8_4_ + fVar215 * auVar219._8_4_;
                auVar116._12_4_ = fVar254 * auVar267._12_4_ + fVar231 * auVar219._12_4_;
                local_9a0._0_16_ = auVar116;
                auVar22 = vsubps_avx(auVar157,auVar116);
                auVar161 = vdpps_avx(auVar22,auVar22,0x7f);
                fVar109 = auVar161._0_4_;
                if (fVar109 < 0.0) {
                  fVar110 = sqrtf(fVar109);
                  auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar23 = vsqrtss_avx(auVar161,auVar161);
                  fVar110 = auVar23._0_4_;
                }
                auVar23 = vsubps_avx(auVar219,auVar267);
                auVar295._0_4_ = auVar23._0_4_ * 3.0;
                auVar295._4_4_ = auVar23._4_4_ * 3.0;
                auVar295._8_4_ = auVar23._8_4_ * 3.0;
                auVar295._12_4_ = auVar23._12_4_ * 3.0;
                auVar23 = vshufps_avx(ZEXT416((uint)(fVar290 * 6.0)),ZEXT416((uint)(fVar290 * 6.0)),
                                      0);
                auVar117 = ZEXT416((uint)((fVar232 - (fVar290 + fVar290)) * 6.0));
                auVar200 = vshufps_avx(auVar117,auVar117,0);
                auVar117 = ZEXT416((uint)((fVar290 - (fVar232 + fVar232)) * 6.0));
                auVar220 = vshufps_avx(auVar117,auVar117,0);
                auVar24 = vshufps_avx(ZEXT416((uint)(fVar232 * 6.0)),ZEXT416((uint)(fVar232 * 6.0)),
                                      0);
                auVar117 = vdpps_avx(auVar295,auVar295,0x7f);
                auVar158._0_4_ =
                     auVar24._0_4_ * (float)local_ae0._0_4_ +
                     auVar220._0_4_ * (float)local_b00._0_4_ +
                     auVar23._0_4_ * (float)local_b10._0_4_ +
                     auVar200._0_4_ * (float)local_af0._0_4_;
                auVar158._4_4_ =
                     auVar24._4_4_ * (float)local_ae0._4_4_ +
                     auVar220._4_4_ * (float)local_b00._4_4_ +
                     auVar23._4_4_ * (float)local_b10._4_4_ +
                     auVar200._4_4_ * (float)local_af0._4_4_;
                auVar158._8_4_ =
                     auVar24._8_4_ * fStack_ad8 +
                     auVar220._8_4_ * fStack_af8 +
                     auVar23._8_4_ * fStack_b08 + auVar200._8_4_ * fStack_ae8;
                auVar158._12_4_ =
                     auVar24._12_4_ * fStack_ad4 +
                     auVar220._12_4_ * fStack_af4 +
                     auVar23._12_4_ * fStack_b04 + auVar200._12_4_ * fStack_ae4;
                auVar23 = vblendps_avx(auVar117,_DAT_01feba10,0xe);
                auVar200 = vrsqrtss_avx(auVar23,auVar23);
                fVar231 = auVar200._0_4_;
                fVar215 = auVar117._0_4_;
                auVar200 = vdpps_avx(auVar295,auVar158,0x7f);
                auVar220 = vshufps_avx(auVar117,auVar117,0);
                auVar159._0_4_ = auVar158._0_4_ * auVar220._0_4_;
                auVar159._4_4_ = auVar158._4_4_ * auVar220._4_4_;
                auVar159._8_4_ = auVar158._8_4_ * auVar220._8_4_;
                auVar159._12_4_ = auVar158._12_4_ * auVar220._12_4_;
                auVar200 = vshufps_avx(auVar200,auVar200,0);
                auVar241._0_4_ = auVar295._0_4_ * auVar200._0_4_;
                auVar241._4_4_ = auVar295._4_4_ * auVar200._4_4_;
                auVar241._8_4_ = auVar295._8_4_ * auVar200._8_4_;
                auVar241._12_4_ = auVar295._12_4_ * auVar200._12_4_;
                auVar24 = vsubps_avx(auVar159,auVar241);
                auVar200 = vrcpss_avx(auVar23,auVar23);
                auVar23 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                     ZEXT416((uint)(auVar374._0_4_ * (float)local_980._0_4_)));
                auVar200 = ZEXT416((uint)(auVar200._0_4_ * (2.0 - fVar215 * auVar200._0_4_)));
                auVar200 = vshufps_avx(auVar200,auVar200,0);
                uVar104 = CONCAT44(auVar295._4_4_,auVar295._0_4_);
                auVar268._0_8_ = uVar104 ^ 0x8000000080000000;
                auVar268._8_4_ = -auVar295._8_4_;
                auVar268._12_4_ = -auVar295._12_4_;
                auVar220 = ZEXT416((uint)(fVar231 * 1.5 +
                                         fVar215 * -0.5 * fVar231 * fVar231 * fVar231));
                auVar220 = vshufps_avx(auVar220,auVar220,0);
                auVar221._0_4_ = auVar220._0_4_ * auVar24._0_4_ * auVar200._0_4_;
                auVar221._4_4_ = auVar220._4_4_ * auVar24._4_4_ * auVar200._4_4_;
                auVar221._8_4_ = auVar220._8_4_ * auVar24._8_4_ * auVar200._8_4_;
                auVar221._12_4_ = auVar220._12_4_ * auVar24._12_4_ * auVar200._12_4_;
                auVar345._0_4_ = auVar295._0_4_ * auVar220._0_4_;
                auVar345._4_4_ = auVar295._4_4_ * auVar220._4_4_;
                auVar345._8_4_ = auVar295._8_4_ * auVar220._8_4_;
                auVar345._12_4_ = auVar295._12_4_ * auVar220._12_4_;
                if (fVar215 < 0.0) {
                  local_a20._0_16_ = auVar268;
                  local_a40._0_16_ = auVar345;
                  local_a60._0_16_ = auVar221;
                  fVar215 = sqrtf(fVar215);
                  auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar221 = local_a60._0_16_;
                  auVar268 = local_a20._0_16_;
                  auVar345 = local_a40._0_16_;
                }
                else {
                  auVar117 = vsqrtss_avx(auVar117,auVar117);
                  fVar215 = auVar117._0_4_;
                }
                auVar117 = vdpps_avx(auVar22,auVar345,0x7f);
                fVar110 = ((float)local_aa0._0_4_ / fVar215) * (fVar110 + 1.0) +
                          auVar23._0_4_ + fVar110 * (float)local_aa0._0_4_;
                auVar200 = vdpps_avx(auVar268,auVar345,0x7f);
                auVar220 = vdpps_avx(auVar22,auVar221,0x7f);
                auVar24 = vdpps_avx(_local_9f0,auVar345,0x7f);
                auVar25 = vdpps_avx(auVar22,auVar268,0x7f);
                fVar215 = auVar200._0_4_ + auVar220._0_4_;
                fVar231 = auVar117._0_4_;
                auVar118._0_4_ = fVar231 * fVar231;
                auVar118._4_4_ = auVar117._4_4_ * auVar117._4_4_;
                auVar118._8_4_ = auVar117._8_4_ * auVar117._8_4_;
                auVar118._12_4_ = auVar117._12_4_ * auVar117._12_4_;
                auVar220 = vsubps_avx(auVar161,auVar118);
                auVar200 = vdpps_avx(auVar22,_local_9f0,0x7f);
                fVar232 = auVar25._0_4_ - fVar231 * fVar215;
                fVar233 = auVar200._0_4_ - fVar231 * auVar24._0_4_;
                auVar200 = vrsqrtss_avx(auVar220,auVar220);
                fVar235 = auVar220._0_4_;
                fVar231 = auVar200._0_4_;
                fVar231 = fVar231 * 1.5 + fVar235 * -0.5 * fVar231 * fVar231 * fVar231;
                if (fVar235 < 0.0) {
                  local_a20._0_4_ = fVar110;
                  local_a40._0_16_ = ZEXT416((uint)fVar215);
                  local_a60._0_16_ = auVar24;
                  local_7e0._0_4_ = fVar232;
                  local_800._0_4_ = fVar233;
                  local_820._0_4_ = fVar231;
                  fVar235 = sqrtf(fVar235);
                  auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar110 = (float)local_a20._0_4_;
                  fVar231 = (float)local_820._0_4_;
                  fVar232 = (float)local_7e0._0_4_;
                  fVar233 = (float)local_800._0_4_;
                  auVar24 = local_a60._0_16_;
                  auVar200 = local_a40._0_16_;
                }
                else {
                  auVar200 = vsqrtss_avx(auVar220,auVar220);
                  fVar235 = auVar200._0_4_;
                  auVar200 = ZEXT416((uint)fVar215);
                }
                auVar392 = ZEXT1664(auVar295);
                auVar160 = vpermilps_avx(local_9a0._0_16_,0xff);
                auVar26 = vshufps_avx(auVar295,auVar295,0xff);
                fVar215 = fVar232 * fVar231 - auVar26._0_4_;
                auVar242._0_8_ = auVar24._0_8_ ^ 0x8000000080000000;
                auVar242._8_4_ = auVar24._8_4_ ^ 0x80000000;
                auVar242._12_4_ = auVar24._12_4_ ^ 0x80000000;
                auVar269._0_4_ = -fVar215;
                auVar269._4_4_ = 0x80000000;
                auVar269._8_4_ = 0x80000000;
                auVar269._12_4_ = 0x80000000;
                fVar232 = auVar200._0_4_ * fVar233 * fVar231;
                auVar303 = ZEXT464((uint)fVar232);
                auVar220 = vinsertps_avx(ZEXT416((uint)(fVar233 * fVar231)),auVar242,0x10);
                auVar25 = vmovsldup_avx(ZEXT416((uint)(fVar232 - auVar24._0_4_ * fVar215)));
                auVar220 = vdivps_avx(auVar220,auVar25);
                auVar160 = ZEXT416((uint)(fVar235 - auVar160._0_4_));
                auVar24 = vinsertps_avx(auVar117,auVar160,0x10);
                auVar222._0_4_ = auVar24._0_4_ * auVar220._0_4_;
                auVar222._4_4_ = auVar24._4_4_ * auVar220._4_4_;
                auVar222._8_4_ = auVar24._8_4_ * auVar220._8_4_;
                auVar222._12_4_ = auVar24._12_4_ * auVar220._12_4_;
                auVar200 = vinsertps_avx(auVar269,auVar200,0x1c);
                auVar200 = vdivps_avx(auVar200,auVar25);
                auVar201._0_4_ = auVar24._0_4_ * auVar200._0_4_;
                auVar201._4_4_ = auVar24._4_4_ * auVar200._4_4_;
                auVar201._8_4_ = auVar24._8_4_ * auVar200._8_4_;
                auVar201._12_4_ = auVar24._12_4_ * auVar200._12_4_;
                auVar200 = vhaddps_avx(auVar222,auVar222);
                auVar220 = vhaddps_avx(auVar201,auVar201);
                fVar290 = fVar290 - auVar200._0_4_;
                fVar215 = auVar374._0_4_ - auVar220._0_4_;
                auVar374 = ZEXT464((uint)fVar215);
                auVar243._8_4_ = 0x7fffffff;
                auVar243._0_8_ = 0x7fffffff7fffffff;
                auVar243._12_4_ = 0x7fffffff;
                auVar230 = ZEXT1664(auVar243);
                auVar117 = vandps_avx(auVar117,auVar243);
                if (fVar110 <= auVar117._0_4_) {
LAB_0104437d:
                  bVar76 = false;
                }
                else {
                  auVar117 = vandps_avx(auVar160,auVar243);
                  if ((float)local_840._0_4_ * 1.9073486e-06 + auVar23._0_4_ + fVar110 <=
                      auVar117._0_4_) goto LAB_0104437d;
                  fVar215 = fVar215 + (float)local_940._0_4_;
                  auVar374 = ZEXT464((uint)fVar215);
                  bVar76 = true;
                  if ((((fVar150 <= fVar215) &&
                       (fVar110 = *(float *)(ray + k * 4 + 0x100), fVar215 <= fVar110)) &&
                      (0.0 <= fVar290)) && (fVar290 <= 1.0)) {
                    auVar161 = vrsqrtss_avx(auVar161,auVar161);
                    fVar231 = auVar161._0_4_;
                    pGVar12 = (context->scene->geometries).items[uVar98].ptr;
                    if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      auVar161 = ZEXT416((uint)(fVar231 * 1.5 +
                                               fVar109 * -0.5 * fVar231 * fVar231 * fVar231));
                      auVar161 = vshufps_avx(auVar161,auVar161,0);
                      local_ba0 = auVar22._0_4_;
                      fStack_b9c = auVar22._4_4_;
                      fStack_b98 = auVar22._8_4_;
                      fStack_b94 = auVar22._12_4_;
                      auVar162._0_4_ = auVar161._0_4_ * local_ba0;
                      auVar162._4_4_ = auVar161._4_4_ * fStack_b9c;
                      auVar162._8_4_ = auVar161._8_4_ * fStack_b98;
                      auVar162._12_4_ = auVar161._12_4_ * fStack_b94;
                      auVar119._0_4_ = auVar295._0_4_ + auVar26._0_4_ * auVar162._0_4_;
                      auVar119._4_4_ = auVar295._4_4_ + auVar26._4_4_ * auVar162._4_4_;
                      auVar119._8_4_ = auVar295._8_4_ + auVar26._8_4_ * auVar162._8_4_;
                      auVar119._12_4_ = auVar295._12_4_ + auVar26._12_4_ * auVar162._12_4_;
                      auVar161 = vshufps_avx(auVar162,auVar162,0xc9);
                      auVar22 = vshufps_avx(auVar295,auVar295,0xc9);
                      auVar163._0_4_ = auVar22._0_4_ * auVar162._0_4_;
                      auVar163._4_4_ = auVar22._4_4_ * auVar162._4_4_;
                      auVar163._8_4_ = auVar22._8_4_ * auVar162._8_4_;
                      auVar163._12_4_ = auVar22._12_4_ * auVar162._12_4_;
                      auVar202._0_4_ = auVar295._0_4_ * auVar161._0_4_;
                      auVar202._4_4_ = auVar295._4_4_ * auVar161._4_4_;
                      auVar202._8_4_ = auVar295._8_4_ * auVar161._8_4_;
                      auVar202._12_4_ = auVar295._12_4_ * auVar161._12_4_;
                      auVar23 = vsubps_avx(auVar202,auVar163);
                      auVar161 = vshufps_avx(auVar23,auVar23,0xc9);
                      auVar22 = vshufps_avx(auVar119,auVar119,0xc9);
                      auVar203._0_4_ = auVar22._0_4_ * auVar161._0_4_;
                      auVar203._4_4_ = auVar22._4_4_ * auVar161._4_4_;
                      auVar203._8_4_ = auVar22._8_4_ * auVar161._8_4_;
                      auVar203._12_4_ = auVar22._12_4_ * auVar161._12_4_;
                      auVar161 = vshufps_avx(auVar23,auVar23,0xd2);
                      auVar120._0_4_ = auVar119._0_4_ * auVar161._0_4_;
                      auVar120._4_4_ = auVar119._4_4_ * auVar161._4_4_;
                      auVar120._8_4_ = auVar119._8_4_ * auVar161._8_4_;
                      auVar120._12_4_ = auVar119._12_4_ * auVar161._12_4_;
                      auVar161 = vsubps_avx(auVar203,auVar120);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar215;
                        uVar9 = vextractps_avx(auVar161,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar9;
                        uVar9 = vextractps_avx(auVar161,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                        *(int *)(ray + k * 4 + 0x1c0) = auVar161._0_4_;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar290;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(int *)(ray + k * 4 + 0x220) = (int)local_a68;
                        *(uint *)(ray + k * 4 + 0x240) = uVar98;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar18 = context->user;
                        auStack_590 = vshufps_avx(ZEXT416((uint)fVar290),ZEXT416((uint)fVar290),0);
                        auStack_5f0 = vshufps_avx(auVar161,auVar161,0x55);
                        auStack_5d0 = vshufps_avx(auVar161,auVar161,0xaa);
                        auStack_5b0 = vshufps_avx(auVar161,auVar161,0);
                        local_600 = (RTCHitN  [16])auStack_5f0;
                        local_5e0 = auStack_5d0;
                        local_5c0 = auStack_5b0;
                        local_5a0 = auStack_590;
                        local_580 = ZEXT832(0) << 0x20;
                        local_560 = local_4e0._0_8_;
                        uStack_558 = local_4e0._8_8_;
                        uStack_550 = local_4e0._16_8_;
                        uStack_548 = local_4e0._24_8_;
                        local_540 = local_4c0._0_8_;
                        uStack_538 = local_4c0._8_8_;
                        uStack_530 = local_4c0._16_8_;
                        uStack_528 = local_4c0._24_8_;
                        local_a70[1] = local_9e0;
                        *local_a70 = local_9e0;
                        local_520 = pRVar18->instID[0];
                        uStack_51c = local_520;
                        uStack_518 = local_520;
                        uStack_514 = local_520;
                        uStack_510 = local_520;
                        uStack_50c = local_520;
                        uStack_508 = local_520;
                        uStack_504 = local_520;
                        local_500 = pRVar18->instPrimID[0];
                        uStack_4fc = local_500;
                        uStack_4f8 = local_500;
                        uStack_4f4 = local_500;
                        uStack_4f0 = local_500;
                        uStack_4ec = local_500;
                        uStack_4e8 = local_500;
                        uStack_4e4 = local_500;
                        *(float *)(ray + k * 4 + 0x100) = fVar215;
                        local_b40 = *local_a78;
                        uStack_b38 = local_a78[1];
                        local_b30 = *local_a80;
                        uStack_b28 = local_a80[1];
                        local_ad0.valid = (int *)&local_b40;
                        local_ad0.geometryUserPtr = pGVar12->userPtr;
                        local_ad0.context = context->user;
                        local_ad0.hit = local_600;
                        local_ad0.N = 8;
                        local_ad0.ray = (RTCRayN *)ray;
                        if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar303 = ZEXT464((uint)fVar232);
                          auVar392 = ZEXT1664(auVar295);
                          (*pGVar12->intersectionFilterN)(&local_ad0);
                        }
                        auVar86._8_8_ = uStack_b38;
                        auVar86._0_8_ = local_b40;
                        auVar161 = vpcmpeqd_avx((undefined1  [16])0x0,auVar86);
                        auVar90._8_8_ = uStack_b28;
                        auVar90._0_8_ = local_b30;
                        auVar22 = vpcmpeqd_avx((undefined1  [16])0x0,auVar90);
                        auVar133._16_16_ = auVar22;
                        auVar133._0_16_ = auVar161;
                        auVar126 = local_9e0 & ~auVar133;
                        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar126 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar126 >> 0x7f,0) == '\0')
                              && (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar126 >> 0xbf,0) == '\0') &&
                            (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar126[0x1f]) {
                          auVar134._0_4_ = auVar161._0_4_ ^ local_9e0._0_4_;
                          auVar134._4_4_ = auVar161._4_4_ ^ local_9e0._4_4_;
                          auVar134._8_4_ = auVar161._8_4_ ^ local_9e0._8_4_;
                          auVar134._12_4_ = auVar161._12_4_ ^ local_9e0._12_4_;
                          auVar134._16_4_ = auVar22._0_4_ ^ local_9e0._16_4_;
                          auVar134._20_4_ = auVar22._4_4_ ^ local_9e0._20_4_;
                          auVar134._24_4_ = auVar22._8_4_ ^ local_9e0._24_4_;
                          auVar134._28_4_ = auVar22._12_4_ ^ local_9e0._28_4_;
                          auVar230 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar327 = ZEXT864(0);
                        }
                        else {
                          p_Var17 = context->args->filter;
                          auVar230 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar327 = ZEXT1664(ZEXT816(0));
                          if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar303 = ZEXT1664(auVar303._0_16_);
                            auVar392 = ZEXT1664(auVar392._0_16_);
                            (*p_Var17)(&local_ad0);
                            auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar230 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar87._8_8_ = uStack_b38;
                          auVar87._0_8_ = local_b40;
                          auVar161 = vpcmpeqd_avx((undefined1  [16])0x0,auVar87);
                          auVar91._8_8_ = uStack_b28;
                          auVar91._0_8_ = local_b30;
                          auVar22 = vpcmpeqd_avx((undefined1  [16])0x0,auVar91);
                          auVar180._16_16_ = auVar22;
                          auVar180._0_16_ = auVar161;
                          auVar134._0_4_ = auVar161._0_4_ ^ local_9e0._0_4_;
                          auVar134._4_4_ = auVar161._4_4_ ^ local_9e0._4_4_;
                          auVar134._8_4_ = auVar161._8_4_ ^ local_9e0._8_4_;
                          auVar134._12_4_ = auVar161._12_4_ ^ local_9e0._12_4_;
                          auVar134._16_4_ = auVar22._0_4_ ^ local_9e0._16_4_;
                          auVar134._20_4_ = auVar22._4_4_ ^ local_9e0._20_4_;
                          auVar134._24_4_ = auVar22._8_4_ ^ local_9e0._24_4_;
                          auVar134._28_4_ = auVar22._12_4_ ^ local_9e0._28_4_;
                          auVar126 = local_9e0 & ~auVar180;
                          if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar126 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar126 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar126 >> 0x7f,0) != '\0') ||
                                (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar126 >> 0xbf,0) != '\0') ||
                              (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar126[0x1f] < '\0') {
                            auVar126 = vmaskmovps_avx(auVar134,*(undefined1 (*) [32])local_ad0.hit);
                            *(undefined1 (*) [32])(local_ad0.ray + 0x180) = auVar126;
                            auVar126 = vmaskmovps_avx(auVar134,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x20));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1a0) = auVar126;
                            auVar126 = vmaskmovps_avx(auVar134,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x40));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1c0) = auVar126;
                            auVar126 = vmaskmovps_avx(auVar134,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x60));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1e0) = auVar126;
                            auVar126 = vmaskmovps_avx(auVar134,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x80));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x200) = auVar126;
                            auVar126 = vmaskmovps_avx(auVar134,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xa0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x220) = auVar126;
                            auVar126 = vmaskmovps_avx(auVar134,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xc0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x240) = auVar126;
                            auVar126 = vmaskmovps_avx(auVar134,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xe0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x260) = auVar126;
                            auVar126 = vmaskmovps_avx(auVar134,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x100));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x280) = auVar126;
                          }
                        }
                        auVar374 = ZEXT464((uint)fVar215);
                        if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar134 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar134 >> 0x7f,0) == '\0')
                              && (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar134 >> 0xbf,0) == '\0') &&
                            (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar134[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar110;
                        }
                      }
                    }
                  }
                }
                bVar106 = lVar102 != 0;
                lVar102 = lVar102 + -1;
              } while ((!bVar76) && (bVar106));
              uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar135._4_4_ = uVar9;
              auVar135._0_4_ = uVar9;
              auVar135._8_4_ = uVar9;
              auVar135._12_4_ = uVar9;
              auVar135._16_4_ = uVar9;
              auVar135._20_4_ = uVar9;
              auVar135._24_4_ = uVar9;
              auVar135._28_4_ = uVar9;
              auVar127 = vcmpps_avx(_local_8a0,auVar135,2);
              auVar126 = vandps_avx(auVar127,local_720);
              auVar127 = local_720 & auVar127;
              uVar104 = local_760;
              local_720 = auVar126;
            } while ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar127 >> 0x7f,0) != '\0') ||
                       (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar127 >> 0xbf,0) != '\0') ||
                     (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar127[0x1f] < '\0');
          }
          auVar136._0_4_ =
               (float)local_8e0._0_4_ * (float)local_860._0_4_ +
               (float)local_900._0_4_ * (float)local_880._0_4_ +
               (float)local_920._0_4_ * (float)local_8c0._0_4_;
          auVar136._4_4_ =
               (float)local_8e0._4_4_ * (float)local_860._4_4_ +
               (float)local_900._4_4_ * (float)local_880._4_4_ +
               (float)local_920._4_4_ * (float)local_8c0._4_4_;
          auVar136._8_4_ =
               fStack_8d8 * fStack_858 + fStack_8f8 * fStack_878 + fStack_918 * fStack_8b8;
          auVar136._12_4_ =
               fStack_8d4 * fStack_854 + fStack_8f4 * fStack_874 + fStack_914 * fStack_8b4;
          auVar136._16_4_ =
               fStack_8d0 * fStack_850 + fStack_8f0 * fStack_870 + fStack_910 * fStack_8b0;
          auVar136._20_4_ =
               fStack_8cc * fStack_84c + fStack_8ec * fStack_86c + fStack_90c * fStack_8ac;
          auVar136._24_4_ =
               fStack_8c8 * fStack_848 + fStack_8e8 * fStack_868 + fStack_908 * fStack_8a8;
          auVar136._28_4_ = fStack_8c4 + fStack_8e4 + fStack_904;
          auVar181._8_4_ = 0x7fffffff;
          auVar181._0_8_ = 0x7fffffff7fffffff;
          auVar181._12_4_ = 0x7fffffff;
          auVar181._16_4_ = 0x7fffffff;
          auVar181._20_4_ = 0x7fffffff;
          auVar181._24_4_ = 0x7fffffff;
          auVar181._28_4_ = 0x7fffffff;
          auVar126 = vandps_avx(auVar136,auVar181);
          auVar182._8_4_ = 0x3e99999a;
          auVar182._0_8_ = 0x3e99999a3e99999a;
          auVar182._12_4_ = 0x3e99999a;
          auVar182._16_4_ = 0x3e99999a;
          auVar182._20_4_ = 0x3e99999a;
          auVar182._24_4_ = 0x3e99999a;
          auVar182._28_4_ = 0x3e99999a;
          auVar126 = vcmpps_avx(auVar126,auVar182,1);
          auVar127 = vorps_avx(auVar126,local_6e0);
          auVar183._0_4_ = (float)local_9c0._0_4_ + (float)local_680._0_4_;
          auVar183._4_4_ = (float)local_9c0._4_4_ + (float)local_680._4_4_;
          auVar183._8_4_ = fStack_9b8 + fStack_678;
          auVar183._12_4_ = fStack_9b4 + fStack_674;
          auVar183._16_4_ = fStack_9b0 + fStack_670;
          auVar183._20_4_ = fStack_9ac + fStack_66c;
          auVar183._24_4_ = fStack_9a8 + fStack_668;
          auVar183._28_4_ = fStack_9a4 + fStack_664;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar210._4_4_ = uVar9;
          auVar210._0_4_ = uVar9;
          auVar210._8_4_ = uVar9;
          auVar210._12_4_ = uVar9;
          auVar210._16_4_ = uVar9;
          auVar210._20_4_ = uVar9;
          auVar210._24_4_ = uVar9;
          auVar210._28_4_ = uVar9;
          auVar126 = vcmpps_avx(auVar183,auVar210,2);
          _local_900 = vandps_avx(auVar126,local_6a0);
          auVar184._8_4_ = 3;
          auVar184._0_8_ = 0x300000003;
          auVar184._12_4_ = 3;
          auVar184._16_4_ = 3;
          auVar184._20_4_ = 3;
          auVar184._24_4_ = 3;
          auVar184._28_4_ = 3;
          auVar211._8_4_ = 2;
          auVar211._0_8_ = 0x200000002;
          auVar211._12_4_ = 2;
          auVar211._16_4_ = 2;
          auVar211._20_4_ = 2;
          auVar211._24_4_ = 2;
          auVar211._28_4_ = 2;
          auVar126 = vblendvps_avx(auVar211,auVar184,auVar127);
          auVar161 = vpcmpgtd_avx(auVar126._16_16_,local_7c0);
          auVar22 = vpshufd_avx(local_6c0._0_16_,0);
          auVar22 = vpcmpgtd_avx(auVar126._0_16_,auVar22);
          auVar185._16_16_ = auVar161;
          auVar185._0_16_ = auVar22;
          _local_920 = vblendps_avx(ZEXT1632(auVar22),auVar185,0xf0);
          auVar126 = vandnps_avx(_local_920,_local_900);
          auVar127 = _local_900 & ~_local_920;
          fVar290 = (float)local_9c0._0_4_;
          fVar109 = (float)local_9c0._4_4_;
          fVar110 = fStack_9b8;
          fVar215 = fStack_9b4;
          fVar231 = fStack_9b0;
          fVar232 = fStack_9ac;
          fVar233 = fStack_9a8;
          fVar235 = fStack_9a4;
          if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar127 >> 0x7f,0) != '\0') ||
                (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar127 >> 0xbf,0) != '\0') ||
              (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar127[0x1f] < '\0') {
            _local_8a0 = _local_440;
            local_8e0._4_4_ = (float)local_9c0._4_4_ + (float)local_440._4_4_;
            local_8e0._0_4_ = (float)local_9c0._0_4_ + (float)local_440._0_4_;
            fStack_8d8 = fStack_9b8 + fStack_438;
            fStack_8d4 = fStack_9b4 + fStack_434;
            fStack_8d0 = fStack_9b0 + fStack_430;
            fStack_8cc = fStack_9ac + fStack_42c;
            fStack_8c8 = fStack_9a8 + fStack_428;
            fStack_8c4 = fStack_9a4 + fStack_424;
            do {
              auVar244 = auVar230._0_16_;
              auVar186._8_4_ = 0x7f800000;
              auVar186._0_8_ = 0x7f8000007f800000;
              auVar186._12_4_ = 0x7f800000;
              auVar186._16_4_ = 0x7f800000;
              auVar186._20_4_ = 0x7f800000;
              auVar186._24_4_ = 0x7f800000;
              auVar186._28_4_ = 0x7f800000;
              auVar127 = vblendvps_avx(auVar186,_local_8a0,auVar126);
              auVar28 = vshufps_avx(auVar127,auVar127,0xb1);
              auVar28 = vminps_avx(auVar127,auVar28);
              auVar29 = vshufpd_avx(auVar28,auVar28,5);
              auVar28 = vminps_avx(auVar28,auVar29);
              auVar29 = vperm2f128_avx(auVar28,auVar28,1);
              auVar28 = vminps_avx(auVar28,auVar29);
              auVar28 = vcmpps_avx(auVar127,auVar28,0);
              auVar29 = auVar126 & auVar28;
              auVar127 = auVar126;
              if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar29 >> 0x7f,0) != '\0') ||
                    (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar29 >> 0xbf,0) != '\0') ||
                  (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar29[0x1f] < '\0') {
                auVar127 = vandps_avx(auVar28,auVar126);
              }
              uVar103 = vmovmskps_avx(auVar127);
              uVar100 = 0;
              if (uVar103 != 0) {
                for (; (uVar103 >> uVar100 & 1) == 0; uVar100 = uVar100 + 1) {
                }
              }
              uVar104 = (ulong)uVar100;
              local_740 = auVar126;
              *(undefined4 *)(local_740 + uVar104 * 4) = 0;
              fVar290 = local_660[uVar104];
              uVar100 = *(uint *)(local_420 + uVar104 * 4);
              fVar109 = auVar19._0_4_;
              if ((float)local_a00._0_4_ < 0.0) {
                fVar109 = sqrtf((float)local_a00._0_4_);
                auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar244._8_4_ = 0x7fffffff;
                auVar244._0_8_ = 0x7fffffff7fffffff;
                auVar244._12_4_ = 0x7fffffff;
              }
              auVar374 = ZEXT464(uVar100);
              auVar22 = vminps_avx(_local_ae0,_local_b00);
              auVar161 = vmaxps_avx(_local_ae0,_local_b00);
              auVar23 = vminps_avx(_local_af0,_local_b10);
              auVar117 = vminps_avx(auVar22,auVar23);
              auVar22 = vmaxps_avx(_local_af0,_local_b10);
              auVar23 = vmaxps_avx(auVar161,auVar22);
              auVar161 = vandps_avx(auVar117,auVar244);
              auVar22 = vandps_avx(auVar23,auVar244);
              auVar161 = vmaxps_avx(auVar161,auVar22);
              auVar22 = vmovshdup_avx(auVar161);
              auVar22 = vmaxss_avx(auVar22,auVar161);
              auVar161 = vshufpd_avx(auVar161,auVar161,1);
              auVar161 = vmaxss_avx(auVar161,auVar22);
              local_aa0._0_4_ = auVar161._0_4_ * 1.9073486e-06;
              local_980._0_4_ = fVar109 * 1.9073486e-06;
              local_840._0_16_ = vshufps_avx(auVar23,auVar23,0xff);
              lVar102 = 4;
              do {
                fVar232 = 1.0 - fVar290;
                auVar161 = vshufps_avx(ZEXT416((uint)fVar290),ZEXT416((uint)fVar290),0);
                fVar109 = auVar161._0_4_;
                fVar110 = auVar161._4_4_;
                fVar215 = auVar161._8_4_;
                fVar231 = auVar161._12_4_;
                auVar161 = vshufps_avx(ZEXT416((uint)fVar232),ZEXT416((uint)fVar232),0);
                fVar233 = auVar161._0_4_;
                fVar235 = auVar161._4_4_;
                fVar252 = auVar161._8_4_;
                fVar254 = auVar161._12_4_;
                fVar256 = (float)local_af0._0_4_ * fVar109 + (float)local_b00._0_4_ * fVar233;
                fVar264 = (float)local_af0._4_4_ * fVar110 + (float)local_b00._4_4_ * fVar235;
                fVar281 = fStack_ae8 * fVar215 + fStack_af8 * fVar252;
                fVar283 = fStack_ae4 * fVar231 + fStack_af4 * fVar254;
                auVar270._0_4_ =
                     fVar233 * ((float)local_b00._0_4_ * fVar109 + fVar233 * (float)local_ae0._0_4_)
                     + fVar109 * fVar256;
                auVar270._4_4_ =
                     fVar235 * ((float)local_b00._4_4_ * fVar110 + fVar235 * (float)local_ae0._4_4_)
                     + fVar110 * fVar264;
                auVar270._8_4_ =
                     fVar252 * (fStack_af8 * fVar215 + fVar252 * fStack_ad8) + fVar215 * fVar281;
                auVar270._12_4_ =
                     fVar254 * (fStack_af4 * fVar231 + fVar254 * fStack_ad4) + fVar231 * fVar283;
                auVar223._0_4_ =
                     fVar233 * fVar256 +
                     fVar109 * (fVar109 * (float)local_b10._0_4_ + (float)local_af0._0_4_ * fVar233)
                ;
                auVar223._4_4_ =
                     fVar235 * fVar264 +
                     fVar110 * (fVar110 * (float)local_b10._4_4_ + (float)local_af0._4_4_ * fVar235)
                ;
                auVar223._8_4_ =
                     fVar252 * fVar281 + fVar215 * (fVar215 * fStack_b08 + fStack_ae8 * fVar252);
                auVar223._12_4_ =
                     fVar254 * fVar283 + fVar231 * (fVar231 * fStack_b04 + fStack_ae4 * fVar254);
                auVar161 = vshufps_avx(auVar374._0_16_,auVar374._0_16_,0);
                auVar164._0_4_ = auVar161._0_4_ * (float)local_9f0._0_4_ + 0.0;
                auVar164._4_4_ = auVar161._4_4_ * (float)local_9f0._4_4_ + 0.0;
                auVar164._8_4_ = auVar161._8_4_ * fStack_9e8 + 0.0;
                auVar164._12_4_ = auVar161._12_4_ * fStack_9e4 + 0.0;
                auVar121._0_4_ = fVar233 * auVar270._0_4_ + fVar109 * auVar223._0_4_;
                auVar121._4_4_ = fVar235 * auVar270._4_4_ + fVar110 * auVar223._4_4_;
                auVar121._8_4_ = fVar252 * auVar270._8_4_ + fVar215 * auVar223._8_4_;
                auVar121._12_4_ = fVar254 * auVar270._12_4_ + fVar231 * auVar223._12_4_;
                local_9a0._0_16_ = auVar121;
                auVar22 = vsubps_avx(auVar164,auVar121);
                auVar161 = vdpps_avx(auVar22,auVar22,0x7f);
                fVar109 = auVar161._0_4_;
                if (fVar109 < 0.0) {
                  fVar110 = sqrtf(fVar109);
                  auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar23 = vsqrtss_avx(auVar161,auVar161);
                  fVar110 = auVar23._0_4_;
                }
                auVar23 = vsubps_avx(auVar223,auVar270);
                auVar296._0_4_ = auVar23._0_4_ * 3.0;
                auVar296._4_4_ = auVar23._4_4_ * 3.0;
                auVar296._8_4_ = auVar23._8_4_ * 3.0;
                auVar296._12_4_ = auVar23._12_4_ * 3.0;
                auVar23 = vshufps_avx(ZEXT416((uint)(fVar290 * 6.0)),ZEXT416((uint)(fVar290 * 6.0)),
                                      0);
                auVar117 = ZEXT416((uint)((fVar232 - (fVar290 + fVar290)) * 6.0));
                auVar200 = vshufps_avx(auVar117,auVar117,0);
                auVar117 = ZEXT416((uint)((fVar290 - (fVar232 + fVar232)) * 6.0));
                auVar220 = vshufps_avx(auVar117,auVar117,0);
                auVar24 = vshufps_avx(ZEXT416((uint)(fVar232 * 6.0)),ZEXT416((uint)(fVar232 * 6.0)),
                                      0);
                auVar117 = vdpps_avx(auVar296,auVar296,0x7f);
                auVar165._0_4_ =
                     auVar24._0_4_ * (float)local_ae0._0_4_ +
                     auVar220._0_4_ * (float)local_b00._0_4_ +
                     auVar23._0_4_ * (float)local_b10._0_4_ +
                     auVar200._0_4_ * (float)local_af0._0_4_;
                auVar165._4_4_ =
                     auVar24._4_4_ * (float)local_ae0._4_4_ +
                     auVar220._4_4_ * (float)local_b00._4_4_ +
                     auVar23._4_4_ * (float)local_b10._4_4_ +
                     auVar200._4_4_ * (float)local_af0._4_4_;
                auVar165._8_4_ =
                     auVar24._8_4_ * fStack_ad8 +
                     auVar220._8_4_ * fStack_af8 +
                     auVar23._8_4_ * fStack_b08 + auVar200._8_4_ * fStack_ae8;
                auVar165._12_4_ =
                     auVar24._12_4_ * fStack_ad4 +
                     auVar220._12_4_ * fStack_af4 +
                     auVar23._12_4_ * fStack_b04 + auVar200._12_4_ * fStack_ae4;
                auVar23 = vblendps_avx(auVar117,_DAT_01feba10,0xe);
                auVar200 = vrsqrtss_avx(auVar23,auVar23);
                fVar231 = auVar200._0_4_;
                fVar215 = auVar117._0_4_;
                auVar200 = vdpps_avx(auVar296,auVar165,0x7f);
                auVar220 = vshufps_avx(auVar117,auVar117,0);
                auVar166._0_4_ = auVar165._0_4_ * auVar220._0_4_;
                auVar166._4_4_ = auVar165._4_4_ * auVar220._4_4_;
                auVar166._8_4_ = auVar165._8_4_ * auVar220._8_4_;
                auVar166._12_4_ = auVar165._12_4_ * auVar220._12_4_;
                auVar200 = vshufps_avx(auVar200,auVar200,0);
                auVar245._0_4_ = auVar296._0_4_ * auVar200._0_4_;
                auVar245._4_4_ = auVar296._4_4_ * auVar200._4_4_;
                auVar245._8_4_ = auVar296._8_4_ * auVar200._8_4_;
                auVar245._12_4_ = auVar296._12_4_ * auVar200._12_4_;
                auVar24 = vsubps_avx(auVar166,auVar245);
                auVar200 = vrcpss_avx(auVar23,auVar23);
                auVar23 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                     ZEXT416((uint)(auVar374._0_4_ * (float)local_980._0_4_)));
                auVar200 = ZEXT416((uint)(auVar200._0_4_ * (2.0 - fVar215 * auVar200._0_4_)));
                auVar200 = vshufps_avx(auVar200,auVar200,0);
                uVar104 = CONCAT44(auVar296._4_4_,auVar296._0_4_);
                auVar271._0_8_ = uVar104 ^ 0x8000000080000000;
                auVar271._8_4_ = -auVar296._8_4_;
                auVar271._12_4_ = -auVar296._12_4_;
                auVar220 = ZEXT416((uint)(fVar231 * 1.5 +
                                         fVar215 * -0.5 * fVar231 * fVar231 * fVar231));
                auVar220 = vshufps_avx(auVar220,auVar220,0);
                auVar224._0_4_ = auVar220._0_4_ * auVar24._0_4_ * auVar200._0_4_;
                auVar224._4_4_ = auVar220._4_4_ * auVar24._4_4_ * auVar200._4_4_;
                auVar224._8_4_ = auVar220._8_4_ * auVar24._8_4_ * auVar200._8_4_;
                auVar224._12_4_ = auVar220._12_4_ * auVar24._12_4_ * auVar200._12_4_;
                auVar346._0_4_ = auVar296._0_4_ * auVar220._0_4_;
                auVar346._4_4_ = auVar296._4_4_ * auVar220._4_4_;
                auVar346._8_4_ = auVar296._8_4_ * auVar220._8_4_;
                auVar346._12_4_ = auVar296._12_4_ * auVar220._12_4_;
                if (fVar215 < 0.0) {
                  local_a20._0_16_ = auVar271;
                  local_a40._0_16_ = auVar346;
                  local_a60._0_16_ = auVar224;
                  fVar215 = sqrtf(fVar215);
                  auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar224 = local_a60._0_16_;
                  auVar271 = local_a20._0_16_;
                  auVar346 = local_a40._0_16_;
                }
                else {
                  auVar117 = vsqrtss_avx(auVar117,auVar117);
                  fVar215 = auVar117._0_4_;
                }
                auVar117 = vdpps_avx(auVar22,auVar346,0x7f);
                fVar110 = ((float)local_aa0._0_4_ / fVar215) * (fVar110 + 1.0) +
                          auVar23._0_4_ + fVar110 * (float)local_aa0._0_4_;
                auVar200 = vdpps_avx(auVar271,auVar346,0x7f);
                auVar220 = vdpps_avx(auVar22,auVar224,0x7f);
                auVar24 = vdpps_avx(_local_9f0,auVar346,0x7f);
                auVar25 = vdpps_avx(auVar22,auVar271,0x7f);
                fVar215 = auVar200._0_4_ + auVar220._0_4_;
                fVar231 = auVar117._0_4_;
                auVar122._0_4_ = fVar231 * fVar231;
                auVar122._4_4_ = auVar117._4_4_ * auVar117._4_4_;
                auVar122._8_4_ = auVar117._8_4_ * auVar117._8_4_;
                auVar122._12_4_ = auVar117._12_4_ * auVar117._12_4_;
                auVar220 = vsubps_avx(auVar161,auVar122);
                auVar200 = vdpps_avx(auVar22,_local_9f0,0x7f);
                fVar232 = auVar25._0_4_ - fVar231 * fVar215;
                fVar233 = auVar200._0_4_ - fVar231 * auVar24._0_4_;
                auVar200 = vrsqrtss_avx(auVar220,auVar220);
                fVar235 = auVar220._0_4_;
                fVar231 = auVar200._0_4_;
                fVar231 = fVar231 * 1.5 + fVar235 * -0.5 * fVar231 * fVar231 * fVar231;
                if (fVar235 < 0.0) {
                  local_a20._0_4_ = fVar110;
                  local_a40._0_16_ = ZEXT416((uint)fVar215);
                  local_a60._0_16_ = auVar24;
                  local_7e0._0_4_ = fVar232;
                  local_800._0_4_ = fVar233;
                  local_820._0_4_ = fVar231;
                  fVar235 = sqrtf(fVar235);
                  auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar110 = (float)local_a20._0_4_;
                  fVar231 = (float)local_820._0_4_;
                  fVar232 = (float)local_7e0._0_4_;
                  fVar233 = (float)local_800._0_4_;
                  auVar24 = local_a60._0_16_;
                  auVar200 = local_a40._0_16_;
                }
                else {
                  auVar200 = vsqrtss_avx(auVar220,auVar220);
                  fVar235 = auVar200._0_4_;
                  auVar200 = ZEXT416((uint)fVar215);
                }
                auVar392 = ZEXT1664(auVar296);
                auVar160 = vpermilps_avx(local_9a0._0_16_,0xff);
                auVar26 = vshufps_avx(auVar296,auVar296,0xff);
                fVar215 = fVar232 * fVar231 - auVar26._0_4_;
                auVar246._0_8_ = auVar24._0_8_ ^ 0x8000000080000000;
                auVar246._8_4_ = auVar24._8_4_ ^ 0x80000000;
                auVar246._12_4_ = auVar24._12_4_ ^ 0x80000000;
                auVar272._0_4_ = -fVar215;
                auVar272._4_4_ = 0x80000000;
                auVar272._8_4_ = 0x80000000;
                auVar272._12_4_ = 0x80000000;
                fVar232 = auVar200._0_4_ * fVar233 * fVar231;
                auVar303 = ZEXT464((uint)fVar232);
                auVar220 = vinsertps_avx(ZEXT416((uint)(fVar233 * fVar231)),auVar246,0x10);
                auVar25 = vmovsldup_avx(ZEXT416((uint)(fVar232 - auVar24._0_4_ * fVar215)));
                auVar220 = vdivps_avx(auVar220,auVar25);
                auVar160 = ZEXT416((uint)(fVar235 - auVar160._0_4_));
                auVar24 = vinsertps_avx(auVar117,auVar160,0x10);
                auVar225._0_4_ = auVar24._0_4_ * auVar220._0_4_;
                auVar225._4_4_ = auVar24._4_4_ * auVar220._4_4_;
                auVar225._8_4_ = auVar24._8_4_ * auVar220._8_4_;
                auVar225._12_4_ = auVar24._12_4_ * auVar220._12_4_;
                auVar200 = vinsertps_avx(auVar272,auVar200,0x1c);
                auVar200 = vdivps_avx(auVar200,auVar25);
                auVar204._0_4_ = auVar24._0_4_ * auVar200._0_4_;
                auVar204._4_4_ = auVar24._4_4_ * auVar200._4_4_;
                auVar204._8_4_ = auVar24._8_4_ * auVar200._8_4_;
                auVar204._12_4_ = auVar24._12_4_ * auVar200._12_4_;
                auVar200 = vhaddps_avx(auVar225,auVar225);
                auVar220 = vhaddps_avx(auVar204,auVar204);
                fVar290 = fVar290 - auVar200._0_4_;
                fVar215 = auVar374._0_4_ - auVar220._0_4_;
                auVar374 = ZEXT464((uint)fVar215);
                auVar247._8_4_ = 0x7fffffff;
                auVar247._0_8_ = 0x7fffffff7fffffff;
                auVar247._12_4_ = 0x7fffffff;
                auVar230 = ZEXT1664(auVar247);
                auVar117 = vandps_avx(auVar117,auVar247);
                if (fVar110 <= auVar117._0_4_) {
LAB_01044fc3:
                  bVar76 = false;
                }
                else {
                  auVar117 = vandps_avx(auVar160,auVar247);
                  if ((float)local_840._0_4_ * 1.9073486e-06 + auVar23._0_4_ + fVar110 <=
                      auVar117._0_4_) goto LAB_01044fc3;
                  fVar215 = fVar215 + (float)local_940._0_4_;
                  auVar374 = ZEXT464((uint)fVar215);
                  bVar76 = true;
                  if ((((fVar150 <= fVar215) &&
                       (fVar110 = *(float *)(ray + k * 4 + 0x100), fVar215 <= fVar110)) &&
                      (0.0 <= fVar290)) && (fVar290 <= 1.0)) {
                    auVar161 = vrsqrtss_avx(auVar161,auVar161);
                    fVar231 = auVar161._0_4_;
                    pGVar12 = (context->scene->geometries).items[uVar98].ptr;
                    if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      auVar161 = ZEXT416((uint)(fVar231 * 1.5 +
                                               fVar109 * -0.5 * fVar231 * fVar231 * fVar231));
                      auVar161 = vshufps_avx(auVar161,auVar161,0);
                      local_ba0 = auVar22._0_4_;
                      fStack_b9c = auVar22._4_4_;
                      fStack_b98 = auVar22._8_4_;
                      fStack_b94 = auVar22._12_4_;
                      auVar167._0_4_ = auVar161._0_4_ * local_ba0;
                      auVar167._4_4_ = auVar161._4_4_ * fStack_b9c;
                      auVar167._8_4_ = auVar161._8_4_ * fStack_b98;
                      auVar167._12_4_ = auVar161._12_4_ * fStack_b94;
                      auVar123._0_4_ = auVar296._0_4_ + auVar26._0_4_ * auVar167._0_4_;
                      auVar123._4_4_ = auVar296._4_4_ + auVar26._4_4_ * auVar167._4_4_;
                      auVar123._8_4_ = auVar296._8_4_ + auVar26._8_4_ * auVar167._8_4_;
                      auVar123._12_4_ = auVar296._12_4_ + auVar26._12_4_ * auVar167._12_4_;
                      auVar161 = vshufps_avx(auVar167,auVar167,0xc9);
                      auVar22 = vshufps_avx(auVar296,auVar296,0xc9);
                      auVar168._0_4_ = auVar22._0_4_ * auVar167._0_4_;
                      auVar168._4_4_ = auVar22._4_4_ * auVar167._4_4_;
                      auVar168._8_4_ = auVar22._8_4_ * auVar167._8_4_;
                      auVar168._12_4_ = auVar22._12_4_ * auVar167._12_4_;
                      auVar205._0_4_ = auVar296._0_4_ * auVar161._0_4_;
                      auVar205._4_4_ = auVar296._4_4_ * auVar161._4_4_;
                      auVar205._8_4_ = auVar296._8_4_ * auVar161._8_4_;
                      auVar205._12_4_ = auVar296._12_4_ * auVar161._12_4_;
                      auVar23 = vsubps_avx(auVar205,auVar168);
                      auVar161 = vshufps_avx(auVar23,auVar23,0xc9);
                      auVar22 = vshufps_avx(auVar123,auVar123,0xc9);
                      auVar206._0_4_ = auVar22._0_4_ * auVar161._0_4_;
                      auVar206._4_4_ = auVar22._4_4_ * auVar161._4_4_;
                      auVar206._8_4_ = auVar22._8_4_ * auVar161._8_4_;
                      auVar206._12_4_ = auVar22._12_4_ * auVar161._12_4_;
                      auVar161 = vshufps_avx(auVar23,auVar23,0xd2);
                      auVar124._0_4_ = auVar123._0_4_ * auVar161._0_4_;
                      auVar124._4_4_ = auVar123._4_4_ * auVar161._4_4_;
                      auVar124._8_4_ = auVar123._8_4_ * auVar161._8_4_;
                      auVar124._12_4_ = auVar123._12_4_ * auVar161._12_4_;
                      auVar161 = vsubps_avx(auVar206,auVar124);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar215;
                        uVar9 = vextractps_avx(auVar161,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar9;
                        uVar9 = vextractps_avx(auVar161,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                        *(int *)(ray + k * 4 + 0x1c0) = auVar161._0_4_;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar290;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(int *)(ray + k * 4 + 0x220) = (int)local_a68;
                        *(uint *)(ray + k * 4 + 0x240) = uVar98;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar18 = context->user;
                        auStack_590 = vshufps_avx(ZEXT416((uint)fVar290),ZEXT416((uint)fVar290),0);
                        auStack_5f0 = vshufps_avx(auVar161,auVar161,0x55);
                        auStack_5d0 = vshufps_avx(auVar161,auVar161,0xaa);
                        auStack_5b0 = vshufps_avx(auVar161,auVar161,0);
                        local_600 = (RTCHitN  [16])auStack_5f0;
                        local_5e0 = auStack_5d0;
                        local_5c0 = auStack_5b0;
                        local_5a0 = auStack_590;
                        local_580 = ZEXT832(0) << 0x20;
                        local_560 = local_4e0._0_8_;
                        uStack_558 = local_4e0._8_8_;
                        uStack_550 = local_4e0._16_8_;
                        uStack_548 = local_4e0._24_8_;
                        local_540 = local_4c0._0_8_;
                        uStack_538 = local_4c0._8_8_;
                        uStack_530 = local_4c0._16_8_;
                        uStack_528 = local_4c0._24_8_;
                        local_a70[1] = local_9e0;
                        *local_a70 = local_9e0;
                        local_520 = pRVar18->instID[0];
                        uStack_51c = local_520;
                        uStack_518 = local_520;
                        uStack_514 = local_520;
                        uStack_510 = local_520;
                        uStack_50c = local_520;
                        uStack_508 = local_520;
                        uStack_504 = local_520;
                        local_500 = pRVar18->instPrimID[0];
                        uStack_4fc = local_500;
                        uStack_4f8 = local_500;
                        uStack_4f4 = local_500;
                        uStack_4f0 = local_500;
                        uStack_4ec = local_500;
                        uStack_4e8 = local_500;
                        uStack_4e4 = local_500;
                        *(float *)(ray + k * 4 + 0x100) = fVar215;
                        local_b40 = *local_a78;
                        uStack_b38 = local_a78[1];
                        local_b30 = *local_a80;
                        uStack_b28 = local_a80[1];
                        local_ad0.valid = (int *)&local_b40;
                        local_ad0.geometryUserPtr = pGVar12->userPtr;
                        local_ad0.context = context->user;
                        local_ad0.hit = local_600;
                        local_ad0.N = 8;
                        local_ad0.ray = (RTCRayN *)ray;
                        if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar303 = ZEXT464((uint)fVar232);
                          auVar392 = ZEXT1664(auVar296);
                          (*pGVar12->intersectionFilterN)(&local_ad0);
                        }
                        auVar88._8_8_ = uStack_b38;
                        auVar88._0_8_ = local_b40;
                        auVar161 = vpcmpeqd_avx((undefined1  [16])0x0,auVar88);
                        auVar92._8_8_ = uStack_b28;
                        auVar92._0_8_ = local_b30;
                        auVar22 = vpcmpeqd_avx((undefined1  [16])0x0,auVar92);
                        auVar137._16_16_ = auVar22;
                        auVar137._0_16_ = auVar161;
                        auVar126 = local_9e0 & ~auVar137;
                        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar126 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar126 >> 0x7f,0) == '\0')
                              && (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar126 >> 0xbf,0) == '\0') &&
                            (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar126[0x1f]) {
                          auVar138._0_4_ = auVar161._0_4_ ^ local_9e0._0_4_;
                          auVar138._4_4_ = auVar161._4_4_ ^ local_9e0._4_4_;
                          auVar138._8_4_ = auVar161._8_4_ ^ local_9e0._8_4_;
                          auVar138._12_4_ = auVar161._12_4_ ^ local_9e0._12_4_;
                          auVar138._16_4_ = auVar22._0_4_ ^ local_9e0._16_4_;
                          auVar138._20_4_ = auVar22._4_4_ ^ local_9e0._20_4_;
                          auVar138._24_4_ = auVar22._8_4_ ^ local_9e0._24_4_;
                          auVar138._28_4_ = auVar22._12_4_ ^ local_9e0._28_4_;
                          auVar230 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar327 = ZEXT864(0);
                        }
                        else {
                          p_Var17 = context->args->filter;
                          auVar230 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar327 = ZEXT1664(ZEXT816(0));
                          if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar303 = ZEXT1664(auVar303._0_16_);
                            auVar392 = ZEXT1664(auVar392._0_16_);
                            (*p_Var17)(&local_ad0);
                            auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar230 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar89._8_8_ = uStack_b38;
                          auVar89._0_8_ = local_b40;
                          auVar161 = vpcmpeqd_avx((undefined1  [16])0x0,auVar89);
                          auVar93._8_8_ = uStack_b28;
                          auVar93._0_8_ = local_b30;
                          auVar22 = vpcmpeqd_avx((undefined1  [16])0x0,auVar93);
                          auVar187._16_16_ = auVar22;
                          auVar187._0_16_ = auVar161;
                          auVar138._0_4_ = auVar161._0_4_ ^ local_9e0._0_4_;
                          auVar138._4_4_ = auVar161._4_4_ ^ local_9e0._4_4_;
                          auVar138._8_4_ = auVar161._8_4_ ^ local_9e0._8_4_;
                          auVar138._12_4_ = auVar161._12_4_ ^ local_9e0._12_4_;
                          auVar138._16_4_ = auVar22._0_4_ ^ local_9e0._16_4_;
                          auVar138._20_4_ = auVar22._4_4_ ^ local_9e0._20_4_;
                          auVar138._24_4_ = auVar22._8_4_ ^ local_9e0._24_4_;
                          auVar138._28_4_ = auVar22._12_4_ ^ local_9e0._28_4_;
                          auVar126 = local_9e0 & ~auVar187;
                          if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar126 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar126 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar126 >> 0x7f,0) != '\0') ||
                                (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar126 >> 0xbf,0) != '\0') ||
                              (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar126[0x1f] < '\0') {
                            auVar126 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])local_ad0.hit);
                            *(undefined1 (*) [32])(local_ad0.ray + 0x180) = auVar126;
                            auVar126 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x20));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1a0) = auVar126;
                            auVar126 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x40));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1c0) = auVar126;
                            auVar126 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x60));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1e0) = auVar126;
                            auVar126 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x80));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x200) = auVar126;
                            auVar126 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xa0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x220) = auVar126;
                            auVar126 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xc0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x240) = auVar126;
                            auVar126 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xe0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x260) = auVar126;
                            auVar126 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x100));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x280) = auVar126;
                          }
                        }
                        auVar374 = ZEXT464((uint)fVar215);
                        if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar138 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar138 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar138 >> 0x7f,0) == '\0')
                              && (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar138 >> 0xbf,0) == '\0') &&
                            (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar138[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar110;
                        }
                      }
                    }
                  }
                }
                bVar106 = lVar102 != 0;
                lVar102 = lVar102 + -1;
              } while ((!bVar76) && (bVar106));
              uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar139._4_4_ = uVar9;
              auVar139._0_4_ = uVar9;
              auVar139._8_4_ = uVar9;
              auVar139._12_4_ = uVar9;
              auVar139._16_4_ = uVar9;
              auVar139._20_4_ = uVar9;
              auVar139._24_4_ = uVar9;
              auVar139._28_4_ = uVar9;
              auVar127 = vcmpps_avx(_local_8e0,auVar139,2);
              auVar126 = vandps_avx(auVar127,local_740);
              local_740 = local_740 & auVar127;
              uVar104 = local_760;
              fVar290 = (float)local_9c0._0_4_;
              fVar109 = (float)local_9c0._4_4_;
              fVar110 = fStack_9b8;
              fVar215 = fStack_9b4;
              fVar231 = fStack_9b0;
              fVar232 = fStack_9ac;
              fVar233 = fStack_9a8;
              fVar235 = fStack_9a4;
            } while ((((((((local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_740 >> 0x7f,0) != '\0') ||
                       (local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_740 >> 0xbf,0) != '\0') ||
                     (local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_740[0x1f] < '\0');
          }
          auVar126 = vandps_avx(local_7a0,local_780);
          auVar127 = vandps_avx(_local_920,_local_900);
          auVar212._0_4_ = fVar290 + local_480._0_4_;
          auVar212._4_4_ = fVar109 + local_480._4_4_;
          auVar212._8_4_ = fVar110 + local_480._8_4_;
          auVar212._12_4_ = fVar215 + local_480._12_4_;
          auVar212._16_4_ = fVar231 + local_480._16_4_;
          auVar212._20_4_ = fVar232 + local_480._20_4_;
          auVar212._24_4_ = fVar233 + local_480._24_4_;
          auVar212._28_4_ = fVar235 + local_480._28_4_;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar251._4_4_ = uVar9;
          auVar251._0_4_ = uVar9;
          auVar251._8_4_ = uVar9;
          auVar251._12_4_ = uVar9;
          auVar251._16_4_ = uVar9;
          auVar251._20_4_ = uVar9;
          auVar251._24_4_ = uVar9;
          auVar251._28_4_ = uVar9;
          auVar28 = vcmpps_avx(auVar212,auVar251,2);
          auVar126 = vandps_avx(auVar28,auVar126);
          auVar279._0_4_ = fVar290 + local_440._0_4_;
          auVar279._4_4_ = fVar109 + local_440._4_4_;
          auVar279._8_4_ = fVar110 + local_440._8_4_;
          auVar279._12_4_ = fVar215 + local_440._12_4_;
          auVar279._16_4_ = fVar231 + local_440._16_4_;
          auVar279._20_4_ = fVar232 + local_440._20_4_;
          auVar279._24_4_ = fVar233 + local_440._24_4_;
          auVar279._28_4_ = fVar235 + local_440._28_4_;
          auVar28 = vcmpps_avx(auVar279,auVar251,2);
          auVar127 = vandps_avx(auVar28,auVar127);
          auVar127 = vorps_avx(auVar126,auVar127);
          if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar127 >> 0x7f,0) != '\0') ||
                (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar127 >> 0xbf,0) != '\0') ||
              (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar127[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar99 * 0x60) = auVar127;
            auVar126 = vblendvps_avx(_local_440,_local_480,auVar126);
            *(undefined1 (*) [32])(auStack_160 + uVar99 * 0x60) = auVar126;
            auVar95._8_8_ = uStack_948;
            auVar95._0_8_ = local_950;
            uVar10 = vmovlps_avx(auVar95);
            *(undefined8 *)(afStack_140 + uVar99 * 0x18) = uVar10;
            auStack_138[uVar99 * 0x18] = (int)uVar104 + 1;
            uVar99 = (ulong)((int)uVar99 + 1);
          }
          goto LAB_010439a3;
        }
      }
      auVar303 = ZEXT3264(auVar169);
      auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
    }
LAB_010439a3:
    do {
      if ((int)uVar99 == 0) {
        uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar125._4_4_ = uVar9;
        auVar125._0_4_ = uVar9;
        auVar125._8_4_ = uVar9;
        auVar125._12_4_ = uVar9;
        auVar156 = vcmpps_avx(local_610,auVar125,2);
        uVar98 = vmovmskps_avx(auVar156);
        uVar98 = (uint)local_928 - 1 & (uint)local_928 & uVar98;
        if (uVar98 == 0) {
          return;
        }
        goto LAB_01042814;
      }
      uVar105 = (ulong)((int)uVar99 - 1);
      lVar102 = uVar105 * 0x60;
      auVar126 = *(undefined1 (*) [32])(auStack_160 + lVar102);
      auVar131._0_4_ = local_9c0._0_4_ + auVar126._0_4_;
      auVar131._4_4_ = local_9c0._4_4_ + auVar126._4_4_;
      auVar131._8_4_ = local_9c0._8_4_ + auVar126._8_4_;
      auVar131._12_4_ = local_9c0._12_4_ + auVar126._12_4_;
      auVar131._16_4_ = local_9c0._16_4_ + auVar126._16_4_;
      auVar131._20_4_ = local_9c0._20_4_ + auVar126._20_4_;
      auVar131._24_4_ = local_9c0._24_4_ + auVar126._24_4_;
      auVar131._28_4_ = local_9c0._28_4_ + auVar126._28_4_;
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar229._4_4_ = uVar9;
      auVar229._0_4_ = uVar9;
      auVar229._8_4_ = uVar9;
      auVar229._12_4_ = uVar9;
      auVar229._16_4_ = uVar9;
      auVar229._20_4_ = uVar9;
      auVar229._24_4_ = uVar9;
      auVar229._28_4_ = uVar9;
      auVar28 = vcmpps_avx(auVar131,auVar229,2);
      auVar127 = vandps_avx(auVar28,*(undefined1 (*) [32])(auStack_180 + lVar102));
      _local_600 = auVar127;
      auVar29 = *(undefined1 (*) [32])(auStack_180 + lVar102) & auVar28;
      bVar82 = (auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar83 = (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar81 = (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar80 = SUB321(auVar29 >> 0x7f,0) == '\0';
      bVar79 = (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar78 = SUB321(auVar29 >> 0xbf,0) == '\0';
      bVar106 = (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar76 = -1 < auVar29[0x1f];
      if (((((((!bVar82 || !bVar83) || !bVar81) || !bVar80) || !bVar79) || !bVar78) || !bVar106) ||
          !bVar76) {
        auVar208._8_4_ = 0x7f800000;
        auVar208._0_8_ = 0x7f8000007f800000;
        auVar208._12_4_ = 0x7f800000;
        auVar208._16_4_ = 0x7f800000;
        auVar208._20_4_ = 0x7f800000;
        auVar208._24_4_ = 0x7f800000;
        auVar208._28_4_ = 0x7f800000;
        auVar126 = vblendvps_avx(auVar208,auVar126,auVar127);
        auVar28 = vshufps_avx(auVar126,auVar126,0xb1);
        auVar28 = vminps_avx(auVar126,auVar28);
        auVar29 = vshufpd_avx(auVar28,auVar28,5);
        auVar29 = vminps_avx(auVar28,auVar29);
        auVar28 = vperm2f128_avx(auVar29,auVar29,1);
        auVar29 = vminps_avx(auVar29,auVar28);
        auVar126 = vcmpps_avx(auVar126,auVar29,0);
        auVar29 = auVar127 & auVar126;
        if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar29 >> 0x7f,0) != '\0') ||
              (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar29 >> 0xbf,0) != '\0') ||
            (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar29[0x1f] < '\0') {
          auVar127 = vandps_avx(auVar126,auVar127);
        }
        fVar290 = afStack_140[uVar105 * 0x18 + 1];
        uVar104 = (ulong)auStack_138[uVar105 * 0x18];
        uVar103 = vmovmskps_avx(auVar127);
        uVar100 = 0;
        if (uVar103 != 0) {
          for (; (uVar103 >> uVar100 & 1) == 0; uVar100 = uVar100 + 1) {
          }
        }
        fVar109 = afStack_140[uVar105 * 0x18];
        *(undefined4 *)(local_600 + (ulong)uVar100 * 4) = 0;
        if ((((((((_local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_600 >> 0x7f,0) != '\0') ||
              (_local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_600 >> 0xbf,0) != '\0') ||
            (_local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_600[0x1f] < '\0') {
          uVar105 = uVar99;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar102) = _local_600;
        auVar161 = vshufps_avx(ZEXT416((uint)(fVar290 - fVar109)),ZEXT416((uint)(fVar290 - fVar109))
                               ,0);
        local_480._4_4_ = fVar109 + auVar161._4_4_ * 0.14285715;
        local_480._0_4_ = fVar109 + auVar161._0_4_ * 0.0;
        fStack_478 = fVar109 + auVar161._8_4_ * 0.2857143;
        fStack_474 = fVar109 + auVar161._12_4_ * 0.42857146;
        fStack_470 = fVar109 + auVar161._0_4_ * 0.5714286;
        fStack_46c = fVar109 + auVar161._4_4_ * 0.71428573;
        fStack_468 = fVar109 + auVar161._8_4_ * 0.8571429;
        fStack_464 = fVar109 + auVar161._12_4_;
        local_950 = *(undefined8 *)(local_480 + (ulong)uVar100 * 4);
        uStack_948 = 0;
      }
      uVar99 = uVar105;
      auVar230 = ZEXT3264(auVar28);
    } while (((((((bVar82 && bVar83) && bVar81) && bVar80) && bVar79) && bVar78) && bVar106) &&
             bVar76);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }